

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx::CurveNiIntersectorK<4,4>::
     intersect_h<embree::avx::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  Primitive PVar4;
  Geometry *pGVar5;
  long lVar6;
  RTCFilterFunctionN p_Var7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  uint uVar70;
  uint uVar71;
  undefined1 (*pauVar72) [32];
  ulong uVar73;
  uint uVar74;
  uint uVar75;
  uint uVar76;
  int iVar77;
  ulong uVar78;
  long lVar79;
  float fVar80;
  float fVar108;
  float fVar110;
  vint4 bi_2;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar95 [16];
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  float fVar112;
  undefined1 auVar98 [32];
  float fVar109;
  float fVar111;
  float fVar113;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar86 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  float fVar117;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  float fVar142;
  vint4 bi_1;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar141;
  float fVar143;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  vint4 ai;
  undefined1 auVar146 [16];
  undefined1 auVar148 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar147 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar160;
  float fVar181;
  float fVar182;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar184;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [28];
  float fVar183;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float fVar190;
  float fVar208;
  float fVar209;
  vint4 bi;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [28];
  float fVar211;
  float fVar212;
  undefined1 auVar202 [32];
  float fVar210;
  float fVar213;
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar214;
  float fVar230;
  float fVar232;
  vint4 ai_2;
  undefined1 auVar216 [16];
  float fVar234;
  undefined1 auVar217 [16];
  float fVar215;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar231;
  float fVar233;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  float fVar239;
  float fVar240;
  float fVar256;
  float fVar260;
  float fVar264;
  undefined1 auVar247 [32];
  float fVar241;
  float fVar257;
  float fVar261;
  float fVar265;
  float fVar268;
  float fVar271;
  float fVar274;
  undefined1 auVar248 [32];
  float fVar242;
  float fVar258;
  float fVar262;
  float fVar266;
  float fVar269;
  float fVar272;
  float fVar275;
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar255;
  float fVar259;
  undefined1 auVar243 [16];
  undefined1 auVar253 [32];
  float fVar263;
  float fVar267;
  float fVar270;
  float fVar273;
  undefined1 auVar246 [32];
  undefined1 auVar254 [64];
  float fVar276;
  float fVar284;
  float fVar286;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  float fVar292;
  float fVar295;
  float fVar298;
  undefined1 auVar281 [32];
  float fVar277;
  float fVar285;
  float fVar287;
  float fVar289;
  float fVar290;
  float fVar293;
  float fVar296;
  float fVar299;
  float fVar301;
  undefined1 auVar282 [32];
  float fVar288;
  float fVar291;
  float fVar294;
  float fVar297;
  float fVar300;
  undefined1 auVar283 [32];
  vint4 ai_1;
  undefined1 auVar302 [16];
  undefined1 auVar305 [32];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar306 [64];
  undefined1 auVar307 [16];
  float fVar310;
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  float fVar311;
  float fVar319;
  undefined1 auVar312 [16];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  float fVar320;
  float fVar330;
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  undefined1 auVar323 [64];
  float fVar331;
  float fVar334;
  float fVar335;
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar351;
  float fVar352;
  undefined1 auVar343 [16];
  float fVar354;
  float fVar355;
  float fVar356;
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  float fVar353;
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar357 [16];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [64];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  float local_bc0;
  float local_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  float local_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  RTCFilterFunctionNArguments local_a50;
  undefined1 local_a20 [32];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  undefined1 auStack_9f0 [16];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 (*local_948) [16];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [16];
  undefined1 local_8f0 [8];
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [32];
  ulong local_8a0;
  undefined1 auStack_898 [24];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_810 [16];
  undefined1 local_800 [16];
  Primitive *local_7e8;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  RTCHitN local_660 [16];
  undefined1 auStack_650 [16];
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  uint local_5f0;
  uint uStack_5ec;
  uint uStack_5e8;
  uint uStack_5e4;
  undefined1 auStack_5e0 [16];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined4 uStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined4 uStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  
  PVar4 = prim[1];
  uVar73 = (ulong)(byte)PVar4;
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar214 = *(float *)(prim + uVar73 * 0x19 + 0x12);
  auVar9 = vsubps_avx(auVar9,*(undefined1 (*) [16])(prim + uVar73 * 0x19 + 6));
  auVar148._0_4_ = fVar214 * auVar9._0_4_;
  auVar148._4_4_ = fVar214 * auVar9._4_4_;
  auVar148._8_4_ = fVar214 * auVar9._8_4_;
  auVar148._12_4_ = fVar214 * auVar9._12_4_;
  auVar278._0_4_ = fVar214 * auVar10._0_4_;
  auVar278._4_4_ = fVar214 * auVar10._4_4_;
  auVar278._8_4_ = fVar214 * auVar10._8_4_;
  auVar278._12_4_ = fVar214 * auVar10._12_4_;
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 4 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 5 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar120 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 6 + 6)));
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0xb + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar218 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6)));
  auVar218 = vcvtdq2ps_avx(auVar218);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar4 * 0xc + uVar73 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  uVar78 = (ulong)(uint)((int)(uVar73 * 9) * 2);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 + 6)));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 + uVar73 + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  uVar78 = (ulong)(uint)((int)(uVar73 * 5) << 2);
  auVar119 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 + 6)));
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar81 = vshufps_avx(auVar278,auVar278,0);
  auVar118 = vshufps_avx(auVar278,auVar278,0x55);
  auVar91 = vshufps_avx(auVar278,auVar278,0xaa);
  fVar214 = auVar91._0_4_;
  fVar160 = auVar91._4_4_;
  fVar230 = auVar91._8_4_;
  fVar181 = auVar91._12_4_;
  fVar239 = auVar118._0_4_;
  fVar255 = auVar118._4_4_;
  fVar259 = auVar118._8_4_;
  fVar263 = auVar118._12_4_;
  fVar232 = auVar81._0_4_;
  fVar182 = auVar81._4_4_;
  fVar234 = auVar81._8_4_;
  fVar184 = auVar81._12_4_;
  auVar332._0_4_ = fVar232 * auVar9._0_4_ + fVar239 * auVar10._0_4_ + fVar214 * auVar120._0_4_;
  auVar332._4_4_ = fVar182 * auVar9._4_4_ + fVar255 * auVar10._4_4_ + fVar160 * auVar120._4_4_;
  auVar332._8_4_ = fVar234 * auVar9._8_4_ + fVar259 * auVar10._8_4_ + fVar230 * auVar120._8_4_;
  auVar332._12_4_ = fVar184 * auVar9._12_4_ + fVar263 * auVar10._12_4_ + fVar181 * auVar120._12_4_;
  auVar343._0_4_ = fVar232 * auVar21._0_4_ + fVar239 * auVar218._0_4_ + auVar22._0_4_ * fVar214;
  auVar343._4_4_ = fVar182 * auVar21._4_4_ + fVar255 * auVar218._4_4_ + auVar22._4_4_ * fVar160;
  auVar343._8_4_ = fVar234 * auVar21._8_4_ + fVar259 * auVar218._8_4_ + auVar22._8_4_ * fVar230;
  auVar343._12_4_ = fVar184 * auVar21._12_4_ + fVar263 * auVar218._12_4_ + auVar22._12_4_ * fVar181;
  auVar279._0_4_ = fVar232 * auVar82._0_4_ + fVar239 * auVar83._0_4_ + auVar119._0_4_ * fVar214;
  auVar279._4_4_ = fVar182 * auVar82._4_4_ + fVar255 * auVar83._4_4_ + auVar119._4_4_ * fVar160;
  auVar279._8_4_ = fVar234 * auVar82._8_4_ + fVar259 * auVar83._8_4_ + auVar119._8_4_ * fVar230;
  auVar279._12_4_ = fVar184 * auVar82._12_4_ + fVar263 * auVar83._12_4_ + auVar119._12_4_ * fVar181;
  auVar81 = vshufps_avx(auVar148,auVar148,0);
  auVar118 = vshufps_avx(auVar148,auVar148,0x55);
  auVar91 = vshufps_avx(auVar148,auVar148,0xaa);
  fVar214 = auVar91._0_4_;
  fVar160 = auVar91._4_4_;
  fVar230 = auVar91._8_4_;
  fVar181 = auVar91._12_4_;
  fVar239 = auVar118._0_4_;
  fVar255 = auVar118._4_4_;
  fVar259 = auVar118._8_4_;
  fVar263 = auVar118._12_4_;
  fVar232 = auVar81._0_4_;
  fVar182 = auVar81._4_4_;
  fVar234 = auVar81._8_4_;
  fVar184 = auVar81._12_4_;
  auVar93._0_4_ = fVar232 * auVar9._0_4_ + fVar239 * auVar10._0_4_ + fVar214 * auVar120._0_4_;
  auVar93._4_4_ = fVar182 * auVar9._4_4_ + fVar255 * auVar10._4_4_ + fVar160 * auVar120._4_4_;
  auVar93._8_4_ = fVar234 * auVar9._8_4_ + fVar259 * auVar10._8_4_ + fVar230 * auVar120._8_4_;
  auVar93._12_4_ = fVar184 * auVar9._12_4_ + fVar263 * auVar10._12_4_ + fVar181 * auVar120._12_4_;
  auVar118._0_4_ = fVar232 * auVar21._0_4_ + auVar22._0_4_ * fVar214 + fVar239 * auVar218._0_4_;
  auVar118._4_4_ = fVar182 * auVar21._4_4_ + auVar22._4_4_ * fVar160 + fVar255 * auVar218._4_4_;
  auVar118._8_4_ = fVar234 * auVar21._8_4_ + auVar22._8_4_ * fVar230 + fVar259 * auVar218._8_4_;
  auVar118._12_4_ = fVar184 * auVar21._12_4_ + auVar22._12_4_ * fVar181 + fVar263 * auVar218._12_4_;
  auVar81._0_4_ = fVar232 * auVar82._0_4_ + fVar239 * auVar83._0_4_ + auVar119._0_4_ * fVar214;
  auVar81._4_4_ = fVar182 * auVar82._4_4_ + fVar255 * auVar83._4_4_ + auVar119._4_4_ * fVar160;
  auVar81._8_4_ = fVar234 * auVar82._8_4_ + fVar259 * auVar83._8_4_ + auVar119._8_4_ * fVar230;
  auVar81._12_4_ = fVar184 * auVar82._12_4_ + fVar263 * auVar83._12_4_ + auVar119._12_4_ * fVar181;
  auVar243._8_4_ = 0x7fffffff;
  auVar243._0_8_ = 0x7fffffff7fffffff;
  auVar243._12_4_ = 0x7fffffff;
  auVar9 = vandps_avx(auVar332,auVar243);
  auVar161._8_4_ = 0x219392ef;
  auVar161._0_8_ = 0x219392ef219392ef;
  auVar161._12_4_ = 0x219392ef;
  auVar9 = vcmpps_avx(auVar9,auVar161,1);
  auVar10 = vblendvps_avx(auVar332,auVar161,auVar9);
  auVar9 = vandps_avx(auVar343,auVar243);
  auVar9 = vcmpps_avx(auVar9,auVar161,1);
  auVar120 = vblendvps_avx(auVar343,auVar161,auVar9);
  auVar9 = vandps_avx(auVar279,auVar243);
  auVar9 = vcmpps_avx(auVar9,auVar161,1);
  auVar9 = vblendvps_avx(auVar279,auVar161,auVar9);
  auVar21 = vrcpps_avx(auVar10);
  fVar239 = auVar21._0_4_;
  auVar91._0_4_ = fVar239 * auVar10._0_4_;
  fVar255 = auVar21._4_4_;
  auVar91._4_4_ = fVar255 * auVar10._4_4_;
  fVar259 = auVar21._8_4_;
  auVar91._8_4_ = fVar259 * auVar10._8_4_;
  fVar263 = auVar21._12_4_;
  auVar91._12_4_ = fVar263 * auVar10._12_4_;
  auVar280._8_4_ = 0x3f800000;
  auVar280._0_8_ = 0x3f8000003f800000;
  auVar280._12_4_ = 0x3f800000;
  auVar10 = vsubps_avx(auVar280,auVar91);
  fVar239 = fVar239 + fVar239 * auVar10._0_4_;
  fVar255 = fVar255 + fVar255 * auVar10._4_4_;
  fVar259 = fVar259 + fVar259 * auVar10._8_4_;
  fVar263 = fVar263 + fVar263 * auVar10._12_4_;
  auVar10 = vrcpps_avx(auVar120);
  fVar214 = auVar10._0_4_;
  auVar216._0_4_ = fVar214 * auVar120._0_4_;
  fVar230 = auVar10._4_4_;
  auVar216._4_4_ = fVar230 * auVar120._4_4_;
  fVar232 = auVar10._8_4_;
  auVar216._8_4_ = fVar232 * auVar120._8_4_;
  fVar234 = auVar10._12_4_;
  auVar216._12_4_ = fVar234 * auVar120._12_4_;
  auVar10 = vsubps_avx(auVar280,auVar216);
  fVar214 = fVar214 + fVar214 * auVar10._0_4_;
  fVar230 = fVar230 + fVar230 * auVar10._4_4_;
  fVar232 = fVar232 + fVar232 * auVar10._8_4_;
  fVar234 = fVar234 + fVar234 * auVar10._12_4_;
  auVar10 = vrcpps_avx(auVar9);
  fVar160 = auVar10._0_4_;
  auVar162._0_4_ = fVar160 * auVar9._0_4_;
  fVar181 = auVar10._4_4_;
  auVar162._4_4_ = fVar181 * auVar9._4_4_;
  fVar182 = auVar10._8_4_;
  auVar162._8_4_ = fVar182 * auVar9._8_4_;
  fVar184 = auVar10._12_4_;
  auVar162._12_4_ = fVar184 * auVar9._12_4_;
  auVar9 = vsubps_avx(auVar280,auVar162);
  fVar160 = fVar160 + fVar160 * auVar9._0_4_;
  fVar181 = fVar181 + fVar181 * auVar9._4_4_;
  fVar182 = fVar182 + fVar182 * auVar9._8_4_;
  fVar184 = fVar184 + fVar184 * auVar9._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar73 * 7 + 6);
  auVar9 = vpmovsxwd_avx(auVar9);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar93);
  auVar144._0_4_ = fVar239 * auVar9._0_4_;
  auVar144._4_4_ = fVar255 * auVar9._4_4_;
  auVar144._8_4_ = fVar259 * auVar9._8_4_;
  auVar144._12_4_ = fVar263 * auVar9._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar73 * 9 + 6);
  auVar9 = vpmovsxwd_avx(auVar10);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar93);
  auVar191._0_4_ = fVar239 * auVar9._0_4_;
  auVar191._4_4_ = fVar255 * auVar9._4_4_;
  auVar191._8_4_ = fVar259 * auVar9._8_4_;
  auVar191._12_4_ = fVar263 * auVar9._12_4_;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar10 = vpmovsxwd_avx(auVar120);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar73 * -2 + 6);
  auVar9 = vpmovsxwd_avx(auVar21);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar118);
  auVar302._0_4_ = auVar9._0_4_ * fVar214;
  auVar302._4_4_ = auVar9._4_4_ * fVar230;
  auVar302._8_4_ = auVar9._8_4_ * fVar232;
  auVar302._12_4_ = auVar9._12_4_ * fVar234;
  auVar9 = vcvtdq2ps_avx(auVar10);
  auVar9 = vsubps_avx(auVar9,auVar118);
  auVar119._0_4_ = fVar214 * auVar9._0_4_;
  auVar119._4_4_ = fVar230 * auVar9._4_4_;
  auVar119._8_4_ = fVar232 * auVar9._8_4_;
  auVar119._12_4_ = fVar234 * auVar9._12_4_;
  auVar218._8_8_ = 0;
  auVar218._0_8_ = *(ulong *)(prim + uVar78 + uVar73 + 6);
  auVar9 = vpmovsxwd_avx(auVar218);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar81);
  auVar217._0_4_ = auVar9._0_4_ * fVar160;
  auVar217._4_4_ = auVar9._4_4_ * fVar181;
  auVar217._8_4_ = auVar9._8_4_ * fVar182;
  auVar217._12_4_ = auVar9._12_4_ * fVar184;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar73 * 0x17 + 6);
  auVar9 = vpmovsxwd_avx(auVar22);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar81);
  auVar82._0_4_ = auVar9._0_4_ * fVar160;
  auVar82._4_4_ = auVar9._4_4_ * fVar181;
  auVar82._8_4_ = auVar9._8_4_ * fVar182;
  auVar82._12_4_ = auVar9._12_4_ * fVar184;
  auVar9 = vpminsd_avx(auVar144,auVar191);
  auVar10 = vpminsd_avx(auVar302,auVar119);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  auVar10 = vpminsd_avx(auVar217,auVar82);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar307._4_4_ = uVar2;
  auVar307._0_4_ = uVar2;
  auVar307._8_4_ = uVar2;
  auVar307._12_4_ = uVar2;
  auVar10 = vmaxps_avx(auVar10,auVar307);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  local_480._0_4_ = auVar9._0_4_ * 0.99999964;
  local_480._4_4_ = auVar9._4_4_ * 0.99999964;
  local_480._8_4_ = auVar9._8_4_ * 0.99999964;
  local_480._12_4_ = auVar9._12_4_ * 0.99999964;
  auVar9 = vpmaxsd_avx(auVar144,auVar191);
  auVar10 = vpmaxsd_avx(auVar302,auVar119);
  auVar9 = vminps_avx(auVar9,auVar10);
  auVar10 = vpmaxsd_avx(auVar217,auVar82);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar145._4_4_ = uVar2;
  auVar145._0_4_ = uVar2;
  auVar145._8_4_ = uVar2;
  auVar145._12_4_ = uVar2;
  auVar10 = vminps_avx(auVar10,auVar145);
  auVar9 = vminps_avx(auVar9,auVar10);
  auVar83._0_4_ = auVar9._0_4_ * 1.0000004;
  auVar83._4_4_ = auVar9._4_4_ * 1.0000004;
  auVar83._8_4_ = auVar9._8_4_ * 1.0000004;
  auVar83._12_4_ = auVar9._12_4_ * 1.0000004;
  auVar9 = vpshufd_avx(ZEXT116((byte)PVar4),0);
  auVar10 = vpcmpgtd_avx(auVar9,_DAT_01f7fcf0);
  auVar9 = vcmpps_avx(local_480,auVar83,2);
  auVar9 = vandps_avx(auVar9,auVar10);
  uVar70 = vmovmskps_avx(auVar9);
  if (uVar70 == 0) {
    return;
  }
  uVar70 = uVar70 & 0xff;
  auVar96._16_16_ = mm_lookupmask_ps._240_16_;
  auVar96._0_16_ = mm_lookupmask_ps._240_16_;
  local_3e0 = vblendps_avx(auVar96,ZEXT832(0) << 0x20,0x80);
  local_948 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_7e8 = prim;
LAB_00e46ef7:
  lVar79 = 0;
  if (uVar70 != 0) {
    for (; (uVar70 >> lVar79 & 1) == 0; lVar79 = lVar79 + 1) {
    }
  }
  uVar76 = *(uint *)(local_7e8 + 2);
  local_8a0 = (ulong)*(uint *)(local_7e8 + lVar79 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[uVar76].ptr;
  lVar6 = *(long *)&pGVar5[1].time_range.upper;
  uVar78 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           local_8a0 *
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar9 = *(undefined1 (*) [16])(lVar6 + (long)pGVar5[1].intersectionFilterN * uVar78);
  auVar10 = *(undefined1 (*) [16])(lVar6 + (long)pGVar5[1].intersectionFilterN * (uVar78 + 1));
  auVar120 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar21 = vinsertps_avx(auVar120,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar214 = *(float *)(ray + k * 4 + 0x40);
  auVar312._4_4_ = fVar214;
  auVar312._0_4_ = fVar214;
  auVar312._8_4_ = fVar214;
  auVar312._12_4_ = fVar214;
  fStack_730 = fVar214;
  _local_740 = auVar312;
  fStack_72c = fVar214;
  fStack_728 = fVar214;
  fStack_724 = fVar214;
  fVar160 = *(float *)(ray + k * 4 + 0x50);
  auVar333._4_4_ = fVar160;
  auVar333._0_4_ = fVar160;
  auVar333._8_4_ = fVar160;
  auVar333._12_4_ = fVar160;
  fStack_750 = fVar160;
  _local_760 = auVar333;
  fStack_74c = fVar160;
  fStack_748 = fVar160;
  fStack_744 = fVar160;
  auVar120 = vunpcklps_avx(auVar312,auVar333);
  fVar230 = *(float *)(ray + k * 4 + 0x60);
  auVar357._4_4_ = fVar230;
  auVar357._0_4_ = fVar230;
  auVar357._8_4_ = fVar230;
  auVar357._12_4_ = fVar230;
  fStack_710 = fVar230;
  _local_720 = auVar357;
  fStack_70c = fVar230;
  fStack_708 = fVar230;
  register0x0000159c = fVar230;
  _local_8f0 = vinsertps_avx(auVar120,auVar357,0x28);
  pfVar1 = (float *)(pGVar5[2].intersectionFilterN + uVar78 * (long)pGVar5[2].pointQueryFunc);
  auVar192._0_4_ = auVar9._0_4_ + *pfVar1 * 0.33333334;
  auVar192._4_4_ = auVar9._4_4_ + pfVar1[1] * 0.33333334;
  auVar192._8_4_ = auVar9._8_4_ + pfVar1[2] * 0.33333334;
  auVar192._12_4_ = auVar9._12_4_ + pfVar1[3] * 0.33333334;
  pfVar1 = (float *)(pGVar5[2].intersectionFilterN + (long)pGVar5[2].pointQueryFunc * (uVar78 + 1));
  auVar84._0_4_ = *pfVar1 * 0.33333334;
  auVar84._4_4_ = pfVar1[1] * 0.33333334;
  auVar84._8_4_ = pfVar1[2] * 0.33333334;
  auVar84._12_4_ = pfVar1[3] * 0.33333334;
  auVar22 = vsubps_avx(auVar10,auVar84);
  auVar85._0_4_ = (auVar10._0_4_ + auVar9._0_4_ + auVar192._0_4_ + auVar22._0_4_) * 0.25;
  auVar85._4_4_ = (auVar10._4_4_ + auVar9._4_4_ + auVar192._4_4_ + auVar22._4_4_) * 0.25;
  auVar85._8_4_ = (auVar10._8_4_ + auVar9._8_4_ + auVar192._8_4_ + auVar22._8_4_) * 0.25;
  auVar85._12_4_ = (auVar10._12_4_ + auVar9._12_4_ + auVar192._12_4_ + auVar22._12_4_) * 0.25;
  auVar120 = vsubps_avx(auVar85,auVar21);
  auVar120 = vdpps_avx(auVar120,_local_8f0,0x7f);
  local_900 = vdpps_avx(_local_8f0,_local_8f0,0x7f);
  auVar218 = vrcpss_avx(local_900,local_900);
  fVar181 = auVar120._0_4_ * auVar218._0_4_ * (2.0 - local_900._0_4_ * auVar218._0_4_);
  auVar218 = vshufps_avx(ZEXT416((uint)fVar181),ZEXT416((uint)fVar181),0);
  auVar163._0_4_ = auVar21._0_4_ + local_8f0._0_4_ * auVar218._0_4_;
  auVar163._4_4_ = auVar21._4_4_ + local_8f0._4_4_ * auVar218._4_4_;
  auVar163._8_4_ = auVar21._8_4_ + local_8f0._8_4_ * auVar218._8_4_;
  auVar163._12_4_ = auVar21._12_4_ + local_8f0._12_4_ * auVar218._12_4_;
  auVar120 = vblendps_avx(auVar163,_DAT_01f7aa10,8);
  auVar82 = vsubps_avx(auVar9,auVar120);
  auVar22 = vsubps_avx(auVar22,auVar120);
  auVar83 = vsubps_avx(auVar192,auVar120);
  auVar119 = vsubps_avx(auVar10,auVar120);
  auVar9 = vshufps_avx(auVar82,auVar82,0);
  auVar10 = vshufps_avx(auVar82,auVar82,0x55);
  local_9c0._16_16_ = auVar10;
  local_9c0._0_16_ = auVar10;
  auVar306 = ZEXT3264(local_9c0);
  auVar10 = vshufps_avx(auVar82,auVar82,0xaa);
  local_980._16_16_ = auVar10;
  local_980._0_16_ = auVar10;
  auVar323 = ZEXT3264(local_980);
  auVar10 = vshufps_avx(auVar82,auVar82,0xff);
  auVar120 = vshufps_avx(auVar83,auVar83,0);
  auVar246._16_16_ = auVar120;
  auVar246._0_16_ = auVar120;
  auVar120 = vshufps_avx(auVar83,auVar83,0x55);
  local_940._16_16_ = auVar120;
  local_940._0_16_ = auVar120;
  auVar363 = ZEXT3264(local_940);
  auVar120 = vshufps_avx(auVar83,auVar83,0xaa);
  local_a20._16_16_ = auVar120;
  local_a20._0_16_ = auVar120;
  auVar366 = ZEXT3264(local_a20);
  auVar120 = vshufps_avx(auVar83,auVar83,0xff);
  local_9a0._16_16_ = auVar120;
  local_9a0._0_16_ = auVar120;
  auVar120 = vshufps_avx(auVar22,auVar22,0);
  local_2c0._16_16_ = auVar120;
  local_2c0._0_16_ = auVar120;
  auVar120 = vshufps_avx(auVar22,auVar22,0x55);
  local_2e0._16_16_ = auVar120;
  local_2e0._0_16_ = auVar120;
  auVar120 = vshufps_avx(auVar22,auVar22,0xaa);
  register0x00001290 = auVar120;
  _local_1e0 = auVar120;
  auVar120 = vshufps_avx(auVar22,auVar22,0xff);
  auVar254 = ZEXT3264(local_9a0);
  register0x00001290 = auVar120;
  _local_200 = auVar120;
  auVar120 = vshufps_avx(auVar119,auVar119,0);
  register0x00001290 = auVar120;
  _local_220 = auVar120;
  auVar120 = vshufps_avx(auVar119,auVar119,0x55);
  register0x00001290 = auVar120;
  _local_240 = auVar120;
  auVar120 = vshufps_avx(auVar119,auVar119,0xaa);
  register0x00001290 = auVar120;
  _local_260 = auVar120;
  auVar120 = vshufps_avx(auVar119,auVar119,0xff);
  register0x00001290 = auVar120;
  _local_280 = auVar120;
  auVar120 = ZEXT416((uint)(fVar214 * fVar214 + fVar160 * fVar160 + fVar230 * fVar230));
  auVar120 = vshufps_avx(auVar120,auVar120,0);
  local_2a0._16_16_ = auVar120;
  local_2a0._0_16_ = auVar120;
  fVar214 = *(float *)(ray + k * 4 + 0x30);
  local_810 = ZEXT416((uint)fVar181);
  auVar120 = vshufps_avx(ZEXT416((uint)(fVar214 - fVar181)),ZEXT416((uint)(fVar214 - fVar181)),0);
  local_300._16_16_ = auVar120;
  local_300._0_16_ = auVar120;
  local_670 = vpshufd_avx(ZEXT416(uVar76),0);
  local_680 = vpshufd_avx(ZEXT416(*(uint *)(local_7e8 + lVar79 * 4 + 6)),0);
  local_c00 = auVar218._0_8_;
  uStack_bf8 = auVar218._8_8_;
  local_880 = local_c00;
  uStack_878 = uStack_bf8;
  uStack_870 = local_c00;
  uStack_868 = uStack_bf8;
  uVar78 = 0;
  local_c08 = 1;
  auVar97._8_4_ = 0x7fffffff;
  auVar97._0_8_ = 0x7fffffff7fffffff;
  auVar97._12_4_ = 0x7fffffff;
  auVar97._16_4_ = 0x7fffffff;
  auVar97._20_4_ = 0x7fffffff;
  auVar97._24_4_ = 0x7fffffff;
  auVar97._28_4_ = 0x7fffffff;
  local_420 = vandps_avx(local_2a0,auVar97);
  auVar120 = vsqrtss_avx(local_900,local_900);
  auVar21 = vsqrtss_avx(local_900,local_900);
  local_470 = ZEXT816(0x3f80000000000000);
  local_400 = auVar246;
  do {
    auVar202._8_4_ = 0x3f800000;
    auVar202._0_8_ = 0x3f8000003f800000;
    auVar202._12_4_ = 0x3f800000;
    auVar202._16_4_ = 0x3f800000;
    auVar202._20_4_ = 0x3f800000;
    iVar77 = (int)uVar78;
    auVar202._24_4_ = 0x3f800000;
    auVar202._28_4_ = 0x3f800000;
    auVar218 = vmovshdup_avx(local_470);
    auVar118 = vsubps_avx(auVar218,local_470);
    auVar218 = vshufps_avx(local_470,local_470,0);
    local_6c0._16_16_ = auVar218;
    local_6c0._0_16_ = auVar218;
    auVar81 = vshufps_avx(auVar118,auVar118,0);
    local_6e0._16_16_ = auVar81;
    local_6e0._0_16_ = auVar81;
    fVar117 = auVar81._0_4_;
    fVar141 = auVar81._4_4_;
    fVar142 = auVar81._8_4_;
    fVar143 = auVar81._12_4_;
    fVar80 = auVar218._0_4_;
    auVar133._0_4_ = fVar80 + fVar117 * 0.0;
    fVar108 = auVar218._4_4_;
    auVar133._4_4_ = fVar108 + fVar141 * 0.14285715;
    fVar110 = auVar218._8_4_;
    auVar133._8_4_ = fVar110 + fVar142 * 0.2857143;
    fVar112 = auVar218._12_4_;
    auVar133._12_4_ = fVar112 + fVar143 * 0.42857146;
    auVar133._16_4_ = fVar80 + fVar117 * 0.5714286;
    auVar133._20_4_ = fVar108 + fVar141 * 0.71428573;
    auVar133._24_4_ = fVar110 + fVar142 * 0.8571429;
    auVar133._28_4_ = fVar112 + fVar143;
    auVar96 = vsubps_avx(auVar202,auVar133);
    fVar239 = auVar246._28_4_;
    fVar160 = auVar96._0_4_;
    fVar230 = auVar96._4_4_;
    fVar181 = auVar96._8_4_;
    fVar232 = auVar96._12_4_;
    fVar182 = auVar96._16_4_;
    fVar234 = auVar96._20_4_;
    fVar184 = auVar96._24_4_;
    fVar336 = auVar10._12_4_;
    fVar189 = auVar254._28_4_ + fVar239 + auVar9._12_4_ + 1.0 + 1.0;
    fVar240 = local_2c0._0_4_ * auVar133._0_4_ + auVar246._0_4_ * fVar160;
    fVar256 = local_2c0._4_4_ * auVar133._4_4_ + auVar246._4_4_ * fVar230;
    fVar260 = local_2c0._8_4_ * auVar133._8_4_ + auVar246._8_4_ * fVar181;
    fVar264 = local_2c0._12_4_ * auVar133._12_4_ + auVar246._12_4_ * fVar232;
    fVar267 = local_2c0._16_4_ * auVar133._16_4_ + auVar246._16_4_ * fVar182;
    fVar270 = local_2c0._20_4_ * auVar133._20_4_ + auVar246._20_4_ * fVar234;
    fVar273 = local_2c0._24_4_ * auVar133._24_4_ + auVar246._24_4_ * fVar184;
    fVar259 = local_2e0._0_4_ * auVar133._0_4_ + auVar363._0_4_ * fVar160;
    fVar263 = local_2e0._4_4_ * auVar133._4_4_ + auVar363._4_4_ * fVar230;
    fVar183 = local_2e0._8_4_ * auVar133._8_4_ + auVar363._8_4_ * fVar181;
    fVar185 = local_2e0._12_4_ * auVar133._12_4_ + auVar363._12_4_ * fVar232;
    fVar186 = local_2e0._16_4_ * auVar133._16_4_ + auVar363._16_4_ * fVar182;
    fVar187 = local_2e0._20_4_ * auVar133._20_4_ + auVar363._20_4_ * fVar234;
    fVar188 = local_2e0._24_4_ * auVar133._24_4_ + auVar363._24_4_ * fVar184;
    fVar190 = (float)local_1e0._0_4_ * auVar133._0_4_ + auVar366._0_4_ * fVar160;
    fVar208 = (float)local_1e0._4_4_ * auVar133._4_4_ + auVar366._4_4_ * fVar230;
    fVar209 = fStack_1d8 * auVar133._8_4_ + auVar366._8_4_ * fVar181;
    fVar210 = fStack_1d4 * auVar133._12_4_ + auVar366._12_4_ * fVar232;
    fVar211 = fStack_1d0 * auVar133._16_4_ + auVar366._16_4_ * fVar182;
    fVar212 = fStack_1cc * auVar133._20_4_ + auVar366._20_4_ * fVar234;
    fVar213 = fStack_1c8 * auVar133._24_4_ + auVar366._24_4_ * fVar184;
    fVar215 = (float)local_200._0_4_ * auVar133._0_4_ + auVar254._0_4_ * fVar160;
    fVar231 = (float)local_200._4_4_ * auVar133._4_4_ + auVar254._4_4_ * fVar230;
    fVar233 = fStack_1f8 * auVar133._8_4_ + auVar254._8_4_ * fVar181;
    fVar235 = fStack_1f4 * auVar133._12_4_ + auVar254._12_4_ * fVar232;
    fVar236 = fStack_1f0 * auVar133._16_4_ + auVar254._16_4_ * fVar182;
    fVar237 = fStack_1ec * auVar133._20_4_ + auVar254._20_4_ * fVar234;
    fVar238 = fStack_1e8 * auVar133._24_4_ + auVar254._24_4_ * fVar184;
    fVar330 = auVar323._28_4_;
    fVar341 = fVar336 + fVar330;
    auVar308._0_4_ =
         fVar160 * (auVar246._0_4_ * auVar133._0_4_ + auVar9._0_4_ * fVar160) +
         auVar133._0_4_ * fVar240;
    auVar308._4_4_ =
         fVar230 * (auVar246._4_4_ * auVar133._4_4_ + auVar9._4_4_ * fVar230) +
         auVar133._4_4_ * fVar256;
    auVar308._8_4_ =
         fVar181 * (auVar246._8_4_ * auVar133._8_4_ + auVar9._8_4_ * fVar181) +
         auVar133._8_4_ * fVar260;
    auVar308._12_4_ =
         fVar232 * (auVar246._12_4_ * auVar133._12_4_ + auVar9._12_4_ * fVar232) +
         auVar133._12_4_ * fVar264;
    auVar308._16_4_ =
         fVar182 * (auVar246._16_4_ * auVar133._16_4_ + auVar9._0_4_ * fVar182) +
         auVar133._16_4_ * fVar267;
    auVar308._20_4_ =
         fVar234 * (auVar246._20_4_ * auVar133._20_4_ + auVar9._4_4_ * fVar234) +
         auVar133._20_4_ * fVar270;
    auVar308._24_4_ =
         fVar184 * (auVar246._24_4_ * auVar133._24_4_ + auVar9._8_4_ * fVar184) +
         auVar133._24_4_ * fVar273;
    auVar308._28_4_ = local_2e0._28_4_ + fVar330;
    auVar313._0_4_ =
         fVar160 * (auVar363._0_4_ * auVar133._0_4_ + auVar306._0_4_ * fVar160) +
         auVar133._0_4_ * fVar259;
    auVar313._4_4_ =
         fVar230 * (auVar363._4_4_ * auVar133._4_4_ + auVar306._4_4_ * fVar230) +
         auVar133._4_4_ * fVar263;
    auVar313._8_4_ =
         fVar181 * (auVar363._8_4_ * auVar133._8_4_ + auVar306._8_4_ * fVar181) +
         auVar133._8_4_ * fVar183;
    auVar313._12_4_ =
         fVar232 * (auVar363._12_4_ * auVar133._12_4_ + auVar306._12_4_ * fVar232) +
         auVar133._12_4_ * fVar185;
    auVar313._16_4_ =
         fVar182 * (auVar363._16_4_ * auVar133._16_4_ + auVar306._16_4_ * fVar182) +
         auVar133._16_4_ * fVar186;
    auVar313._20_4_ =
         fVar234 * (auVar363._20_4_ * auVar133._20_4_ + auVar306._20_4_ * fVar234) +
         auVar133._20_4_ * fVar187;
    auVar313._24_4_ =
         fVar184 * (auVar363._24_4_ * auVar133._24_4_ + auVar306._24_4_ * fVar184) +
         auVar133._24_4_ * fVar188;
    auVar313._28_4_ = fStack_1c4 + fVar330;
    fVar255 = local_2c0._28_4_;
    auVar321._0_4_ =
         fVar160 * (auVar366._0_4_ * auVar133._0_4_ + auVar323._0_4_ * fVar160) +
         auVar133._0_4_ * fVar190;
    auVar321._4_4_ =
         fVar230 * (auVar366._4_4_ * auVar133._4_4_ + auVar323._4_4_ * fVar230) +
         auVar133._4_4_ * fVar208;
    auVar321._8_4_ =
         fVar181 * (auVar366._8_4_ * auVar133._8_4_ + auVar323._8_4_ * fVar181) +
         auVar133._8_4_ * fVar209;
    auVar321._12_4_ =
         fVar232 * (auVar366._12_4_ * auVar133._12_4_ + auVar323._12_4_ * fVar232) +
         auVar133._12_4_ * fVar210;
    auVar321._16_4_ =
         fVar182 * (auVar366._16_4_ * auVar133._16_4_ + auVar323._16_4_ * fVar182) +
         auVar133._16_4_ * fVar211;
    auVar321._20_4_ =
         fVar234 * (auVar366._20_4_ * auVar133._20_4_ + auVar323._20_4_ * fVar234) +
         auVar133._20_4_ * fVar212;
    auVar321._24_4_ =
         fVar184 * (auVar366._24_4_ * auVar133._24_4_ + auVar323._24_4_ * fVar184) +
         auVar133._24_4_ * fVar213;
    auVar321._28_4_ = fVar255 + fVar330;
    auVar281._0_4_ =
         auVar133._0_4_ * fVar215 +
         fVar160 * (auVar254._0_4_ * auVar133._0_4_ + auVar10._0_4_ * fVar160);
    auVar281._4_4_ =
         auVar133._4_4_ * fVar231 +
         fVar230 * (auVar254._4_4_ * auVar133._4_4_ + auVar10._4_4_ * fVar230);
    auVar281._8_4_ =
         auVar133._8_4_ * fVar233 +
         fVar181 * (auVar254._8_4_ * auVar133._8_4_ + auVar10._8_4_ * fVar181);
    auVar281._12_4_ =
         auVar133._12_4_ * fVar235 +
         fVar232 * (auVar254._12_4_ * auVar133._12_4_ + fVar336 * fVar232);
    auVar281._16_4_ =
         auVar133._16_4_ * fVar236 +
         fVar182 * (auVar254._16_4_ * auVar133._16_4_ + auVar10._0_4_ * fVar182);
    auVar281._20_4_ =
         auVar133._20_4_ * fVar237 +
         fVar234 * (auVar254._20_4_ * auVar133._20_4_ + auVar10._4_4_ * fVar234);
    auVar281._24_4_ =
         auVar133._24_4_ * fVar238 +
         fVar184 * (auVar254._24_4_ * auVar133._24_4_ + auVar10._8_4_ * fVar184);
    auVar281._28_4_ = fVar255 + fStack_1e4;
    auVar247._0_4_ =
         (auVar133._0_4_ * (float)local_220._0_4_ + local_2c0._0_4_ * fVar160) * auVar133._0_4_ +
         fVar160 * fVar240;
    auVar247._4_4_ =
         (auVar133._4_4_ * (float)local_220._4_4_ + local_2c0._4_4_ * fVar230) * auVar133._4_4_ +
         fVar230 * fVar256;
    auVar247._8_4_ =
         (auVar133._8_4_ * fStack_218 + local_2c0._8_4_ * fVar181) * auVar133._8_4_ +
         fVar181 * fVar260;
    auVar247._12_4_ =
         (auVar133._12_4_ * fStack_214 + local_2c0._12_4_ * fVar232) * auVar133._12_4_ +
         fVar232 * fVar264;
    auVar247._16_4_ =
         (auVar133._16_4_ * fStack_210 + local_2c0._16_4_ * fVar182) * auVar133._16_4_ +
         fVar182 * fVar267;
    auVar247._20_4_ =
         (auVar133._20_4_ * fStack_20c + local_2c0._20_4_ * fVar234) * auVar133._20_4_ +
         fVar234 * fVar270;
    auVar247._24_4_ =
         (auVar133._24_4_ * fStack_208 + local_2c0._24_4_ * fVar184) * auVar133._24_4_ +
         fVar184 * fVar273;
    auVar247._28_4_ = fVar255 + fVar189 + auVar254._28_4_;
    auVar177._0_4_ =
         (auVar133._0_4_ * (float)local_240._0_4_ + local_2e0._0_4_ * fVar160) * auVar133._0_4_ +
         fVar160 * fVar259;
    auVar177._4_4_ =
         (auVar133._4_4_ * (float)local_240._4_4_ + local_2e0._4_4_ * fVar230) * auVar133._4_4_ +
         fVar230 * fVar263;
    auVar177._8_4_ =
         (auVar133._8_4_ * fStack_238 + local_2e0._8_4_ * fVar181) * auVar133._8_4_ +
         fVar181 * fVar183;
    auVar177._12_4_ =
         (auVar133._12_4_ * fStack_234 + local_2e0._12_4_ * fVar232) * auVar133._12_4_ +
         fVar232 * fVar185;
    auVar177._16_4_ =
         (auVar133._16_4_ * fStack_230 + local_2e0._16_4_ * fVar182) * auVar133._16_4_ +
         fVar182 * fVar186;
    auVar177._20_4_ =
         (auVar133._20_4_ * fStack_22c + local_2e0._20_4_ * fVar234) * auVar133._20_4_ +
         fVar234 * fVar187;
    auVar177._24_4_ =
         (auVar133._24_4_ * fStack_228 + local_2e0._24_4_ * fVar184) * auVar133._24_4_ +
         fVar184 * fVar188;
    auVar177._28_4_ = fVar255 + fVar189 + 1.0;
    auVar203._0_4_ =
         (auVar133._0_4_ * (float)local_260._0_4_ + (float)local_1e0._0_4_ * fVar160) *
         auVar133._0_4_ + fVar160 * fVar190;
    auVar203._4_4_ =
         (auVar133._4_4_ * (float)local_260._4_4_ + (float)local_1e0._4_4_ * fVar230) *
         auVar133._4_4_ + fVar230 * fVar208;
    auVar203._8_4_ =
         (auVar133._8_4_ * fStack_258 + fStack_1d8 * fVar181) * auVar133._8_4_ + fVar181 * fVar209;
    auVar203._12_4_ =
         (auVar133._12_4_ * fStack_254 + fStack_1d4 * fVar232) * auVar133._12_4_ + fVar232 * fVar210
    ;
    auVar203._16_4_ =
         (auVar133._16_4_ * fStack_250 + fStack_1d0 * fVar182) * auVar133._16_4_ + fVar182 * fVar211
    ;
    auVar203._20_4_ =
         (auVar133._20_4_ * fStack_24c + fStack_1cc * fVar234) * auVar133._20_4_ + fVar234 * fVar212
    ;
    auVar203._24_4_ =
         (auVar133._24_4_ * fStack_248 + fStack_1c8 * fVar184) * auVar133._24_4_ + fVar184 * fVar213
    ;
    auVar203._28_4_ = fVar341 + fVar239 + 1.0;
    auVar223._0_4_ =
         (auVar133._0_4_ * (float)local_280._0_4_ + (float)local_200._0_4_ * fVar160) *
         auVar133._0_4_ + fVar160 * fVar215;
    auVar223._4_4_ =
         (auVar133._4_4_ * (float)local_280._4_4_ + (float)local_200._4_4_ * fVar230) *
         auVar133._4_4_ + fVar230 * fVar231;
    auVar223._8_4_ =
         (auVar133._8_4_ * fStack_278 + fStack_1f8 * fVar181) * auVar133._8_4_ + fVar181 * fVar233;
    auVar223._12_4_ =
         (auVar133._12_4_ * fStack_274 + fStack_1f4 * fVar232) * auVar133._12_4_ + fVar232 * fVar235
    ;
    auVar223._16_4_ =
         (auVar133._16_4_ * fStack_270 + fStack_1f0 * fVar182) * auVar133._16_4_ + fVar182 * fVar236
    ;
    auVar223._20_4_ =
         (auVar133._20_4_ * fStack_26c + fStack_1ec * fVar234) * auVar133._20_4_ + fVar234 * fVar237
    ;
    auVar223._24_4_ =
         (auVar133._24_4_ * fStack_268 + fStack_1e8 * fVar184) * auVar133._24_4_ + fVar184 * fVar238
    ;
    auVar223._28_4_ = fVar330 + fVar239 + fVar330 + fVar239;
    auVar344._0_4_ = auVar308._0_4_ * fVar160 + auVar133._0_4_ * auVar247._0_4_;
    auVar344._4_4_ = auVar308._4_4_ * fVar230 + auVar133._4_4_ * auVar247._4_4_;
    auVar344._8_4_ = auVar308._8_4_ * fVar181 + auVar133._8_4_ * auVar247._8_4_;
    auVar344._12_4_ = auVar308._12_4_ * fVar232 + auVar133._12_4_ * auVar247._12_4_;
    auVar344._16_4_ = auVar308._16_4_ * fVar182 + auVar133._16_4_ * auVar247._16_4_;
    auVar344._20_4_ = auVar308._20_4_ * fVar234 + auVar133._20_4_ * auVar247._20_4_;
    auVar344._24_4_ = auVar308._24_4_ * fVar184 + auVar133._24_4_ * auVar247._24_4_;
    auVar344._28_4_ = fVar330 + fVar239 + fVar255;
    auVar358._0_4_ = auVar313._0_4_ * fVar160 + auVar133._0_4_ * auVar177._0_4_;
    auVar358._4_4_ = auVar313._4_4_ * fVar230 + auVar133._4_4_ * auVar177._4_4_;
    auVar358._8_4_ = auVar313._8_4_ * fVar181 + auVar133._8_4_ * auVar177._8_4_;
    auVar358._12_4_ = auVar313._12_4_ * fVar232 + auVar133._12_4_ * auVar177._12_4_;
    auVar358._16_4_ = auVar313._16_4_ * fVar182 + auVar133._16_4_ * auVar177._16_4_;
    auVar358._20_4_ = auVar313._20_4_ * fVar234 + auVar133._20_4_ * auVar177._20_4_;
    auVar358._24_4_ = auVar313._24_4_ * fVar184 + auVar133._24_4_ * auVar177._24_4_;
    auVar358._28_4_ = fVar255 + fVar341;
    local_5a0._0_4_ = auVar321._0_4_ * fVar160 + auVar133._0_4_ * auVar203._0_4_;
    local_5a0._4_4_ = auVar321._4_4_ * fVar230 + auVar133._4_4_ * auVar203._4_4_;
    fStack_598 = auVar321._8_4_ * fVar181 + auVar133._8_4_ * auVar203._8_4_;
    fStack_594 = auVar321._12_4_ * fVar232 + auVar133._12_4_ * auVar203._12_4_;
    fStack_590 = auVar321._16_4_ * fVar182 + auVar133._16_4_ * auVar203._16_4_;
    fStack_58c = auVar321._20_4_ * fVar234 + auVar133._20_4_ * auVar203._20_4_;
    fStack_588 = auVar321._24_4_ * fVar184 + auVar133._24_4_ * auVar203._24_4_;
    fStack_584 = fVar341 + fVar255;
    local_bc0 = auVar118._0_4_;
    local_700._0_4_ = fVar160 * auVar281._0_4_ + auVar133._0_4_ * auVar223._0_4_;
    local_700._4_4_ = fVar230 * auVar281._4_4_ + auVar133._4_4_ * auVar223._4_4_;
    local_700._8_4_ = fVar181 * auVar281._8_4_ + auVar133._8_4_ * auVar223._8_4_;
    local_700._12_4_ = fVar232 * auVar281._12_4_ + auVar133._12_4_ * auVar223._12_4_;
    local_700._16_4_ = fVar182 * auVar281._16_4_ + auVar133._16_4_ * auVar223._16_4_;
    local_700._20_4_ = fVar234 * auVar281._20_4_ + auVar133._20_4_ * auVar223._20_4_;
    local_700._24_4_ = fVar184 * auVar281._24_4_ + auVar133._24_4_ * auVar223._24_4_;
    local_700._28_4_ = auVar96._28_4_ + auVar133._28_4_;
    auVar96 = vsubps_avx(auVar247,auVar308);
    auVar246 = vsubps_avx(auVar177,auVar313);
    auVar97 = vsubps_avx(auVar203,auVar321);
    auVar133 = vsubps_avx(auVar223,auVar281);
    auVar218 = vshufps_avx(ZEXT416((uint)(local_bc0 * 0.04761905)),
                           ZEXT416((uint)(local_bc0 * 0.04761905)),0);
    fVar234 = auVar218._0_4_;
    fVar241 = fVar234 * auVar96._0_4_ * 3.0;
    fVar239 = auVar218._4_4_;
    fVar257 = fVar239 * auVar96._4_4_ * 3.0;
    local_a00._4_4_ = fVar257;
    local_a00._0_4_ = fVar241;
    fVar186 = auVar218._8_4_;
    fVar261 = fVar186 * auVar96._8_4_ * 3.0;
    fStack_9f8 = fVar261;
    fVar209 = auVar218._12_4_;
    fVar265 = fVar209 * auVar96._12_4_ * 3.0;
    fStack_9f4 = fVar265;
    fVar268 = fVar234 * auVar96._16_4_ * 3.0;
    unique0x1000757c = fVar268;
    fVar271 = fVar239 * auVar96._20_4_ * 3.0;
    unique0x10007580 = fVar271;
    fVar274 = fVar186 * auVar96._24_4_ * 3.0;
    unique0x10007584 = fVar274;
    unique0x10007588 = auVar247._28_4_;
    fVar276 = fVar234 * auVar246._0_4_ * 3.0;
    fVar284 = fVar239 * auVar246._4_4_ * 3.0;
    auVar283._4_4_ = fVar284;
    auVar283._0_4_ = fVar276;
    fVar286 = fVar186 * auVar246._8_4_ * 3.0;
    auVar283._8_4_ = fVar286;
    fVar289 = fVar209 * auVar246._12_4_ * 3.0;
    auVar283._12_4_ = fVar289;
    fVar292 = fVar234 * auVar246._16_4_ * 3.0;
    auVar283._16_4_ = fVar292;
    fVar295 = fVar239 * auVar246._20_4_ * 3.0;
    auVar283._20_4_ = fVar295;
    fVar298 = fVar186 * auVar246._24_4_ * 3.0;
    auVar283._24_4_ = fVar298;
    auVar283._28_4_ = auVar281._28_4_;
    fVar331 = fVar234 * auVar97._0_4_ * 3.0;
    fVar334 = fVar239 * auVar97._4_4_ * 3.0;
    auVar29._4_4_ = fVar334;
    auVar29._0_4_ = fVar331;
    fVar335 = fVar186 * auVar97._8_4_ * 3.0;
    auVar29._8_4_ = fVar335;
    fVar337 = fVar209 * auVar97._12_4_ * 3.0;
    auVar29._12_4_ = fVar337;
    fVar338 = fVar234 * auVar97._16_4_ * 3.0;
    auVar29._16_4_ = fVar338;
    fVar339 = fVar239 * auVar97._20_4_ * 3.0;
    auVar29._20_4_ = fVar339;
    fVar340 = fVar186 * auVar97._24_4_ * 3.0;
    auVar29._24_4_ = fVar340;
    auVar29._28_4_ = fVar341;
    fVar184 = fVar234 * auVar133._0_4_ * 3.0;
    fVar185 = fVar239 * auVar133._4_4_ * 3.0;
    auVar152._4_4_ = fVar185;
    auVar152._0_4_ = fVar184;
    fVar187 = fVar186 * auVar133._8_4_ * 3.0;
    auVar152._8_4_ = fVar187;
    fVar210 = fVar209 * auVar133._12_4_ * 3.0;
    auVar152._12_4_ = fVar210;
    fVar234 = fVar234 * auVar133._16_4_ * 3.0;
    auVar152._16_4_ = fVar234;
    fVar239 = fVar239 * auVar133._20_4_ * 3.0;
    auVar152._20_4_ = fVar239;
    fVar186 = fVar186 * auVar133._24_4_ * 3.0;
    auVar152._24_4_ = fVar186;
    auVar152._28_4_ = fVar209;
    auVar96 = vperm2f128_avx(auVar358,auVar358,1);
    auVar96 = vshufps_avx(auVar96,auVar358,0x30);
    auVar133 = vshufps_avx(auVar358,auVar96,0x29);
    auVar96 = vperm2f128_avx(_local_5a0,_local_5a0,1);
    auVar96 = vshufps_avx(auVar96,_local_5a0,0x30);
    local_9e0 = vshufps_avx(_local_5a0,auVar96,0x29);
    auVar246 = vsubps_avx(local_700,auVar152);
    auVar96 = vperm2f128_avx(auVar246,auVar246,1);
    auVar96 = vshufps_avx(auVar96,auVar246,0x30);
    auVar152 = vshufps_avx(auVar246,auVar96,0x29);
    local_520 = vsubps_avx(auVar133,auVar358);
    local_500 = vsubps_avx(local_9e0,_local_5a0);
    fVar230 = local_520._0_4_;
    fVar255 = local_520._4_4_;
    auVar23._4_4_ = fVar334 * fVar255;
    auVar23._0_4_ = fVar331 * fVar230;
    fVar188 = local_520._8_4_;
    auVar23._8_4_ = fVar335 * fVar188;
    fVar212 = local_520._12_4_;
    auVar23._12_4_ = fVar337 * fVar212;
    fVar237 = local_520._16_4_;
    auVar23._16_4_ = fVar338 * fVar237;
    fVar270 = local_520._20_4_;
    auVar23._20_4_ = fVar339 * fVar270;
    fVar14 = local_520._24_4_;
    auVar23._24_4_ = fVar340 * fVar14;
    auVar23._28_4_ = auVar246._28_4_;
    fVar320 = local_500._0_4_;
    fVar324 = local_500._4_4_;
    auVar350._4_4_ = fVar324 * fVar284;
    auVar350._0_4_ = fVar320 * fVar276;
    fVar325 = local_500._8_4_;
    auVar350._8_4_ = fVar325 * fVar286;
    fVar326 = local_500._12_4_;
    auVar350._12_4_ = fVar326 * fVar289;
    fVar327 = local_500._16_4_;
    auVar350._16_4_ = fVar327 * fVar292;
    fVar328 = local_500._20_4_;
    auVar350._20_4_ = fVar328 * fVar295;
    fVar329 = local_500._24_4_;
    auVar350._24_4_ = fVar329 * fVar298;
    auVar350._28_4_ = auVar96._28_4_;
    auVar350 = vsubps_avx(auVar350,auVar23);
    auVar96 = vperm2f128_avx(auVar344,auVar344,1);
    auVar96 = vshufps_avx(auVar96,auVar344,0x30);
    auVar23 = vshufps_avx(auVar344,auVar96,0x29);
    local_540 = vsubps_avx(auVar23,auVar344);
    auVar25._4_4_ = fVar324 * fVar257;
    auVar25._0_4_ = fVar320 * fVar241;
    auVar25._8_4_ = fVar325 * fVar261;
    auVar25._12_4_ = fVar326 * fVar265;
    auVar25._16_4_ = fVar327 * fVar268;
    auVar25._20_4_ = fVar328 * fVar271;
    auVar25._24_4_ = fVar329 * fVar274;
    auVar25._28_4_ = auVar23._28_4_;
    fVar181 = local_540._0_4_;
    fVar259 = local_540._4_4_;
    auVar26._4_4_ = fVar334 * fVar259;
    auVar26._0_4_ = fVar331 * fVar181;
    fVar189 = local_540._8_4_;
    auVar26._8_4_ = fVar335 * fVar189;
    fVar213 = local_540._12_4_;
    auVar26._12_4_ = fVar337 * fVar213;
    fVar238 = local_540._16_4_;
    auVar26._16_4_ = fVar338 * fVar238;
    fVar273 = local_540._20_4_;
    auVar26._20_4_ = fVar339 * fVar273;
    fVar15 = local_540._24_4_;
    auVar26._24_4_ = fVar340 * fVar15;
    auVar26._28_4_ = local_9e0._28_4_;
    auVar25 = vsubps_avx(auVar26,auVar25);
    auVar27._4_4_ = fVar259 * fVar284;
    auVar27._0_4_ = fVar181 * fVar276;
    auVar27._8_4_ = fVar189 * fVar286;
    auVar27._12_4_ = fVar213 * fVar289;
    auVar27._16_4_ = fVar238 * fVar292;
    auVar27._20_4_ = fVar273 * fVar295;
    auVar27._24_4_ = fVar15 * fVar298;
    auVar27._28_4_ = local_9e0._28_4_;
    auVar28._4_4_ = fVar257 * fVar255;
    auVar28._0_4_ = fVar241 * fVar230;
    auVar28._8_4_ = fVar261 * fVar188;
    auVar28._12_4_ = fVar265 * fVar212;
    auVar28._16_4_ = fVar268 * fVar237;
    auVar28._20_4_ = fVar271 * fVar270;
    auVar28._24_4_ = fVar274 * fVar14;
    auVar28._28_4_ = auVar313._28_4_;
    auVar26 = vsubps_avx(auVar28,auVar27);
    fVar160 = auVar26._28_4_;
    auVar151._0_4_ = fVar181 * fVar181 + fVar230 * fVar230 + fVar320 * fVar320;
    auVar151._4_4_ = fVar259 * fVar259 + fVar255 * fVar255 + fVar324 * fVar324;
    auVar151._8_4_ = fVar189 * fVar189 + fVar188 * fVar188 + fVar325 * fVar325;
    auVar151._12_4_ = fVar213 * fVar213 + fVar212 * fVar212 + fVar326 * fVar326;
    auVar151._16_4_ = fVar238 * fVar238 + fVar237 * fVar237 + fVar327 * fVar327;
    auVar151._20_4_ = fVar273 * fVar273 + fVar270 * fVar270 + fVar328 * fVar328;
    auVar151._24_4_ = fVar15 * fVar15 + fVar14 * fVar14 + fVar329 * fVar329;
    auVar151._28_4_ = fVar160 + fVar160 + auVar350._28_4_;
    auVar96 = vrcpps_avx(auVar151);
    fVar211 = auVar96._0_4_;
    fVar233 = auVar96._4_4_;
    auVar8._4_4_ = fVar233 * auVar151._4_4_;
    auVar8._0_4_ = fVar211 * auVar151._0_4_;
    fVar235 = auVar96._8_4_;
    auVar8._8_4_ = fVar235 * auVar151._8_4_;
    fVar236 = auVar96._12_4_;
    auVar8._12_4_ = fVar236 * auVar151._12_4_;
    fVar260 = auVar96._16_4_;
    auVar8._16_4_ = fVar260 * auVar151._16_4_;
    fVar264 = auVar96._20_4_;
    auVar8._20_4_ = fVar264 * auVar151._20_4_;
    fVar267 = auVar96._24_4_;
    auVar8._24_4_ = fVar267 * auVar151._24_4_;
    auVar8._28_4_ = auVar313._28_4_;
    auVar345._8_4_ = 0x3f800000;
    auVar345._0_8_ = 0x3f8000003f800000;
    auVar345._12_4_ = 0x3f800000;
    auVar345._16_4_ = 0x3f800000;
    auVar345._20_4_ = 0x3f800000;
    auVar345._24_4_ = 0x3f800000;
    auVar345._28_4_ = 0x3f800000;
    auVar27 = vsubps_avx(auVar345,auVar8);
    fVar211 = auVar27._0_4_ * fVar211 + fVar211;
    fVar233 = auVar27._4_4_ * fVar233 + fVar233;
    fVar235 = auVar27._8_4_ * fVar235 + fVar235;
    fVar236 = auVar27._12_4_ * fVar236 + fVar236;
    fVar260 = auVar27._16_4_ * fVar260 + fVar260;
    fVar264 = auVar27._20_4_ * fVar264 + fVar264;
    fVar267 = auVar27._24_4_ * fVar267 + fVar267;
    auVar246 = vperm2f128_avx(auVar283,auVar283,1);
    auVar246 = vshufps_avx(auVar246,auVar283,0x30);
    auVar246 = vshufps_avx(auVar283,auVar246,0x29);
    auVar97 = vperm2f128_avx(auVar29,auVar29,1);
    auVar97 = vshufps_avx(auVar97,auVar29,0x30);
    local_6a0 = vshufps_avx(auVar29,auVar97,0x29);
    fVar342 = local_6a0._0_4_;
    fVar351 = local_6a0._4_4_;
    auVar24._4_4_ = fVar351 * fVar255;
    auVar24._0_4_ = fVar342 * fVar230;
    fVar352 = local_6a0._8_4_;
    auVar24._8_4_ = fVar352 * fVar188;
    fVar353 = local_6a0._12_4_;
    auVar24._12_4_ = fVar353 * fVar212;
    fVar354 = local_6a0._16_4_;
    auVar24._16_4_ = fVar354 * fVar237;
    fVar355 = local_6a0._20_4_;
    auVar24._20_4_ = fVar355 * fVar270;
    fVar356 = local_6a0._24_4_;
    auVar24._24_4_ = fVar356 * fVar14;
    auVar24._28_4_ = auVar97._28_4_;
    fVar232 = auVar246._0_4_;
    fVar263 = auVar246._4_4_;
    auVar30._4_4_ = fVar324 * fVar263;
    auVar30._0_4_ = fVar320 * fVar232;
    fVar190 = auVar246._8_4_;
    auVar30._8_4_ = fVar325 * fVar190;
    fVar215 = auVar246._12_4_;
    auVar30._12_4_ = fVar326 * fVar215;
    fVar240 = auVar246._16_4_;
    auVar30._16_4_ = fVar327 * fVar240;
    fVar330 = auVar246._20_4_;
    auVar30._20_4_ = fVar328 * fVar330;
    fVar16 = auVar246._24_4_;
    auVar30._24_4_ = fVar329 * fVar16;
    auVar30._28_4_ = fVar341;
    auVar97 = vsubps_avx(auVar30,auVar24);
    auVar246 = vperm2f128_avx(_local_a00,_local_a00,1);
    auVar246 = vshufps_avx(auVar246,_local_a00,0x30);
    local_920 = vshufps_avx(_local_a00,auVar246,0x29);
    fVar182 = local_920._0_4_;
    fVar183 = local_920._4_4_;
    auVar31._4_4_ = fVar324 * fVar183;
    auVar31._0_4_ = fVar320 * fVar182;
    fVar208 = local_920._8_4_;
    auVar31._8_4_ = fVar325 * fVar208;
    fVar231 = local_920._12_4_;
    auVar31._12_4_ = fVar326 * fVar231;
    fVar256 = local_920._16_4_;
    auVar31._16_4_ = fVar327 * fVar256;
    fVar341 = local_920._20_4_;
    auVar31._20_4_ = fVar328 * fVar341;
    fVar17 = local_920._24_4_;
    auVar31._24_4_ = fVar329 * fVar17;
    auVar31._28_4_ = auVar246._28_4_;
    auVar32._4_4_ = fVar351 * fVar259;
    auVar32._0_4_ = fVar342 * fVar181;
    auVar32._8_4_ = fVar352 * fVar189;
    auVar32._12_4_ = fVar353 * fVar213;
    auVar32._16_4_ = fVar354 * fVar238;
    auVar32._20_4_ = fVar355 * fVar273;
    uVar74 = local_6a0._28_4_;
    auVar32._24_4_ = fVar356 * fVar15;
    auVar32._28_4_ = uVar74;
    auVar246 = vsubps_avx(auVar32,auVar31);
    auVar33._4_4_ = fVar259 * fVar263;
    auVar33._0_4_ = fVar181 * fVar232;
    auVar33._8_4_ = fVar189 * fVar190;
    auVar33._12_4_ = fVar213 * fVar215;
    auVar33._16_4_ = fVar238 * fVar240;
    auVar33._20_4_ = fVar273 * fVar330;
    auVar33._24_4_ = fVar15 * fVar16;
    auVar33._28_4_ = uVar74;
    auVar34._4_4_ = fVar183 * fVar255;
    auVar34._0_4_ = fVar182 * fVar230;
    auVar34._8_4_ = fVar208 * fVar188;
    auVar34._12_4_ = fVar231 * fVar212;
    auVar34._16_4_ = fVar256 * fVar237;
    auVar34._20_4_ = fVar341 * fVar270;
    auVar34._24_4_ = fVar17 * fVar14;
    auVar34._28_4_ = auVar358._28_4_;
    auVar283 = vsubps_avx(auVar34,auVar33);
    auVar35._4_4_ =
         (auVar350._4_4_ * auVar350._4_4_ +
         auVar25._4_4_ * auVar25._4_4_ + auVar26._4_4_ * auVar26._4_4_) * fVar233;
    auVar35._0_4_ =
         (auVar350._0_4_ * auVar350._0_4_ +
         auVar25._0_4_ * auVar25._0_4_ + auVar26._0_4_ * auVar26._0_4_) * fVar211;
    auVar35._8_4_ =
         (auVar350._8_4_ * auVar350._8_4_ +
         auVar25._8_4_ * auVar25._8_4_ + auVar26._8_4_ * auVar26._8_4_) * fVar235;
    auVar35._12_4_ =
         (auVar350._12_4_ * auVar350._12_4_ +
         auVar25._12_4_ * auVar25._12_4_ + auVar26._12_4_ * auVar26._12_4_) * fVar236;
    auVar35._16_4_ =
         (auVar350._16_4_ * auVar350._16_4_ +
         auVar25._16_4_ * auVar25._16_4_ + auVar26._16_4_ * auVar26._16_4_) * fVar260;
    auVar35._20_4_ =
         (auVar350._20_4_ * auVar350._20_4_ +
         auVar25._20_4_ * auVar25._20_4_ + auVar26._20_4_ * auVar26._20_4_) * fVar264;
    auVar35._24_4_ =
         (auVar350._24_4_ * auVar350._24_4_ +
         auVar25._24_4_ * auVar25._24_4_ + auVar26._24_4_ * auVar26._24_4_) * fVar267;
    auVar35._28_4_ = auVar350._28_4_ + auVar25._28_4_ + fVar160;
    auVar36._4_4_ =
         (auVar97._4_4_ * auVar97._4_4_ +
         auVar246._4_4_ * auVar246._4_4_ + auVar283._4_4_ * auVar283._4_4_) * fVar233;
    auVar36._0_4_ =
         (auVar97._0_4_ * auVar97._0_4_ +
         auVar246._0_4_ * auVar246._0_4_ + auVar283._0_4_ * auVar283._0_4_) * fVar211;
    auVar36._8_4_ =
         (auVar97._8_4_ * auVar97._8_4_ +
         auVar246._8_4_ * auVar246._8_4_ + auVar283._8_4_ * auVar283._8_4_) * fVar235;
    auVar36._12_4_ =
         (auVar97._12_4_ * auVar97._12_4_ +
         auVar246._12_4_ * auVar246._12_4_ + auVar283._12_4_ * auVar283._12_4_) * fVar236;
    auVar36._16_4_ =
         (auVar97._16_4_ * auVar97._16_4_ +
         auVar246._16_4_ * auVar246._16_4_ + auVar283._16_4_ * auVar283._16_4_) * fVar260;
    auVar36._20_4_ =
         (auVar97._20_4_ * auVar97._20_4_ +
         auVar246._20_4_ * auVar246._20_4_ + auVar283._20_4_ * auVar283._20_4_) * fVar264;
    auVar36._24_4_ =
         (auVar97._24_4_ * auVar97._24_4_ +
         auVar246._24_4_ * auVar246._24_4_ + auVar283._24_4_ * auVar283._24_4_) * fVar267;
    auVar36._28_4_ = auVar27._28_4_ + auVar96._28_4_;
    auVar96 = vmaxps_avx(auVar35,auVar36);
    auVar246 = vperm2f128_avx(local_700,local_700,1);
    auVar246 = vshufps_avx(auVar246,local_700,0x30);
    auVar350 = vshufps_avx(local_700,auVar246,0x29);
    auVar98._0_4_ = (float)local_700._0_4_ + fVar184;
    auVar98._4_4_ = local_700._4_4_ + fVar185;
    auVar98._8_4_ = local_700._8_4_ + fVar187;
    auVar98._12_4_ = local_700._12_4_ + fVar210;
    auVar98._16_4_ = local_700._16_4_ + fVar234;
    auVar98._20_4_ = local_700._20_4_ + fVar239;
    auVar98._24_4_ = local_700._24_4_ + fVar186;
    auVar98._28_4_ = local_700._28_4_ + fVar209;
    auVar246 = vmaxps_avx(local_700,auVar98);
    auVar97 = vmaxps_avx(auVar152,auVar350);
    auVar246 = vmaxps_avx(auVar246,auVar97);
    auVar97 = vrsqrtps_avx(auVar151);
    fVar160 = auVar97._0_4_;
    fVar234 = auVar97._4_4_;
    fVar184 = auVar97._8_4_;
    fVar239 = auVar97._12_4_;
    fVar185 = auVar97._16_4_;
    fVar186 = auVar97._20_4_;
    fVar187 = auVar97._24_4_;
    local_320 = fVar160 * 1.5 + fVar160 * fVar160 * fVar160 * auVar151._0_4_ * -0.5;
    fStack_31c = fVar234 * 1.5 + fVar234 * fVar234 * fVar234 * auVar151._4_4_ * -0.5;
    fStack_318 = fVar184 * 1.5 + fVar184 * fVar184 * fVar184 * auVar151._8_4_ * -0.5;
    fStack_314 = fVar239 * 1.5 + fVar239 * fVar239 * fVar239 * auVar151._12_4_ * -0.5;
    fStack_310 = fVar185 * 1.5 + fVar185 * fVar185 * fVar185 * auVar151._16_4_ * -0.5;
    fStack_30c = fVar186 * 1.5 + fVar186 * fVar186 * fVar186 * auVar151._20_4_ * -0.5;
    fStack_308 = fVar187 * 1.5 + fVar187 * fVar187 * fVar187 * auVar151._24_4_ * -0.5;
    auVar25 = vsubps_avx(ZEXT832(0) << 0x20,auVar358);
    auVar26 = vsubps_avx(ZEXT832(0) << 0x20,_local_5a0);
    fVar234 = auVar26._0_4_;
    fVar185 = auVar26._4_4_;
    fVar209 = auVar26._8_4_;
    fVar233 = auVar26._12_4_;
    fVar260 = auVar26._16_4_;
    fVar11 = auVar26._20_4_;
    fVar18 = auVar26._24_4_;
    fVar184 = auVar25._0_4_;
    fVar186 = auVar25._4_4_;
    fVar210 = auVar25._8_4_;
    fVar235 = auVar25._12_4_;
    fVar264 = auVar25._16_4_;
    fVar12 = auVar25._20_4_;
    fVar19 = auVar25._24_4_;
    auVar27 = vsubps_avx(ZEXT832(0) << 0x20,auVar344);
    fVar239 = auVar27._0_4_;
    fVar187 = auVar27._4_4_;
    fVar211 = auVar27._8_4_;
    fVar236 = auVar27._12_4_;
    fVar267 = auVar27._16_4_;
    fVar13 = auVar27._20_4_;
    fVar20 = auVar27._24_4_;
    auVar346._0_4_ =
         (float)local_740._0_4_ * fVar239 +
         (float)local_760._0_4_ * fVar184 + (float)local_720._0_4_ * fVar234;
    auVar346._4_4_ =
         (float)local_740._4_4_ * fVar187 +
         (float)local_760._4_4_ * fVar186 + (float)local_720._4_4_ * fVar185;
    auVar346._8_4_ = fStack_738 * fVar211 + fStack_758 * fVar210 + fStack_718 * fVar209;
    auVar346._12_4_ = fStack_734 * fVar236 + fStack_754 * fVar235 + fStack_714 * fVar233;
    auVar346._16_4_ = fStack_730 * fVar267 + fStack_750 * fVar264 + fStack_710 * fVar260;
    auVar346._20_4_ = fStack_72c * fVar13 + fStack_74c * fVar12 + fStack_70c * fVar11;
    auVar346._24_4_ = fStack_728 * fVar20 + fStack_748 * fVar19 + fStack_708 * fVar18;
    auVar346._28_4_ = auVar358._28_4_ + auVar283._28_4_ + 1.5;
    auVar359._0_4_ = fVar239 * fVar239 + fVar184 * fVar184 + fVar234 * fVar234;
    auVar359._4_4_ = fVar187 * fVar187 + fVar186 * fVar186 + fVar185 * fVar185;
    auVar359._8_4_ = fVar211 * fVar211 + fVar210 * fVar210 + fVar209 * fVar209;
    auVar359._12_4_ = fVar236 * fVar236 + fVar235 * fVar235 + fVar233 * fVar233;
    auVar359._16_4_ = fVar267 * fVar267 + fVar264 * fVar264 + fVar260 * fVar260;
    auVar359._20_4_ = fVar13 * fVar13 + fVar12 * fVar12 + fVar11 * fVar11;
    auVar359._24_4_ = fVar20 * fVar20 + fVar19 * fVar19 + fVar18 * fVar18;
    auVar359._28_4_ = fStack_584 + fStack_584 + auVar358._28_4_;
    local_460 = (float)local_740._0_4_ * fVar181 * local_320 +
                local_320 * fVar230 * (float)local_760._0_4_ +
                (float)local_720._0_4_ * fVar320 * local_320;
    fStack_45c = (float)local_740._4_4_ * fVar259 * fStack_31c +
                 fStack_31c * fVar255 * (float)local_760._4_4_ +
                 (float)local_720._4_4_ * fVar324 * fStack_31c;
    fStack_458 = fStack_738 * fVar189 * fStack_318 +
                 fStack_318 * fVar188 * fStack_758 + fStack_718 * fVar325 * fStack_318;
    fStack_454 = fStack_734 * fVar213 * fStack_314 +
                 fStack_314 * fVar212 * fStack_754 + fStack_714 * fVar326 * fStack_314;
    fStack_450 = fStack_730 * fVar238 * fStack_310 +
                 fStack_310 * fVar237 * fStack_750 + fStack_710 * fVar327 * fStack_310;
    fStack_44c = fStack_72c * fVar273 * fStack_30c +
                 fStack_30c * fVar270 * fStack_74c + fStack_70c * fVar328 * fStack_30c;
    fStack_448 = fStack_728 * fVar15 * fStack_308 +
                 fStack_308 * fVar14 * fStack_748 + fStack_708 * fVar329 * fStack_308;
    fVar160 = fStack_724 + fStack_744 + 0.0;
    fVar277 = fVar239 * fVar181 * local_320 +
              local_320 * fVar230 * fVar184 + fVar320 * local_320 * fVar234;
    fVar285 = fVar187 * fVar259 * fStack_31c +
              fStack_31c * fVar255 * fVar186 + fVar324 * fStack_31c * fVar185;
    fVar287 = fVar211 * fVar189 * fStack_318 +
              fStack_318 * fVar188 * fVar210 + fVar325 * fStack_318 * fVar209;
    fVar290 = fVar236 * fVar213 * fStack_314 +
              fStack_314 * fVar212 * fVar235 + fVar326 * fStack_314 * fVar233;
    fVar293 = fVar267 * fVar238 * fStack_310 +
              fStack_310 * fVar237 * fVar264 + fVar327 * fStack_310 * fVar260;
    fVar296 = fVar13 * fVar273 * fStack_30c +
              fStack_30c * fVar270 * fVar12 + fVar328 * fStack_30c * fVar11;
    fVar299 = fVar20 * fVar15 * fStack_308 +
              fStack_308 * fVar14 * fVar19 + fVar329 * fStack_308 * fVar18;
    fVar301 = fStack_744 + fVar160;
    auVar37._4_4_ = fStack_45c * fVar285;
    auVar37._0_4_ = local_460 * fVar277;
    auVar37._8_4_ = fStack_458 * fVar287;
    auVar37._12_4_ = fStack_454 * fVar290;
    auVar37._16_4_ = fStack_450 * fVar293;
    auVar37._20_4_ = fStack_44c * fVar296;
    auVar37._24_4_ = fStack_448 * fVar299;
    auVar37._28_4_ = fVar160;
    auVar283 = vsubps_avx(auVar346,auVar37);
    auVar38._4_4_ = fVar285 * fVar285;
    auVar38._0_4_ = fVar277 * fVar277;
    auVar38._8_4_ = fVar287 * fVar287;
    auVar38._12_4_ = fVar290 * fVar290;
    auVar38._16_4_ = fVar293 * fVar293;
    auVar38._20_4_ = fVar296 * fVar296;
    auVar38._24_4_ = fVar299 * fVar299;
    auVar38._28_4_ = fStack_744;
    auVar28 = vsubps_avx(auVar359,auVar38);
    local_4e0 = vsqrtps_avx(auVar96);
    fVar160 = (local_4e0._0_4_ + auVar246._0_4_) * 1.0000002;
    fVar109 = (local_4e0._4_4_ + auVar246._4_4_) * 1.0000002;
    fVar111 = (local_4e0._8_4_ + auVar246._8_4_) * 1.0000002;
    fVar113 = (local_4e0._12_4_ + auVar246._12_4_) * 1.0000002;
    fVar114 = (local_4e0._16_4_ + auVar246._16_4_) * 1.0000002;
    fVar115 = (local_4e0._20_4_ + auVar246._20_4_) * 1.0000002;
    fVar116 = (local_4e0._24_4_ + auVar246._24_4_) * 1.0000002;
    auVar39._4_4_ = fVar109 * fVar109;
    auVar39._0_4_ = fVar160 * fVar160;
    auVar39._8_4_ = fVar111 * fVar111;
    auVar39._12_4_ = fVar113 * fVar113;
    auVar39._16_4_ = fVar114 * fVar114;
    auVar39._20_4_ = fVar115 * fVar115;
    auVar39._24_4_ = fVar116 * fVar116;
    auVar39._28_4_ = local_4e0._28_4_ + auVar246._28_4_;
    fVar311 = auVar283._0_4_ + auVar283._0_4_;
    fVar319 = auVar283._4_4_ + auVar283._4_4_;
    local_8c0._0_8_ = CONCAT44(fVar319,fVar311);
    local_8c0._8_4_ = auVar283._8_4_ + auVar283._8_4_;
    local_8c0._12_4_ = auVar283._12_4_ + auVar283._12_4_;
    local_8c0._16_4_ = auVar283._16_4_ + auVar283._16_4_;
    local_8c0._20_4_ = auVar283._20_4_ + auVar283._20_4_;
    local_8c0._24_4_ = auVar283._24_4_ + auVar283._24_4_;
    local_8c0._28_4_ = auVar283._28_4_ + auVar283._28_4_;
    auVar246 = vsubps_avx(auVar28,auVar39);
    local_340._4_4_ = fStack_45c * fStack_45c;
    local_340._0_4_ = local_460 * local_460;
    local_340._8_4_ = fStack_458 * fStack_458;
    local_340._12_4_ = fStack_454 * fStack_454;
    local_340._16_4_ = fStack_450 * fStack_450;
    local_340._20_4_ = fStack_44c * fStack_44c;
    local_340._24_4_ = fStack_448 * fStack_448;
    local_340._28_4_ = local_500._28_4_;
    local_440 = vsubps_avx(local_2a0,local_340);
    auVar40._4_4_ = fVar319 * fVar319;
    auVar40._0_4_ = fVar311 * fVar311;
    auVar40._8_4_ = local_8c0._8_4_ * local_8c0._8_4_;
    auVar40._12_4_ = local_8c0._12_4_ * local_8c0._12_4_;
    auVar40._16_4_ = local_8c0._16_4_ * local_8c0._16_4_;
    auVar40._20_4_ = local_8c0._20_4_ * local_8c0._20_4_;
    auVar40._24_4_ = local_8c0._24_4_ * local_8c0._24_4_;
    auVar40._28_4_ = 0x3f800002;
    auStack_898 = auVar40._8_24_;
    fVar109 = local_440._0_4_;
    local_4c0._0_4_ = fVar109 * 4.0;
    fVar111 = local_440._4_4_;
    local_4c0._4_4_ = fVar111 * 4.0;
    fVar113 = local_440._8_4_;
    fStack_4b8 = fVar113 * 4.0;
    fVar114 = local_440._12_4_;
    fStack_4b4 = fVar114 * 4.0;
    fVar115 = local_440._16_4_;
    fStack_4b0 = fVar115 * 4.0;
    fVar116 = local_440._20_4_;
    fStack_4ac = fVar116 * 4.0;
    fVar310 = local_440._24_4_;
    fStack_4a8 = fVar310 * 4.0;
    uStack_4a4 = 0x40800000;
    auVar41._4_4_ = auVar246._4_4_ * (float)local_4c0._4_4_;
    auVar41._0_4_ = auVar246._0_4_ * (float)local_4c0._0_4_;
    auVar41._8_4_ = auVar246._8_4_ * fStack_4b8;
    auVar41._12_4_ = auVar246._12_4_ * fStack_4b4;
    auVar41._16_4_ = auVar246._16_4_ * fStack_4b0;
    auVar41._20_4_ = auVar246._20_4_ * fStack_4ac;
    auVar41._24_4_ = auVar246._24_4_ * fStack_4a8;
    auVar41._28_4_ = 0x40800000;
    auVar283 = vsubps_avx(auVar40,auVar41);
    auVar96 = vcmpps_avx(auVar283,ZEXT832(0) << 0x20,5);
    fVar160 = local_440._28_4_;
    if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar96 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar96 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar96 >> 0x7f,0) == '\0') &&
          (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar96 >> 0xbf,0) == '\0') &&
        (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar96[0x1f]) {
      auVar99._8_4_ = 0x7f800000;
      auVar99._0_8_ = 0x7f8000007f800000;
      auVar99._12_4_ = 0x7f800000;
      auVar99._16_4_ = 0x7f800000;
      auVar99._20_4_ = 0x7f800000;
      auVar99._24_4_ = 0x7f800000;
      auVar99._28_4_ = 0x7f800000;
      auVar360._8_4_ = 0xff800000;
      auVar360._0_8_ = 0xff800000ff800000;
      auVar360._12_4_ = 0xff800000;
      auVar360._16_4_ = 0xff800000;
      auVar360._20_4_ = 0xff800000;
      auVar360._24_4_ = 0xff800000;
      auVar360._28_4_ = 0xff800000;
    }
    else {
      local_560 = auVar96;
      auVar8 = vcmpps_avx(auVar283,ZEXT832(0) << 0x20,5);
      auVar24 = vsqrtps_avx(auVar283);
      auVar248._0_4_ = fVar109 + fVar109;
      auVar248._4_4_ = fVar111 + fVar111;
      auVar248._8_4_ = fVar113 + fVar113;
      auVar248._12_4_ = fVar114 + fVar114;
      auVar248._16_4_ = fVar115 + fVar115;
      auVar248._20_4_ = fVar116 + fVar116;
      auVar248._24_4_ = fVar310 + fVar310;
      auVar248._28_4_ = fVar160 + fVar160;
      auVar283 = vrcpps_avx(auVar248);
      fVar242 = auVar283._0_4_;
      fVar258 = auVar283._4_4_;
      auVar42._4_4_ = auVar248._4_4_ * fVar258;
      auVar42._0_4_ = auVar248._0_4_ * fVar242;
      fVar262 = auVar283._8_4_;
      auVar42._8_4_ = auVar248._8_4_ * fVar262;
      fVar266 = auVar283._12_4_;
      auVar42._12_4_ = auVar248._12_4_ * fVar266;
      fVar269 = auVar283._16_4_;
      auVar42._16_4_ = auVar248._16_4_ * fVar269;
      fVar272 = auVar283._20_4_;
      auVar42._20_4_ = auVar248._20_4_ * fVar272;
      fVar275 = auVar283._24_4_;
      auVar42._24_4_ = auVar248._24_4_ * fVar275;
      auVar42._28_4_ = auVar248._28_4_;
      auVar305._8_4_ = 0x3f800000;
      auVar305._0_8_ = 0x3f8000003f800000;
      auVar305._12_4_ = 0x3f800000;
      auVar305._16_4_ = 0x3f800000;
      auVar305._20_4_ = 0x3f800000;
      auVar305._24_4_ = 0x3f800000;
      auVar305._28_4_ = 0x3f800000;
      auVar283 = vsubps_avx(auVar305,auVar42);
      fVar242 = fVar242 + fVar242 * auVar283._0_4_;
      fVar258 = fVar258 + fVar258 * auVar283._4_4_;
      fVar262 = fVar262 + fVar262 * auVar283._8_4_;
      fVar266 = fVar266 + fVar266 * auVar283._12_4_;
      fVar269 = fVar269 + fVar269 * auVar283._16_4_;
      fVar272 = fVar272 + fVar272 * auVar283._20_4_;
      fVar275 = fVar275 + fVar275 * auVar283._24_4_;
      auVar282._0_8_ = CONCAT44(fVar319,fVar311) ^ 0x8000000080000000;
      auVar282._8_4_ = -local_8c0._8_4_;
      auVar282._12_4_ = -local_8c0._12_4_;
      auVar282._16_4_ = -local_8c0._16_4_;
      auVar282._20_4_ = -local_8c0._20_4_;
      auVar282._24_4_ = -local_8c0._24_4_;
      auVar282._28_4_ = -local_8c0._28_4_;
      auVar283 = vsubps_avx(auVar282,auVar24);
      fVar311 = auVar283._0_4_ * fVar242;
      fVar319 = auVar283._4_4_ * fVar258;
      auVar43._4_4_ = fVar319;
      auVar43._0_4_ = fVar311;
      fVar288 = auVar283._8_4_ * fVar262;
      auVar43._8_4_ = fVar288;
      fVar291 = auVar283._12_4_ * fVar266;
      auVar43._12_4_ = fVar291;
      fVar294 = auVar283._16_4_ * fVar269;
      auVar43._16_4_ = fVar294;
      fVar297 = auVar283._20_4_ * fVar272;
      auVar43._20_4_ = fVar297;
      fVar300 = auVar283._24_4_ * fVar275;
      auVar43._24_4_ = fVar300;
      auVar43._28_4_ = auVar283._28_4_;
      auVar283 = vsubps_avx(auVar24,local_8c0);
      fVar242 = auVar283._0_4_ * fVar242;
      fVar258 = auVar283._4_4_ * fVar258;
      auVar44._4_4_ = fVar258;
      auVar44._0_4_ = fVar242;
      fVar262 = auVar283._8_4_ * fVar262;
      auVar44._8_4_ = fVar262;
      fVar266 = auVar283._12_4_ * fVar266;
      auVar44._12_4_ = fVar266;
      fVar269 = auVar283._16_4_ * fVar269;
      auVar44._16_4_ = fVar269;
      fVar272 = auVar283._20_4_ * fVar272;
      auVar44._20_4_ = fVar272;
      fVar275 = auVar283._24_4_ * fVar275;
      auVar44._24_4_ = fVar275;
      auVar44._28_4_ = auVar283._28_4_;
      local_580 = local_320 * (fVar277 + local_460 * fVar311);
      fStack_57c = fStack_31c * (fVar285 + fStack_45c * fVar319);
      fStack_578 = fStack_318 * (fVar287 + fStack_458 * fVar288);
      fStack_574 = fStack_314 * (fVar290 + fStack_454 * fVar291);
      fStack_570 = fStack_310 * (fVar293 + fStack_450 * fVar294);
      fStack_56c = fStack_30c * (fVar296 + fStack_44c * fVar297);
      fStack_568 = fStack_308 * (fVar299 + fStack_448 * fVar300);
      fStack_564 = local_8c0._28_4_;
      auVar314._8_4_ = 0x7fffffff;
      auVar314._0_8_ = 0x7fffffff7fffffff;
      auVar314._12_4_ = 0x7fffffff;
      auVar314._16_4_ = 0x7fffffff;
      auVar314._20_4_ = 0x7fffffff;
      auVar314._24_4_ = 0x7fffffff;
      auVar314._28_4_ = 0x7fffffff;
      auVar283 = vandps_avx(local_340,auVar314);
      auVar283 = vmaxps_avx(local_420,auVar283);
      auVar45._4_4_ = auVar283._4_4_ * 1.9073486e-06;
      auVar45._0_4_ = auVar283._0_4_ * 1.9073486e-06;
      auVar45._8_4_ = auVar283._8_4_ * 1.9073486e-06;
      auVar45._12_4_ = auVar283._12_4_ * 1.9073486e-06;
      auVar45._16_4_ = auVar283._16_4_ * 1.9073486e-06;
      auVar45._20_4_ = auVar283._20_4_ * 1.9073486e-06;
      auVar45._24_4_ = auVar283._24_4_ * 1.9073486e-06;
      auVar45._28_4_ = auVar283._28_4_;
      auVar283 = vandps_avx(local_440,auVar314);
      auVar283 = vcmpps_avx(auVar283,auVar45,1);
      auVar315._8_4_ = 0x7f800000;
      auVar315._0_8_ = 0x7f8000007f800000;
      auVar315._12_4_ = 0x7f800000;
      auVar315._16_4_ = 0x7f800000;
      auVar315._20_4_ = 0x7f800000;
      auVar315._24_4_ = 0x7f800000;
      auVar315._28_4_ = 0x7f800000;
      auVar99 = vblendvps_avx(auVar315,auVar43,auVar8);
      local_5c0._4_4_ = fStack_31c * (fVar285 + fStack_45c * fVar258);
      local_5c0._0_4_ = local_320 * (fVar277 + local_460 * fVar242);
      fStack_5b8 = fStack_318 * (fVar287 + fStack_458 * fVar262);
      fStack_5b4 = fStack_314 * (fVar290 + fStack_454 * fVar266);
      fStack_5b0 = fStack_310 * (fVar293 + fStack_450 * fVar269);
      fStack_5ac = fStack_30c * (fVar296 + fStack_44c * fVar272);
      fStack_5a8 = fStack_308 * (fVar299 + fStack_448 * fVar275);
      uStack_5a4 = auVar99._28_4_;
      auVar249._8_4_ = 0xff800000;
      auVar249._0_8_ = 0xff800000ff800000;
      auVar249._12_4_ = 0xff800000;
      auVar249._16_4_ = 0xff800000;
      auVar249._20_4_ = 0xff800000;
      auVar249._24_4_ = 0xff800000;
      auVar249._28_4_ = 0xff800000;
      auVar360 = vblendvps_avx(auVar249,auVar44,auVar8);
      auVar24 = auVar8 & auVar283;
      if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar24 >> 0x7f,0) != '\0') ||
            (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar24 >> 0xbf,0) != '\0') ||
          (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar24[0x1f] < '\0') {
        auVar96 = vandps_avx(auVar283,auVar8);
        auVar218 = vpackssdw_avx(auVar96._0_16_,auVar96._16_16_);
        auVar283 = vcmpps_avx(auVar246,ZEXT832(0) << 0x20,2);
        auVar364._8_4_ = 0xff800000;
        auVar364._0_8_ = 0xff800000ff800000;
        auVar364._12_4_ = 0xff800000;
        auVar364._16_4_ = 0xff800000;
        auVar364._20_4_ = 0xff800000;
        auVar364._24_4_ = 0xff800000;
        auVar364._28_4_ = 0xff800000;
        auVar349._8_4_ = 0x7f800000;
        auVar349._0_8_ = 0x7f8000007f800000;
        auVar349._12_4_ = 0x7f800000;
        auVar349._16_4_ = 0x7f800000;
        auVar349._20_4_ = 0x7f800000;
        auVar349._24_4_ = 0x7f800000;
        auVar349._28_4_ = 0x7f800000;
        auVar246 = vblendvps_avx(auVar349,auVar364,auVar283);
        auVar81 = vpmovsxwd_avx(auVar218);
        auVar218 = vpunpckhwd_avx(auVar218,auVar218);
        auVar229._16_16_ = auVar218;
        auVar229._0_16_ = auVar81;
        auVar99 = vblendvps_avx(auVar99,auVar246,auVar229);
        auVar246 = vblendvps_avx(auVar364,auVar349,auVar283);
        auVar360 = vblendvps_avx(auVar360,auVar246,auVar229);
        auVar246 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar106._0_4_ = auVar96._0_4_ ^ auVar246._0_4_;
        auVar106._4_4_ = auVar96._4_4_ ^ auVar246._4_4_;
        auVar106._8_4_ = auVar96._8_4_ ^ auVar246._8_4_;
        auVar106._12_4_ = auVar96._12_4_ ^ auVar246._12_4_;
        auVar106._16_4_ = auVar96._16_4_ ^ auVar246._16_4_;
        auVar106._20_4_ = auVar96._20_4_ ^ auVar246._20_4_;
        auVar106._24_4_ = auVar96._24_4_ ^ auVar246._24_4_;
        auVar106._28_4_ = auVar96._28_4_ ^ auVar246._28_4_;
        auVar96 = vorps_avx(auVar283,auVar106);
        auVar96 = vandps_avx(auVar8,auVar96);
      }
    }
    auVar366 = ZEXT3264(local_a20);
    auVar246 = local_3e0 & auVar96;
    auVar254 = ZEXT3264(local_9a0);
    if ((((((((auVar246 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar246 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar246 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar246 >> 0x7f,0) == '\0') &&
          (auVar246 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar246 >> 0xbf,0) == '\0') &&
        (auVar246 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar246[0x1f])
    {
      auVar306 = ZEXT3264(local_9c0);
      auVar323 = ZEXT3264(local_980);
      auVar363 = ZEXT3264(local_940);
    }
    else {
      fStack_444 = fStack_724 + fStack_744 + 0.0;
      fStack_304 = auVar97._28_4_ + auVar151._28_4_;
      auVar81 = ZEXT416((uint)*(float *)(ray + k * 4 + 0x80));
      local_560._0_16_ = auVar81;
      auVar218 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_810._0_4_));
      auVar218 = vshufps_avx(auVar218,auVar218,0);
      auVar224._16_16_ = auVar218;
      auVar224._0_16_ = auVar218;
      auVar283 = vminps_avx(auVar224,auVar360);
      fVar272 = auVar26._28_4_;
      auVar134._0_4_ =
           (float)local_740._0_4_ * fVar241 +
           (float)local_760._0_4_ * fVar276 + fVar331 * (float)local_720._0_4_;
      auVar134._4_4_ =
           (float)local_740._4_4_ * fVar257 +
           (float)local_760._4_4_ * fVar284 + fVar334 * (float)local_720._4_4_;
      auVar134._8_4_ = fStack_738 * fVar261 + fStack_758 * fVar286 + fVar335 * fStack_718;
      auVar134._12_4_ = fStack_734 * fVar265 + fStack_754 * fVar289 + fVar337 * fStack_714;
      auVar134._16_4_ = fStack_730 * fVar268 + fStack_750 * fVar292 + fVar338 * fStack_710;
      auVar134._20_4_ = fStack_72c * fVar271 + fStack_74c * fVar295 + fVar339 * fStack_70c;
      auVar134._24_4_ = fStack_728 * fVar274 + fStack_748 * fVar298 + fVar340 * fStack_708;
      auVar134._28_4_ = fVar272 + auVar281._28_4_ + fVar272;
      auVar246 = vrcpps_avx(auVar134);
      fVar311 = auVar246._0_4_;
      fVar319 = auVar246._4_4_;
      auVar46._4_4_ = auVar134._4_4_ * fVar319;
      auVar46._0_4_ = auVar134._0_4_ * fVar311;
      fVar242 = auVar246._8_4_;
      auVar46._8_4_ = auVar134._8_4_ * fVar242;
      fVar258 = auVar246._12_4_;
      auVar46._12_4_ = auVar134._12_4_ * fVar258;
      fVar262 = auVar246._16_4_;
      auVar46._16_4_ = auVar134._16_4_ * fVar262;
      fVar266 = auVar246._20_4_;
      auVar46._20_4_ = auVar134._20_4_ * fVar266;
      fVar269 = auVar246._24_4_;
      auVar46._24_4_ = auVar134._24_4_ * fVar269;
      auVar46._28_4_ = auVar27._28_4_;
      auVar347._8_4_ = 0x3f800000;
      auVar347._0_8_ = 0x3f8000003f800000;
      auVar347._12_4_ = 0x3f800000;
      auVar347._16_4_ = 0x3f800000;
      auVar347._20_4_ = 0x3f800000;
      auVar347._24_4_ = 0x3f800000;
      auVar347._28_4_ = 0x3f800000;
      auVar26 = vsubps_avx(auVar347,auVar46);
      auVar309._8_4_ = 0x7fffffff;
      auVar309._0_8_ = 0x7fffffff7fffffff;
      auVar309._12_4_ = 0x7fffffff;
      auVar309._16_4_ = 0x7fffffff;
      auVar309._20_4_ = 0x7fffffff;
      auVar309._24_4_ = 0x7fffffff;
      auVar309._28_4_ = 0x7fffffff;
      auVar246 = vandps_avx(auVar309,auVar134);
      auVar348._8_4_ = 0x219392ef;
      auVar348._0_8_ = 0x219392ef219392ef;
      auVar348._12_4_ = 0x219392ef;
      auVar348._16_4_ = 0x219392ef;
      auVar348._20_4_ = 0x219392ef;
      auVar348._24_4_ = 0x219392ef;
      auVar348._28_4_ = 0x219392ef;
      auVar97 = vcmpps_avx(auVar246,auVar348,1);
      auVar47._4_4_ =
           (fVar319 + fVar319 * auVar26._4_4_) *
           -(fVar187 * fVar257 + fVar186 * fVar284 + fVar185 * fVar334);
      auVar47._0_4_ =
           (fVar311 + fVar311 * auVar26._0_4_) *
           -(fVar239 * fVar241 + fVar184 * fVar276 + fVar234 * fVar331);
      auVar47._8_4_ =
           (fVar242 + fVar242 * auVar26._8_4_) *
           -(fVar211 * fVar261 + fVar210 * fVar286 + fVar209 * fVar335);
      auVar47._12_4_ =
           (fVar258 + fVar258 * auVar26._12_4_) *
           -(fVar236 * fVar265 + fVar235 * fVar289 + fVar233 * fVar337);
      auVar47._16_4_ =
           (fVar262 + fVar262 * auVar26._16_4_) *
           -(fVar267 * fVar268 + fVar264 * fVar292 + fVar260 * fVar338);
      auVar47._20_4_ =
           (fVar266 + fVar266 * auVar26._20_4_) *
           -(fVar13 * fVar271 + fVar12 * fVar295 + fVar11 * fVar339);
      auVar47._24_4_ =
           (fVar269 + fVar269 * auVar26._24_4_) *
           -(fVar20 * fVar274 + fVar19 * fVar298 + fVar18 * fVar340);
      auVar47._28_4_ = -(fVar272 + auVar25._28_4_ + fVar272);
      auVar246 = vcmpps_avx(auVar134,ZEXT832(0) << 0x20,1);
      auVar246 = vorps_avx(auVar97,auVar246);
      auVar322._8_4_ = 0xff800000;
      auVar322._0_8_ = 0xff800000ff800000;
      auVar322._12_4_ = 0xff800000;
      auVar322._16_4_ = 0xff800000;
      auVar322._20_4_ = 0xff800000;
      auVar322._24_4_ = 0xff800000;
      auVar322._28_4_ = 0xff800000;
      auVar246 = vblendvps_avx(auVar47,auVar322,auVar246);
      auVar25 = vcmpps_avx(auVar134,ZEXT832(0) << 0x20,6);
      auVar97 = vorps_avx(auVar97,auVar25);
      auVar361._8_4_ = 0x7f800000;
      auVar361._0_8_ = 0x7f8000007f800000;
      auVar361._12_4_ = 0x7f800000;
      auVar361._16_4_ = 0x7f800000;
      auVar361._20_4_ = 0x7f800000;
      auVar361._24_4_ = 0x7f800000;
      auVar361._28_4_ = 0x7f800000;
      auVar97 = vblendvps_avx(auVar47,auVar361,auVar97);
      auVar25 = vmaxps_avx(local_300,auVar99);
      auVar25 = vmaxps_avx(auVar25,auVar246);
      auVar26 = vminps_avx(auVar283,auVar97);
      auVar283 = ZEXT832(0) << 0x20;
      auVar246 = vsubps_avx(auVar283,auVar133);
      auVar97 = vsubps_avx(auVar283,local_9e0);
      auVar48._4_4_ = auVar97._4_4_ * -fVar351;
      auVar48._0_4_ = auVar97._0_4_ * -fVar342;
      auVar48._8_4_ = auVar97._8_4_ * -fVar352;
      auVar48._12_4_ = auVar97._12_4_ * -fVar353;
      auVar48._16_4_ = auVar97._16_4_ * -fVar354;
      auVar48._20_4_ = auVar97._20_4_ * -fVar355;
      auVar48._24_4_ = auVar97._24_4_ * -fVar356;
      auVar48._28_4_ = auVar97._28_4_;
      auVar49._4_4_ = fVar263 * auVar246._4_4_;
      auVar49._0_4_ = fVar232 * auVar246._0_4_;
      auVar49._8_4_ = fVar190 * auVar246._8_4_;
      auVar49._12_4_ = fVar215 * auVar246._12_4_;
      auVar49._16_4_ = fVar240 * auVar246._16_4_;
      auVar49._20_4_ = fVar330 * auVar246._20_4_;
      auVar49._24_4_ = fVar16 * auVar246._24_4_;
      auVar49._28_4_ = auVar246._28_4_;
      auVar246 = vsubps_avx(auVar48,auVar49);
      auVar97 = vsubps_avx(auVar283,auVar23);
      auVar50._4_4_ = fVar183 * auVar97._4_4_;
      auVar50._0_4_ = fVar182 * auVar97._0_4_;
      auVar50._8_4_ = fVar208 * auVar97._8_4_;
      auVar50._12_4_ = fVar231 * auVar97._12_4_;
      auVar50._16_4_ = fVar256 * auVar97._16_4_;
      auVar50._20_4_ = fVar341 * auVar97._20_4_;
      uVar2 = auVar97._28_4_;
      auVar50._24_4_ = fVar17 * auVar97._24_4_;
      auVar50._28_4_ = uVar2;
      auVar133 = vsubps_avx(auVar246,auVar50);
      auVar51._4_4_ = -fVar351 * (float)local_720._4_4_;
      auVar51._0_4_ = -fVar342 * (float)local_720._0_4_;
      auVar51._8_4_ = -fVar352 * fStack_718;
      auVar51._12_4_ = -fVar353 * fStack_714;
      auVar51._16_4_ = -fVar354 * fStack_710;
      auVar51._20_4_ = -fVar355 * fStack_70c;
      auVar51._24_4_ = -fVar356 * fStack_708;
      auVar51._28_4_ = uVar74 ^ 0x80000000;
      auVar52._4_4_ = (float)local_760._4_4_ * fVar263;
      auVar52._0_4_ = (float)local_760._0_4_ * fVar232;
      auVar52._8_4_ = fStack_758 * fVar190;
      auVar52._12_4_ = fStack_754 * fVar215;
      auVar52._16_4_ = fStack_750 * fVar240;
      auVar52._20_4_ = fStack_74c * fVar330;
      auVar52._24_4_ = fStack_748 * fVar16;
      auVar52._28_4_ = uVar2;
      auVar316._8_4_ = 0x3f800000;
      auVar316._0_8_ = 0x3f8000003f800000;
      auVar316._12_4_ = 0x3f800000;
      auVar316._16_4_ = 0x3f800000;
      auVar316._20_4_ = 0x3f800000;
      auVar316._24_4_ = 0x3f800000;
      auVar316._28_4_ = 0x3f800000;
      auVar246 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = (float)local_740._4_4_ * fVar183;
      auVar53._0_4_ = (float)local_740._0_4_ * fVar182;
      auVar53._8_4_ = fStack_738 * fVar208;
      auVar53._12_4_ = fStack_734 * fVar231;
      auVar53._16_4_ = fStack_730 * fVar256;
      auVar53._20_4_ = fStack_72c * fVar341;
      auVar53._24_4_ = fStack_728 * fVar17;
      auVar53._28_4_ = uVar2;
      auVar23 = vsubps_avx(auVar246,auVar53);
      auVar246 = vrcpps_avx(auVar23);
      fVar232 = auVar246._0_4_;
      fVar182 = auVar246._4_4_;
      auVar54._4_4_ = auVar23._4_4_ * fVar182;
      auVar54._0_4_ = auVar23._0_4_ * fVar232;
      fVar234 = auVar246._8_4_;
      auVar54._8_4_ = auVar23._8_4_ * fVar234;
      fVar184 = auVar246._12_4_;
      auVar54._12_4_ = auVar23._12_4_ * fVar184;
      fVar239 = auVar246._16_4_;
      auVar54._16_4_ = auVar23._16_4_ * fVar239;
      fVar263 = auVar246._20_4_;
      auVar54._20_4_ = auVar23._20_4_ * fVar263;
      fVar183 = auVar246._24_4_;
      auVar54._24_4_ = auVar23._24_4_ * fVar183;
      auVar54._28_4_ = fStack_724;
      auVar27 = vsubps_avx(auVar316,auVar54);
      auVar246 = vandps_avx(auVar309,auVar23);
      auVar97 = vcmpps_avx(auVar246,auVar348,1);
      auVar55._4_4_ = (fVar182 + fVar182 * auVar27._4_4_) * -auVar133._4_4_;
      auVar55._0_4_ = (fVar232 + fVar232 * auVar27._0_4_) * -auVar133._0_4_;
      auVar55._8_4_ = (fVar234 + fVar234 * auVar27._8_4_) * -auVar133._8_4_;
      auVar55._12_4_ = (fVar184 + fVar184 * auVar27._12_4_) * -auVar133._12_4_;
      auVar55._16_4_ = (fVar239 + fVar239 * auVar27._16_4_) * -auVar133._16_4_;
      auVar55._20_4_ = (fVar263 + fVar263 * auVar27._20_4_) * -auVar133._20_4_;
      auVar55._24_4_ = (fVar183 + fVar183 * auVar27._24_4_) * -auVar133._24_4_;
      auVar55._28_4_ = auVar133._28_4_ ^ 0x80000000;
      auVar246 = vcmpps_avx(auVar23,auVar283,1);
      auVar246 = vorps_avx(auVar97,auVar246);
      auVar246 = vblendvps_avx(auVar55,auVar322,auVar246);
      _local_7e0 = vmaxps_avx(auVar25,auVar246);
      auVar246 = vcmpps_avx(auVar23,ZEXT832(0) << 0x20,6);
      auVar246 = vorps_avx(auVar97,auVar246);
      auVar246 = vblendvps_avx(auVar55,auVar361,auVar246);
      auVar96 = vandps_avx(auVar96,local_3e0);
      local_360 = vminps_avx(auVar26,auVar246);
      auVar246 = vcmpps_avx(_local_7e0,local_360,2);
      auVar97 = auVar96 & auVar246;
      if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar97 >> 0x7f,0) != '\0') ||
            (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar97 >> 0xbf,0) != '\0') ||
          (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar97[0x1f] < '\0') {
        auVar97 = vminps_avx(local_700,auVar98);
        auVar133 = vminps_avx(auVar152,auVar350);
        auVar97 = vminps_avx(auVar97,auVar133);
        auVar97 = vsubps_avx(auVar97,local_4e0);
        auVar96 = vandps_avx(auVar246,auVar96);
        auVar69._4_4_ = fStack_57c;
        auVar69._0_4_ = local_580;
        auVar69._8_4_ = fStack_578;
        auVar69._12_4_ = fStack_574;
        auVar69._16_4_ = fStack_570;
        auVar69._20_4_ = fStack_56c;
        auVar69._24_4_ = fStack_568;
        auVar69._28_4_ = fStack_564;
        auVar246 = vminps_avx(auVar69,auVar316);
        auVar246 = vmaxps_avx(auVar246,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar80 + fVar117 * (auVar246._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar108 + fVar141 * (auVar246._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar110 + fVar142 * (auVar246._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar112 + fVar143 * (auVar246._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar80 + fVar117 * (auVar246._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar108 + fVar141 * (auVar246._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar110 + fVar142 * (auVar246._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar112 + auVar246._28_4_ + 7.0;
        auVar246 = vminps_avx(_local_5c0,auVar316);
        auVar246 = vmaxps_avx(auVar246,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar80 + fVar117 * (auVar246._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar108 + fVar141 * (auVar246._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar110 + fVar142 * (auVar246._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar112 + fVar143 * (auVar246._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar80 + fVar117 * (auVar246._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar108 + fVar141 * (auVar246._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar110 + fVar142 * (auVar246._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar112 + auVar246._28_4_ + 7.0;
        auVar56._4_4_ = auVar97._4_4_ * 0.99999976;
        auVar56._0_4_ = auVar97._0_4_ * 0.99999976;
        auVar56._8_4_ = auVar97._8_4_ * 0.99999976;
        auVar56._12_4_ = auVar97._12_4_ * 0.99999976;
        auVar56._16_4_ = auVar97._16_4_ * 0.99999976;
        auVar56._20_4_ = auVar97._20_4_ * 0.99999976;
        auVar56._24_4_ = auVar97._24_4_ * 0.99999976;
        auVar56._28_4_ = 0x3f7ffffc;
        auVar246 = vmaxps_avx(ZEXT832(0) << 0x20,auVar56);
        auVar57._4_4_ = auVar246._4_4_ * auVar246._4_4_;
        auVar57._0_4_ = auVar246._0_4_ * auVar246._0_4_;
        auVar57._8_4_ = auVar246._8_4_ * auVar246._8_4_;
        auVar57._12_4_ = auVar246._12_4_ * auVar246._12_4_;
        auVar57._16_4_ = auVar246._16_4_ * auVar246._16_4_;
        auVar57._20_4_ = auVar246._20_4_ * auVar246._20_4_;
        auVar57._24_4_ = auVar246._24_4_ * auVar246._24_4_;
        auVar57._28_4_ = auVar246._28_4_;
        local_860 = vsubps_avx(auVar28,auVar57);
        auVar58._4_4_ = local_860._4_4_ * (float)local_4c0._4_4_;
        auVar58._0_4_ = local_860._0_4_ * (float)local_4c0._0_4_;
        auVar58._8_4_ = local_860._8_4_ * fStack_4b8;
        auVar58._12_4_ = local_860._12_4_ * fStack_4b4;
        auVar58._16_4_ = local_860._16_4_ * fStack_4b0;
        auVar58._20_4_ = local_860._20_4_ * fStack_4ac;
        auVar58._24_4_ = local_860._24_4_ * fStack_4a8;
        auVar58._28_4_ = auVar246._28_4_;
        auVar97 = vsubps_avx(auVar40,auVar58);
        auVar246 = vcmpps_avx(auVar97,ZEXT832(0) << 0x20,5);
        if ((((((((auVar246 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar246 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar246 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar246 >> 0x7f,0) == '\0') &&
              (auVar246 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar246 >> 0xbf,0) == '\0') &&
            (auVar246 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar246[0x1f]) {
          auVar152 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_7a0 = ZEXT832(0) << 0x20;
          _local_7c0 = ZEXT832(0) << 0x20;
          auVar176 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar201 = ZEXT1628(ZEXT816(0) << 0x40);
          auVar225._8_4_ = 0x7f800000;
          auVar225._0_8_ = 0x7f8000007f800000;
          auVar225._12_4_ = 0x7f800000;
          auVar225._16_4_ = 0x7f800000;
          auVar225._20_4_ = 0x7f800000;
          auVar225._24_4_ = 0x7f800000;
          auVar225._28_4_ = 0x7f800000;
          auVar250._8_4_ = 0xff800000;
          auVar250._0_8_ = 0xff800000ff800000;
          auVar250._12_4_ = 0xff800000;
          auVar250._16_4_ = 0xff800000;
          auVar250._20_4_ = 0xff800000;
          auVar250._24_4_ = 0xff800000;
          auVar250._28_4_ = 0xff800000;
          local_860 = auVar29;
          _local_780 = _local_7a0;
        }
        else {
          auVar152 = vsqrtps_avx(auVar97);
          auVar178._0_4_ = fVar109 + fVar109;
          auVar178._4_4_ = fVar111 + fVar111;
          auVar178._8_4_ = fVar113 + fVar113;
          auVar178._12_4_ = fVar114 + fVar114;
          auVar178._16_4_ = fVar115 + fVar115;
          auVar178._20_4_ = fVar116 + fVar116;
          auVar178._24_4_ = fVar310 + fVar310;
          auVar178._28_4_ = fVar160 + fVar160;
          auVar133 = vrcpps_avx(auVar178);
          fVar160 = auVar133._0_4_;
          fVar232 = auVar133._4_4_;
          auVar59._4_4_ = auVar178._4_4_ * fVar232;
          auVar59._0_4_ = auVar178._0_4_ * fVar160;
          fVar182 = auVar133._8_4_;
          auVar59._8_4_ = auVar178._8_4_ * fVar182;
          fVar234 = auVar133._12_4_;
          auVar59._12_4_ = auVar178._12_4_ * fVar234;
          fVar184 = auVar133._16_4_;
          auVar59._16_4_ = auVar178._16_4_ * fVar184;
          fVar239 = auVar133._20_4_;
          auVar59._20_4_ = auVar178._20_4_ * fVar239;
          fVar263 = auVar133._24_4_;
          auVar59._24_4_ = auVar178._24_4_ * fVar263;
          auVar59._28_4_ = auVar178._28_4_;
          auVar23 = vsubps_avx(auVar316,auVar59);
          fVar160 = fVar160 + fVar160 * auVar23._0_4_;
          fVar232 = fVar232 + fVar232 * auVar23._4_4_;
          fVar182 = fVar182 + fVar182 * auVar23._8_4_;
          fVar234 = fVar234 + fVar234 * auVar23._12_4_;
          fVar184 = fVar184 + fVar184 * auVar23._16_4_;
          fVar239 = fVar239 + fVar239 * auVar23._20_4_;
          fVar263 = fVar263 + fVar263 * auVar23._24_4_;
          fVar183 = auVar133._28_4_ + auVar23._28_4_;
          auVar204._0_8_ = local_8c0._0_8_ ^ 0x8000000080000000;
          auVar204._8_4_ = -local_8c0._8_4_;
          auVar204._12_4_ = -local_8c0._12_4_;
          auVar204._16_4_ = -local_8c0._16_4_;
          auVar204._20_4_ = -local_8c0._20_4_;
          auVar204._24_4_ = -local_8c0._24_4_;
          auVar204._28_4_ = -local_8c0._28_4_;
          auVar133 = vsubps_avx(auVar204,auVar152);
          fVar211 = auVar133._0_4_ * fVar160;
          fVar215 = auVar133._4_4_ * fVar232;
          auVar60._4_4_ = fVar215;
          auVar60._0_4_ = fVar211;
          fVar231 = auVar133._8_4_ * fVar182;
          auVar60._8_4_ = fVar231;
          fVar233 = auVar133._12_4_ * fVar234;
          auVar60._12_4_ = fVar233;
          fVar235 = auVar133._16_4_ * fVar184;
          auVar60._16_4_ = fVar235;
          fVar236 = auVar133._20_4_ * fVar239;
          auVar60._20_4_ = fVar236;
          fVar240 = auVar133._24_4_ * fVar263;
          auVar60._24_4_ = fVar240;
          auVar60._28_4_ = 0x219392ef;
          auVar152 = vsubps_avx(auVar152,local_8c0);
          fVar160 = auVar152._0_4_ * fVar160;
          fVar232 = auVar152._4_4_ * fVar232;
          auVar61._4_4_ = fVar232;
          auVar61._0_4_ = fVar160;
          fVar182 = auVar152._8_4_ * fVar182;
          auVar61._8_4_ = fVar182;
          fVar234 = auVar152._12_4_ * fVar234;
          auVar61._12_4_ = fVar234;
          fVar184 = auVar152._16_4_ * fVar184;
          auVar61._16_4_ = fVar184;
          fVar239 = auVar152._20_4_ * fVar239;
          auVar61._20_4_ = fVar239;
          fVar263 = auVar152._24_4_ * fVar263;
          auVar61._24_4_ = fVar263;
          auVar61._28_4_ = fVar336;
          fVar185 = local_320 * (fVar211 * local_460 + fVar277);
          fVar186 = fStack_31c * (fVar215 * fStack_45c + fVar285);
          fVar187 = fStack_318 * (fVar231 * fStack_458 + fVar287);
          fVar190 = fStack_314 * (fVar233 * fStack_454 + fVar290);
          fVar208 = fStack_310 * (fVar235 * fStack_450 + fVar293);
          fVar209 = fStack_30c * (fVar236 * fStack_44c + fVar296);
          fVar210 = fStack_308 * (fVar240 * fStack_448 + fVar299);
          auVar153._0_4_ = auVar344._0_4_ + fVar181 * fVar185;
          auVar153._4_4_ = auVar344._4_4_ + fVar259 * fVar186;
          auVar153._8_4_ = auVar344._8_4_ + fVar189 * fVar187;
          auVar153._12_4_ = auVar344._12_4_ + fVar213 * fVar190;
          auVar153._16_4_ = auVar344._16_4_ + fVar238 * fVar208;
          auVar153._20_4_ = auVar344._20_4_ + fVar273 * fVar209;
          auVar153._24_4_ = auVar344._24_4_ + fVar15 * fVar210;
          auVar153._28_4_ = auVar344._28_4_ + auVar152._28_4_ + fVar301;
          auVar62._4_4_ = fVar215 * (float)local_740._4_4_;
          auVar62._0_4_ = fVar211 * (float)local_740._0_4_;
          auVar62._8_4_ = fVar231 * fStack_738;
          auVar62._12_4_ = fVar233 * fStack_734;
          auVar62._16_4_ = fVar235 * fStack_730;
          auVar62._20_4_ = fVar236 * fStack_72c;
          auVar62._24_4_ = fVar240 * fStack_728;
          auVar62._28_4_ = fVar183;
          auVar152 = vsubps_avx(auVar62,auVar153);
          auVar179._0_4_ = auVar358._0_4_ + fVar230 * fVar185;
          auVar179._4_4_ = auVar358._4_4_ + fVar255 * fVar186;
          auVar179._8_4_ = auVar358._8_4_ + fVar188 * fVar187;
          auVar179._12_4_ = auVar358._12_4_ + fVar212 * fVar190;
          auVar179._16_4_ = auVar358._16_4_ + fVar237 * fVar208;
          auVar179._20_4_ = auVar358._20_4_ + fVar270 * fVar209;
          auVar179._24_4_ = auVar358._24_4_ + fVar14 * fVar210;
          auVar179._28_4_ = auVar358._28_4_ + fVar183;
          auVar226._0_4_ = (float)local_760._0_4_ * fVar211;
          auVar226._4_4_ = (float)local_760._4_4_ * fVar215;
          auVar226._8_4_ = fStack_758 * fVar231;
          auVar226._12_4_ = fStack_754 * fVar233;
          auVar226._16_4_ = fStack_750 * fVar235;
          auVar226._20_4_ = fStack_74c * fVar236;
          auVar226._24_4_ = fStack_748 * fVar240;
          auVar226._28_4_ = 0;
          _local_a00 = vsubps_avx(auVar226,auVar179);
          auVar205._0_4_ = (float)local_5a0._0_4_ + fVar320 * fVar185;
          auVar205._4_4_ = (float)local_5a0._4_4_ + fVar324 * fVar186;
          auVar205._8_4_ = fStack_598 + fVar325 * fVar187;
          auVar205._12_4_ = fStack_594 + fVar326 * fVar190;
          auVar205._16_4_ = fStack_590 + fVar327 * fVar208;
          auVar205._20_4_ = fStack_58c + fVar328 * fVar209;
          auVar205._24_4_ = fStack_588 + fVar329 * fVar210;
          auVar205._28_4_ = fStack_584 + auVar133._28_4_;
          auVar63._4_4_ = (float)local_720._4_4_ * fVar215;
          auVar63._0_4_ = (float)local_720._0_4_ * fVar211;
          auVar63._8_4_ = fStack_718 * fVar231;
          auVar63._12_4_ = fStack_714 * fVar233;
          auVar63._16_4_ = fStack_710 * fVar235;
          auVar63._20_4_ = fStack_70c * fVar236;
          auVar63._24_4_ = fStack_708 * fVar240;
          auVar63._28_4_ = 0;
          auVar133 = vsubps_avx(auVar63,auVar205);
          auVar201 = auVar133._0_28_;
          fVar183 = local_320 * (fVar160 * local_460 + fVar277);
          fVar185 = fStack_31c * (fVar232 * fStack_45c + fVar285);
          fVar186 = fStack_318 * (fVar182 * fStack_458 + fVar287);
          fVar187 = fStack_314 * (fVar234 * fStack_454 + fVar290);
          fVar190 = fStack_310 * (fVar184 * fStack_450 + fVar293);
          fVar208 = fStack_30c * (fVar239 * fStack_44c + fVar296);
          fVar209 = fStack_308 * (fVar263 * fStack_448 + fVar299);
          auVar251._0_4_ = auVar344._0_4_ + fVar181 * fVar183;
          auVar251._4_4_ = auVar344._4_4_ + fVar259 * fVar185;
          auVar251._8_4_ = auVar344._8_4_ + fVar189 * fVar186;
          auVar251._12_4_ = auVar344._12_4_ + fVar213 * fVar187;
          auVar251._16_4_ = auVar344._16_4_ + fVar238 * fVar190;
          auVar251._20_4_ = auVar344._20_4_ + fVar273 * fVar208;
          auVar251._24_4_ = auVar344._24_4_ + fVar15 * fVar209;
          auVar251._28_4_ = auVar344._28_4_ + (float)local_540._28_4_;
          auVar64._4_4_ = fVar232 * (float)local_740._4_4_;
          auVar64._0_4_ = fVar160 * (float)local_740._0_4_;
          auVar64._8_4_ = fVar182 * fStack_738;
          auVar64._12_4_ = fVar234 * fStack_734;
          auVar64._16_4_ = fVar184 * fStack_730;
          auVar64._20_4_ = fVar239 * fStack_72c;
          auVar64._24_4_ = fVar263 * fStack_728;
          auVar64._28_4_ = fStack_724;
          _local_780 = vsubps_avx(auVar64,auVar251);
          auVar252._0_4_ = auVar358._0_4_ + fVar230 * fVar183;
          auVar252._4_4_ = auVar358._4_4_ + fVar255 * fVar185;
          auVar252._8_4_ = auVar358._8_4_ + fVar188 * fVar186;
          auVar252._12_4_ = auVar358._12_4_ + fVar212 * fVar187;
          auVar252._16_4_ = auVar358._16_4_ + fVar237 * fVar190;
          auVar252._20_4_ = auVar358._20_4_ + fVar270 * fVar208;
          auVar252._24_4_ = auVar358._24_4_ + fVar14 * fVar209;
          auVar252._28_4_ = auVar358._28_4_ + local_780._28_4_;
          auVar65._4_4_ = (float)local_760._4_4_ * fVar232;
          auVar65._0_4_ = (float)local_760._0_4_ * fVar160;
          auVar65._8_4_ = fStack_758 * fVar182;
          auVar65._12_4_ = fStack_754 * fVar234;
          auVar65._16_4_ = fStack_750 * fVar184;
          auVar65._20_4_ = fStack_74c * fVar239;
          auVar65._24_4_ = fStack_748 * fVar263;
          auVar65._28_4_ = fStack_724;
          _local_7a0 = vsubps_avx(auVar65,auVar252);
          auVar227._0_4_ = (float)local_5a0._0_4_ + fVar320 * fVar183;
          auVar227._4_4_ = (float)local_5a0._4_4_ + fVar324 * fVar185;
          auVar227._8_4_ = fStack_598 + fVar325 * fVar186;
          auVar227._12_4_ = fStack_594 + fVar326 * fVar187;
          auVar227._16_4_ = fStack_590 + fVar327 * fVar190;
          auVar227._20_4_ = fStack_58c + fVar328 * fVar208;
          auVar227._24_4_ = fStack_588 + fVar329 * fVar209;
          auVar227._28_4_ = fStack_584 + fVar301 + 0.0;
          auVar66._4_4_ = (float)local_720._4_4_ * fVar232;
          auVar66._0_4_ = (float)local_720._0_4_ * fVar160;
          auVar66._8_4_ = fStack_718 * fVar182;
          auVar66._12_4_ = fStack_714 * fVar234;
          auVar66._16_4_ = fStack_710 * fVar184;
          auVar66._20_4_ = fStack_70c * fVar239;
          auVar66._24_4_ = fStack_708 * fVar263;
          auVar66._28_4_ = local_7a0._28_4_;
          _local_7c0 = vsubps_avx(auVar66,auVar227);
          auVar133 = vcmpps_avx(auVar97,_DAT_01faff00,5);
          auVar228._8_4_ = 0x7f800000;
          auVar228._0_8_ = 0x7f8000007f800000;
          auVar228._12_4_ = 0x7f800000;
          auVar228._16_4_ = 0x7f800000;
          auVar228._20_4_ = 0x7f800000;
          auVar228._24_4_ = 0x7f800000;
          auVar228._28_4_ = 0x7f800000;
          auVar225 = vblendvps_avx(auVar228,auVar60,auVar133);
          auVar317._8_4_ = 0x7fffffff;
          auVar317._0_8_ = 0x7fffffff7fffffff;
          auVar317._12_4_ = 0x7fffffff;
          auVar317._16_4_ = 0x7fffffff;
          auVar317._20_4_ = 0x7fffffff;
          auVar317._24_4_ = 0x7fffffff;
          auVar317._28_4_ = 0x7fffffff;
          auVar97 = vandps_avx(auVar317,local_340);
          auVar97 = vmaxps_avx(local_420,auVar97);
          auVar67._4_4_ = auVar97._4_4_ * 1.9073486e-06;
          auVar67._0_4_ = auVar97._0_4_ * 1.9073486e-06;
          auVar67._8_4_ = auVar97._8_4_ * 1.9073486e-06;
          auVar67._12_4_ = auVar97._12_4_ * 1.9073486e-06;
          auVar67._16_4_ = auVar97._16_4_ * 1.9073486e-06;
          auVar67._20_4_ = auVar97._20_4_ * 1.9073486e-06;
          auVar67._24_4_ = auVar97._24_4_ * 1.9073486e-06;
          auVar67._28_4_ = auVar97._28_4_;
          auVar97 = vandps_avx(auVar317,local_440);
          auVar97 = vcmpps_avx(auVar97,auVar67,1);
          auVar253._8_4_ = 0xff800000;
          auVar253._0_8_ = 0xff800000ff800000;
          auVar253._12_4_ = 0xff800000;
          auVar253._16_4_ = 0xff800000;
          auVar253._20_4_ = 0xff800000;
          auVar253._24_4_ = 0xff800000;
          auVar253._28_4_ = 0xff800000;
          auVar250 = vblendvps_avx(auVar253,auVar61,auVar133);
          auVar23 = auVar133 & auVar97;
          if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar23 >> 0x7f,0) != '\0') ||
                (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar23 >> 0xbf,0) != '\0') ||
              (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar23[0x1f] < '\0') {
            auVar246 = vandps_avx(auVar97,auVar133);
            auVar218 = vpackssdw_avx(auVar246._0_16_,auVar246._16_16_);
            auVar350 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar23 = vcmpps_avx(local_860,auVar350,2);
            auVar362._8_4_ = 0xff800000;
            auVar362._0_8_ = 0xff800000ff800000;
            auVar362._12_4_ = 0xff800000;
            auVar362._16_4_ = 0xff800000;
            auVar362._20_4_ = 0xff800000;
            auVar362._24_4_ = 0xff800000;
            auVar362._28_4_ = 0xff800000;
            auVar365._8_4_ = 0x7f800000;
            auVar365._0_8_ = 0x7f8000007f800000;
            auVar365._12_4_ = 0x7f800000;
            auVar365._16_4_ = 0x7f800000;
            auVar365._20_4_ = 0x7f800000;
            auVar365._24_4_ = 0x7f800000;
            auVar365._28_4_ = 0x7f800000;
            auVar97 = vblendvps_avx(auVar365,auVar362,auVar23);
            auVar118 = vpmovsxwd_avx(auVar218);
            auVar218 = vpunpckhwd_avx(auVar218,auVar218);
            auVar318._16_16_ = auVar218;
            auVar318._0_16_ = auVar118;
            auVar225 = vblendvps_avx(auVar225,auVar97,auVar318);
            auVar97 = vblendvps_avx(auVar362,auVar365,auVar23);
            auVar250 = vblendvps_avx(auVar250,auVar97,auVar318);
            auVar97 = vcmpps_avx(auVar350,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar107._0_4_ = auVar97._0_4_ ^ auVar246._0_4_;
            auVar107._4_4_ = auVar97._4_4_ ^ auVar246._4_4_;
            auVar107._8_4_ = auVar97._8_4_ ^ auVar246._8_4_;
            auVar107._12_4_ = auVar97._12_4_ ^ auVar246._12_4_;
            auVar107._16_4_ = auVar97._16_4_ ^ auVar246._16_4_;
            auVar107._20_4_ = auVar97._20_4_ ^ auVar246._20_4_;
            auVar107._24_4_ = auVar97._24_4_ ^ auVar246._24_4_;
            auVar107._28_4_ = auVar97._28_4_ ^ auVar246._28_4_;
            auVar246 = vorps_avx(auVar23,auVar107);
            auVar246 = vandps_avx(auVar133,auVar246);
          }
          auVar176 = local_a00._0_28_;
          local_9e0 = auVar152;
        }
        auVar363 = ZEXT3264(local_940);
        _local_3c0 = _local_7e0;
        local_3a0 = vminps_avx(local_360,auVar225);
        local_380 = vmaxps_avx(_local_7e0,auVar250);
        auVar97 = vcmpps_avx(_local_7e0,local_3a0,2);
        _local_4c0 = vandps_avx(auVar96,auVar97);
        auVar97 = vcmpps_avx(local_380,local_360,2);
        local_500 = vandps_avx(auVar96,auVar97);
        auVar96 = vorps_avx(local_500,_local_4c0);
        if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar96 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar96 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar96 >> 0x7f,0) != '\0') ||
              (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar96 >> 0xbf,0) != '\0') ||
            (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar96[0x1f] < '\0') {
          _local_5a0 = local_380;
          auVar97 = _local_5a0;
          _local_5c0 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          local_520._0_4_ = auVar246._0_4_ ^ local_5c0._0_4_;
          local_520._4_4_ = auVar246._4_4_ ^ local_5c0._4_4_;
          local_520._8_4_ = auVar246._8_4_ ^ local_5c0._8_4_;
          local_520._12_4_ = auVar246._12_4_ ^ local_5c0._12_4_;
          local_520._16_4_ = auVar246._16_4_ ^ local_5c0._16_4_;
          local_520._20_4_ = auVar246._20_4_ ^ local_5c0._20_4_;
          local_520._24_4_ = auVar246._24_4_ ^ local_5c0._24_4_;
          local_520._28_4_ = (uint)auVar246._28_4_ ^ (uint)local_5c0._28_4_;
          auVar102._0_4_ =
               auVar152._0_4_ * (float)local_740._0_4_ +
               auVar176._0_4_ * (float)local_760._0_4_ + (float)local_720._0_4_ * auVar201._0_4_;
          auVar102._4_4_ =
               auVar152._4_4_ * (float)local_740._4_4_ +
               auVar176._4_4_ * (float)local_760._4_4_ + (float)local_720._4_4_ * auVar201._4_4_;
          auVar102._8_4_ =
               auVar152._8_4_ * fStack_738 +
               auVar176._8_4_ * fStack_758 + fStack_718 * auVar201._8_4_;
          auVar102._12_4_ =
               auVar152._12_4_ * fStack_734 +
               auVar176._12_4_ * fStack_754 + fStack_714 * auVar201._12_4_;
          auVar102._16_4_ =
               auVar152._16_4_ * fStack_730 +
               auVar176._16_4_ * fStack_750 + fStack_710 * auVar201._16_4_;
          auVar102._20_4_ =
               auVar152._20_4_ * fStack_72c +
               auVar176._20_4_ * fStack_74c + fStack_70c * auVar201._20_4_;
          auVar102._24_4_ =
               auVar152._24_4_ * fStack_728 +
               auVar176._24_4_ * fStack_748 + fStack_708 * auVar201._24_4_;
          auVar102._28_4_ = auVar246._28_4_ + local_5c0._28_4_ + auVar152._28_4_;
          auVar136._8_4_ = 0x7fffffff;
          auVar136._0_8_ = 0x7fffffff7fffffff;
          auVar136._12_4_ = 0x7fffffff;
          auVar136._16_4_ = 0x7fffffff;
          auVar136._20_4_ = 0x7fffffff;
          auVar136._24_4_ = 0x7fffffff;
          auVar136._28_4_ = 0x7fffffff;
          auVar96 = vandps_avx(auVar102,auVar136);
          auVar137._8_4_ = 0x3e99999a;
          auVar137._0_8_ = 0x3e99999a3e99999a;
          auVar137._12_4_ = 0x3e99999a;
          auVar137._16_4_ = 0x3e99999a;
          auVar137._20_4_ = 0x3e99999a;
          auVar137._24_4_ = 0x3e99999a;
          auVar137._28_4_ = 0x3e99999a;
          auVar96 = vcmpps_avx(auVar96,auVar137,1);
          auVar96 = vorps_avx(auVar96,local_520);
          auVar138._8_4_ = 3;
          auVar138._0_8_ = 0x300000003;
          auVar138._12_4_ = 3;
          auVar138._16_4_ = 3;
          auVar138._20_4_ = 3;
          auVar138._24_4_ = 3;
          auVar138._28_4_ = 3;
          auVar154._8_4_ = 2;
          auVar154._0_8_ = 0x200000002;
          auVar154._12_4_ = 2;
          auVar154._16_4_ = 2;
          auVar154._20_4_ = 2;
          auVar154._24_4_ = 2;
          auVar154._28_4_ = 2;
          auVar96 = vblendvps_avx(auVar154,auVar138,auVar96);
          local_540 = ZEXT432(local_c08);
          auVar118 = vpshufd_avx(ZEXT416(local_c08),0);
          auVar218 = vpcmpgtd_avx(auVar96._16_16_,auVar118);
          local_580 = auVar118._0_4_;
          fStack_57c = auVar118._4_4_;
          fStack_578 = auVar118._8_4_;
          fStack_574 = auVar118._12_4_;
          auVar118 = vpcmpgtd_avx(auVar96._0_16_,auVar118);
          auVar139._16_16_ = auVar218;
          auVar139._0_16_ = auVar118;
          local_4e0 = vblendps_avx(ZEXT1632(auVar118),auVar139,0xf0);
          local_4a0 = vandnps_avx(local_4e0,_local_4c0);
          auVar323 = ZEXT3264(local_4a0);
          auVar96 = _local_4c0 & ~local_4e0;
          auVar306 = ZEXT3264(local_9c0);
          auVar254 = ZEXT3264(local_9a0);
          local_a80 = auVar83._0_4_;
          fStack_a7c = auVar83._4_4_;
          fStack_a78 = auVar83._8_4_;
          fStack_a74 = auVar83._12_4_;
          local_a60 = auVar82._0_4_;
          fStack_a5c = auVar82._4_4_;
          fStack_a58 = auVar82._8_4_;
          fStack_a54 = auVar82._12_4_;
          local_a70 = auVar22._0_4_;
          fStack_a6c = auVar22._4_4_;
          fStack_a68 = auVar22._8_4_;
          fStack_a64 = auVar22._12_4_;
          local_a90 = auVar119._0_4_;
          fStack_a8c = auVar119._4_4_;
          fStack_a88 = auVar119._8_4_;
          fStack_a84 = auVar119._12_4_;
          if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar96 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar96 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar96 >> 0x7f,0) == '\0') &&
                (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar96 >> 0xbf,0) == '\0') &&
              (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar96[0x1f]) {
            auVar218 = vshufps_avx(auVar81,auVar81,0);
            auVar103._16_16_ = auVar218;
            auVar103._0_16_ = auVar218;
            local_5a0._0_4_ = local_380._0_4_;
            local_5a0._4_4_ = local_380._4_4_;
            fStack_598 = local_380._8_4_;
            fStack_594 = local_380._12_4_;
            fStack_590 = local_380._16_4_;
            fStack_58c = local_380._20_4_;
            fStack_588 = local_380._24_4_;
            fStack_584 = local_380._28_4_;
            auVar201 = local_740._0_28_;
            fVar160 = (float)local_5a0._0_4_;
            fVar230 = (float)local_5a0._4_4_;
            fVar181 = fStack_598;
            fVar232 = fStack_594;
            fVar182 = fStack_590;
            fVar234 = fStack_58c;
            fVar184 = fStack_588;
            fVar239 = fStack_584;
            _local_5a0 = auVar97;
          }
          else {
            local_8e0._4_4_ = (float)local_7e0._4_4_ + local_880._4_4_;
            local_8e0._0_4_ = (float)local_7e0._0_4_ + (float)local_880;
            fStack_8d8 = fStack_7d8 + (float)uStack_878;
            fStack_8d4 = fStack_7d4 + uStack_878._4_4_;
            fStack_8d0 = fStack_7d0 + (float)uStack_870;
            fStack_8cc = fStack_7cc + uStack_870._4_4_;
            fStack_8c8 = fStack_7c8 + (float)uStack_868;
            fStack_8c4 = fStack_7c4 + uStack_868._4_4_;
            do {
              auVar104._8_4_ = 0x7f800000;
              auVar104._0_8_ = 0x7f8000007f800000;
              auVar104._12_4_ = 0x7f800000;
              auVar104._16_4_ = 0x7f800000;
              auVar104._20_4_ = 0x7f800000;
              auVar104._24_4_ = 0x7f800000;
              auVar104._28_4_ = 0x7f800000;
              auVar96 = auVar323._0_32_;
              auVar246 = vblendvps_avx(auVar104,_local_7e0,auVar96);
              auVar97 = vshufps_avx(auVar246,auVar246,0xb1);
              auVar97 = vminps_avx(auVar246,auVar97);
              auVar133 = vshufpd_avx(auVar97,auVar97,5);
              auVar97 = vminps_avx(auVar97,auVar133);
              auVar133 = vperm2f128_avx(auVar97,auVar97,1);
              auVar97 = vminps_avx(auVar97,auVar133);
              auVar246 = vcmpps_avx(auVar246,auVar97,0);
              auVar97 = auVar96 & auVar246;
              if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar97 >> 0x7f,0) != '\0') ||
                    (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar97 >> 0xbf,0) != '\0') ||
                  (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar97[0x1f] < '\0') {
                auVar96 = vandps_avx(auVar246,auVar96);
              }
              uVar71 = vmovmskps_avx(auVar96);
              uVar74 = 0;
              if (uVar71 != 0) {
                for (; (uVar71 >> uVar74 & 1) == 0; uVar74 = uVar74 + 1) {
                }
              }
              uVar73 = (ulong)uVar74;
              *(undefined4 *)(local_4a0 + uVar73 * 4) = 0;
              fVar160 = local_1a0[uVar73];
              uVar74 = *(uint *)(local_3c0 + uVar73 * 4);
              fVar230 = auVar120._0_4_;
              if ((float)local_900._0_4_ < 0.0) {
                fVar230 = sqrtf((float)local_900._0_4_);
              }
              auVar81 = vminps_avx(auVar82,auVar83);
              auVar218 = vmaxps_avx(auVar82,auVar83);
              auVar118 = vminps_avx(auVar22,auVar119);
              auVar91 = vminps_avx(auVar81,auVar118);
              auVar81 = vmaxps_avx(auVar22,auVar119);
              auVar118 = vmaxps_avx(auVar218,auVar81);
              auVar164._8_4_ = 0x7fffffff;
              auVar164._0_8_ = 0x7fffffff7fffffff;
              auVar164._12_4_ = 0x7fffffff;
              auVar218 = vandps_avx(auVar91,auVar164);
              auVar81 = vandps_avx(auVar118,auVar164);
              auVar218 = vmaxps_avx(auVar218,auVar81);
              auVar81 = vmovshdup_avx(auVar218);
              auVar81 = vmaxss_avx(auVar81,auVar218);
              auVar218 = vshufpd_avx(auVar218,auVar218,1);
              auVar218 = vmaxss_avx(auVar218,auVar81);
              local_9e0._0_4_ = auVar218._0_4_ * 1.9073486e-06;
              local_6a0._0_4_ = fVar230 * 1.9073486e-06;
              local_700._0_16_ = vshufps_avx(auVar118,auVar118,0xff);
              auVar218 = vinsertps_avx(ZEXT416(uVar74),ZEXT416((uint)fVar160),0x10);
              lVar79 = 5;
              do {
                auVar81 = vmovshdup_avx(auVar218);
                fVar186 = auVar81._0_4_;
                fVar182 = 1.0 - fVar186;
                auVar81 = vshufps_avx(auVar218,auVar218,0x55);
                fVar160 = auVar81._0_4_;
                fVar230 = auVar81._4_4_;
                fVar181 = auVar81._8_4_;
                fVar232 = auVar81._12_4_;
                auVar81 = vshufps_avx(ZEXT416((uint)fVar182),ZEXT416((uint)fVar182),0);
                fVar234 = auVar81._0_4_;
                fVar184 = auVar81._4_4_;
                fVar239 = auVar81._8_4_;
                fVar255 = auVar81._12_4_;
                fVar259 = local_a70 * fVar160 + local_a80 * fVar234;
                fVar263 = fStack_a6c * fVar230 + fStack_a7c * fVar184;
                fVar183 = fStack_a68 * fVar181 + fStack_a78 * fVar239;
                fVar185 = fStack_a64 * fVar232 + fStack_a74 * fVar255;
                auVar219._0_4_ =
                     fVar234 * (local_a80 * fVar160 + fVar234 * local_a60) + fVar160 * fVar259;
                auVar219._4_4_ =
                     fVar184 * (fStack_a7c * fVar230 + fVar184 * fStack_a5c) + fVar230 * fVar263;
                auVar219._8_4_ =
                     fVar239 * (fStack_a78 * fVar181 + fVar239 * fStack_a58) + fVar181 * fVar183;
                auVar219._12_4_ =
                     fVar255 * (fStack_a74 * fVar232 + fVar255 * fStack_a54) + fVar232 * fVar185;
                auVar165._0_4_ =
                     fVar234 * fVar259 + fVar160 * (fVar160 * local_a90 + local_a70 * fVar234);
                auVar165._4_4_ =
                     fVar184 * fVar263 + fVar230 * (fVar230 * fStack_a8c + fStack_a6c * fVar184);
                auVar165._8_4_ =
                     fVar239 * fVar183 + fVar181 * (fVar181 * fStack_a88 + fStack_a68 * fVar239);
                auVar165._12_4_ =
                     fVar255 * fVar185 + fVar232 * (fVar232 * fStack_a84 + fStack_a64 * fVar255);
                auVar81 = vshufps_avx(auVar218,auVar218,0);
                auVar121._0_4_ = auVar81._0_4_ * (float)local_8f0._0_4_ + 0.0;
                auVar121._4_4_ = auVar81._4_4_ * (float)local_8f0._4_4_ + 0.0;
                auVar121._8_4_ = auVar81._8_4_ * fStack_8e8 + 0.0;
                auVar121._12_4_ = auVar81._12_4_ * fStack_8e4 + 0.0;
                auVar87._0_4_ = fVar234 * auVar219._0_4_ + fVar160 * auVar165._0_4_;
                auVar87._4_4_ = fVar184 * auVar219._4_4_ + fVar230 * auVar165._4_4_;
                auVar87._8_4_ = fVar239 * auVar219._8_4_ + fVar181 * auVar165._8_4_;
                auVar87._12_4_ = fVar255 * auVar219._12_4_ + fVar232 * auVar165._12_4_;
                local_860._0_16_ = auVar87;
                auVar81 = vsubps_avx(auVar121,auVar87);
                _local_a00 = auVar81;
                auVar81 = vdpps_avx(auVar81,auVar81,0x7f);
                fVar160 = auVar81._0_4_;
                if (fVar160 < 0.0) {
                  fVar230 = sqrtf(fVar160);
                }
                else {
                  auVar118 = vsqrtss_avx(auVar81,auVar81);
                  fVar230 = auVar118._0_4_;
                }
                auVar118 = vsubps_avx(auVar165,auVar219);
                auVar244._0_4_ = auVar118._0_4_ * 3.0;
                auVar244._4_4_ = auVar118._4_4_ * 3.0;
                auVar244._8_4_ = auVar118._8_4_ * 3.0;
                auVar244._12_4_ = auVar118._12_4_ * 3.0;
                auVar118 = vshufps_avx(ZEXT416((uint)(fVar186 * 6.0)),ZEXT416((uint)(fVar186 * 6.0))
                                       ,0);
                auVar91 = ZEXT416((uint)((fVar182 - (fVar186 + fVar186)) * 6.0));
                auVar148 = vshufps_avx(auVar91,auVar91,0);
                auVar91 = ZEXT416((uint)((fVar186 - (fVar182 + fVar182)) * 6.0));
                auVar144 = vshufps_avx(auVar91,auVar91,0);
                auVar145 = vshufps_avx(ZEXT416((uint)(fVar182 * 6.0)),ZEXT416((uint)(fVar182 * 6.0))
                                       ,0);
                auVar91 = vdpps_avx(auVar244,auVar244,0x7f);
                auVar122._0_4_ =
                     auVar145._0_4_ * local_a60 +
                     auVar144._0_4_ * local_a80 +
                     auVar118._0_4_ * local_a90 + auVar148._0_4_ * local_a70;
                auVar122._4_4_ =
                     auVar145._4_4_ * fStack_a5c +
                     auVar144._4_4_ * fStack_a7c +
                     auVar118._4_4_ * fStack_a8c + auVar148._4_4_ * fStack_a6c;
                auVar122._8_4_ =
                     auVar145._8_4_ * fStack_a58 +
                     auVar144._8_4_ * fStack_a78 +
                     auVar118._8_4_ * fStack_a88 + auVar148._8_4_ * fStack_a68;
                auVar122._12_4_ =
                     auVar145._12_4_ * fStack_a54 +
                     auVar144._12_4_ * fStack_a74 +
                     auVar118._12_4_ * fStack_a84 + auVar148._12_4_ * fStack_a64;
                auVar118 = vblendps_avx(auVar91,_DAT_01f7aa10,0xe);
                auVar148 = vrsqrtss_avx(auVar118,auVar118);
                fVar232 = auVar148._0_4_;
                fVar181 = auVar91._0_4_;
                auVar148 = vdpps_avx(auVar244,auVar122,0x7f);
                auVar144 = vshufps_avx(auVar91,auVar91,0);
                auVar123._0_4_ = auVar122._0_4_ * auVar144._0_4_;
                auVar123._4_4_ = auVar122._4_4_ * auVar144._4_4_;
                auVar123._8_4_ = auVar122._8_4_ * auVar144._8_4_;
                auVar123._12_4_ = auVar122._12_4_ * auVar144._12_4_;
                auVar148 = vshufps_avx(auVar148,auVar148,0);
                auVar193._0_4_ = auVar244._0_4_ * auVar148._0_4_;
                auVar193._4_4_ = auVar244._4_4_ * auVar148._4_4_;
                auVar193._8_4_ = auVar244._8_4_ * auVar148._8_4_;
                auVar193._12_4_ = auVar244._12_4_ * auVar148._12_4_;
                auVar145 = vsubps_avx(auVar123,auVar193);
                auVar148 = vrcpss_avx(auVar118,auVar118);
                auVar118 = vmaxss_avx(ZEXT416((uint)local_9e0._0_4_),
                                      ZEXT416((uint)(auVar218._0_4_ * (float)local_6a0._0_4_)));
                auVar148 = ZEXT416((uint)(auVar148._0_4_ * (2.0 - fVar181 * auVar148._0_4_)));
                auVar148 = vshufps_avx(auVar148,auVar148,0);
                uVar73 = CONCAT44(auVar244._4_4_,auVar244._0_4_);
                auVar303._0_8_ = uVar73 ^ 0x8000000080000000;
                auVar303._8_4_ = -auVar244._8_4_;
                auVar303._12_4_ = -auVar244._12_4_;
                auVar144 = ZEXT416((uint)(fVar232 * 1.5 +
                                         fVar181 * -0.5 * fVar232 * fVar232 * fVar232));
                auVar144 = vshufps_avx(auVar144,auVar144,0);
                auVar166._0_4_ = auVar144._0_4_ * auVar145._0_4_ * auVar148._0_4_;
                auVar166._4_4_ = auVar144._4_4_ * auVar145._4_4_ * auVar148._4_4_;
                auVar166._8_4_ = auVar144._8_4_ * auVar145._8_4_ * auVar148._8_4_;
                auVar166._12_4_ = auVar144._12_4_ * auVar145._12_4_ * auVar148._12_4_;
                local_920._0_4_ = auVar244._0_4_ * auVar144._0_4_;
                local_920._4_4_ = auVar244._4_4_ * auVar144._4_4_;
                local_920._8_4_ = auVar244._8_4_ * auVar144._8_4_;
                local_920._12_4_ = auVar244._12_4_ * auVar144._12_4_;
                if (fVar181 < 0.0) {
                  fVar181 = sqrtf(fVar181);
                }
                else {
                  auVar91 = vsqrtss_avx(auVar91,auVar91);
                  fVar181 = auVar91._0_4_;
                }
                auVar91 = vdpps_avx(_local_a00,local_920._0_16_,0x7f);
                fVar230 = ((float)local_9e0._0_4_ / fVar181) * (fVar230 + 1.0) +
                          fVar230 * (float)local_9e0._0_4_ + auVar118._0_4_;
                auVar148 = vdpps_avx(auVar303,local_920._0_16_,0x7f);
                auVar144 = vdpps_avx(_local_a00,auVar166,0x7f);
                auVar145 = vdpps_avx(_local_8f0,local_920._0_16_,0x7f);
                auVar161 = vdpps_avx(_local_a00,auVar303,0x7f);
                fVar181 = auVar148._0_4_ + auVar144._0_4_;
                fVar232 = auVar91._0_4_;
                auVar88._0_4_ = fVar232 * fVar232;
                auVar88._4_4_ = auVar91._4_4_ * auVar91._4_4_;
                auVar88._8_4_ = auVar91._8_4_ * auVar91._8_4_;
                auVar88._12_4_ = auVar91._12_4_ * auVar91._12_4_;
                auVar144 = vsubps_avx(auVar81,auVar88);
                local_920._0_16_ = ZEXT416((uint)fVar181);
                auVar148 = vdpps_avx(_local_a00,_local_8f0,0x7f);
                fVar182 = auVar161._0_4_ - fVar232 * fVar181;
                fVar232 = auVar148._0_4_ - fVar232 * auVar145._0_4_;
                auVar148 = vrsqrtss_avx(auVar144,auVar144);
                fVar234 = auVar144._0_4_;
                fVar181 = auVar148._0_4_;
                fVar181 = fVar181 * 1.5 + fVar234 * -0.5 * fVar181 * fVar181 * fVar181;
                if (fVar234 < 0.0) {
                  local_8c0._0_4_ = fVar182;
                  local_6c0._0_4_ = fVar232;
                  local_6e0._0_4_ = fVar181;
                  fVar234 = sqrtf(fVar234);
                  fVar181 = (float)local_6e0._0_4_;
                  fVar182 = (float)local_8c0._0_4_;
                  fVar232 = (float)local_6c0._0_4_;
                }
                else {
                  auVar148 = vsqrtss_avx(auVar144,auVar144);
                  fVar234 = auVar148._0_4_;
                }
                auVar306 = ZEXT3264(local_9c0);
                auVar363 = ZEXT3264(local_940);
                auVar161 = vpermilps_avx(local_860._0_16_,0xff);
                auVar162 = vshufps_avx(auVar244,auVar244,0xff);
                fVar182 = fVar182 * fVar181 - auVar162._0_4_;
                auVar194._0_8_ = auVar145._0_8_ ^ 0x8000000080000000;
                auVar194._8_4_ = auVar145._8_4_ ^ 0x80000000;
                auVar194._12_4_ = auVar145._12_4_ ^ 0x80000000;
                auVar220._0_4_ = -fVar182;
                auVar220._4_4_ = 0x80000000;
                auVar220._8_4_ = 0x80000000;
                auVar220._12_4_ = 0x80000000;
                auVar148 = vinsertps_avx(auVar220,ZEXT416((uint)(fVar232 * fVar181)),0x1c);
                auVar145 = vmovsldup_avx(ZEXT416((uint)(local_920._0_4_ * fVar232 * fVar181 -
                                                       auVar145._0_4_ * fVar182)));
                auVar148 = vdivps_avx(auVar148,auVar145);
                auVar144 = vinsertps_avx(local_920._0_16_,auVar194,0x10);
                auVar144 = vdivps_avx(auVar144,auVar145);
                auVar145 = vmovsldup_avx(auVar91);
                auVar93 = ZEXT416((uint)(fVar234 - auVar161._0_4_));
                auVar161 = vmovsldup_avx(auVar93);
                auVar146._0_4_ = auVar145._0_4_ * auVar148._0_4_ + auVar161._0_4_ * auVar144._0_4_;
                auVar146._4_4_ = auVar145._4_4_ * auVar148._4_4_ + auVar161._4_4_ * auVar144._4_4_;
                auVar146._8_4_ = auVar145._8_4_ * auVar148._8_4_ + auVar161._8_4_ * auVar144._8_4_;
                auVar146._12_4_ =
                     auVar145._12_4_ * auVar148._12_4_ + auVar161._12_4_ * auVar144._12_4_;
                auVar218 = vsubps_avx(auVar218,auVar146);
                auVar147._8_4_ = 0x7fffffff;
                auVar147._0_8_ = 0x7fffffff7fffffff;
                auVar147._12_4_ = 0x7fffffff;
                auVar91 = vandps_avx(auVar91,auVar147);
                if (auVar91._0_4_ < fVar230) {
                  auVar167._8_4_ = 0x7fffffff;
                  auVar167._0_8_ = 0x7fffffff7fffffff;
                  auVar167._12_4_ = 0x7fffffff;
                  auVar91 = vandps_avx(auVar93,auVar167);
                  if (auVar91._0_4_ <
                      (float)local_700._0_4_ * 1.9073486e-06 + fVar230 + auVar118._0_4_) {
                    fVar230 = auVar218._0_4_ + (float)local_810._0_4_;
                    auVar254 = ZEXT3264(local_9a0);
                    if ((fVar214 <= fVar230) &&
                       (fVar181 = *(float *)(ray + k * 4 + 0x80), fVar230 <= fVar181)) {
                      auVar118 = vmovshdup_avx(auVar218);
                      fVar232 = auVar118._0_4_;
                      if ((0.0 <= fVar232) && (fVar232 <= 1.0)) {
                        auVar81 = vrsqrtss_avx(auVar81,auVar81);
                        fVar182 = auVar81._0_4_;
                        pGVar5 = (context->scene->geometries).items[uVar76].ptr;
                        if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                          auVar81 = ZEXT416((uint)(fVar182 * 1.5 +
                                                  fVar160 * -0.5 * fVar182 * fVar182 * fVar182));
                          auVar81 = vshufps_avx(auVar81,auVar81,0);
                          auVar168._0_4_ = auVar81._0_4_ * (float)local_a00._0_4_;
                          auVar168._4_4_ = auVar81._4_4_ * (float)local_a00._4_4_;
                          auVar168._8_4_ = auVar81._8_4_ * fStack_9f8;
                          auVar168._12_4_ = auVar81._12_4_ * fStack_9f4;
                          auVar124._0_4_ = auVar244._0_4_ + auVar162._0_4_ * auVar168._0_4_;
                          auVar124._4_4_ = auVar244._4_4_ + auVar162._4_4_ * auVar168._4_4_;
                          auVar124._8_4_ = auVar244._8_4_ + auVar162._8_4_ * auVar168._8_4_;
                          auVar124._12_4_ = auVar244._12_4_ + auVar162._12_4_ * auVar168._12_4_;
                          auVar81 = vshufps_avx(auVar168,auVar168,0xc9);
                          auVar118 = vshufps_avx(auVar244,auVar244,0xc9);
                          auVar169._0_4_ = auVar118._0_4_ * auVar168._0_4_;
                          auVar169._4_4_ = auVar118._4_4_ * auVar168._4_4_;
                          auVar169._8_4_ = auVar118._8_4_ * auVar168._8_4_;
                          auVar169._12_4_ = auVar118._12_4_ * auVar168._12_4_;
                          auVar195._0_4_ = auVar244._0_4_ * auVar81._0_4_;
                          auVar195._4_4_ = auVar244._4_4_ * auVar81._4_4_;
                          auVar195._8_4_ = auVar244._8_4_ * auVar81._8_4_;
                          auVar195._12_4_ = auVar244._12_4_ * auVar81._12_4_;
                          auVar91 = vsubps_avx(auVar195,auVar169);
                          auVar81 = vshufps_avx(auVar91,auVar91,0xc9);
                          auVar118 = vshufps_avx(auVar124,auVar124,0xc9);
                          auVar196._0_4_ = auVar118._0_4_ * auVar81._0_4_;
                          auVar196._4_4_ = auVar118._4_4_ * auVar81._4_4_;
                          auVar196._8_4_ = auVar118._8_4_ * auVar81._8_4_;
                          auVar196._12_4_ = auVar118._12_4_ * auVar81._12_4_;
                          auVar81 = vshufps_avx(auVar91,auVar91,0xd2);
                          auVar125._0_4_ = auVar124._0_4_ * auVar81._0_4_;
                          auVar125._4_4_ = auVar124._4_4_ * auVar81._4_4_;
                          auVar125._8_4_ = auVar124._8_4_ * auVar81._8_4_;
                          auVar125._12_4_ = auVar124._12_4_ * auVar81._12_4_;
                          auVar81 = vsubps_avx(auVar196,auVar125);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x80) = fVar230;
                            uVar2 = vextractps_avx(auVar81,1);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
                            uVar2 = vextractps_avx(auVar81,2);
                            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                            *(int *)(ray + k * 4 + 0xe0) = auVar81._0_4_;
                            *(float *)(ray + k * 4 + 0xf0) = fVar232;
                            *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                            *(int *)(ray + k * 4 + 0x110) = (int)local_8a0;
                            *(uint *)(ray + k * 4 + 0x120) = uVar76;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            local_630 = vshufps_avx(auVar218,auVar218,0x55);
                            auVar218 = vshufps_avx(auVar81,auVar81,0x55);
                            auStack_650 = vshufps_avx(auVar81,auVar81,0xaa);
                            local_640 = vshufps_avx(auVar81,auVar81,0);
                            local_660 = (RTCHitN  [16])auVar218;
                            local_620 = ZEXT816(0) << 0x20;
                            local_610 = local_680._0_8_;
                            uStack_608 = local_680._8_8_;
                            local_600 = local_670._0_8_;
                            uStack_5f8 = local_670._8_8_;
                            uVar74 = context->user->instID[0];
                            _local_5f0 = CONCAT44(uVar74,uVar74);
                            _uStack_5e8 = CONCAT44(uVar74,uVar74);
                            uVar74 = context->user->instPrimID[0];
                            auVar126._4_4_ = uVar74;
                            auVar126._0_4_ = uVar74;
                            auVar126._8_4_ = uVar74;
                            auVar126._12_4_ = uVar74;
                            auStack_5e0 = auVar126;
                            *(float *)(ray + k * 4 + 0x80) = fVar230;
                            local_840._0_16_ = *local_948;
                            local_a50.valid = (int *)local_840;
                            local_a50.geometryUserPtr = pGVar5->userPtr;
                            local_a50.context = context->user;
                            local_a50.hit = local_660;
                            local_a50.N = 4;
                            auVar81 = *local_948;
                            local_a50.ray = (RTCRayN *)ray;
                            if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar5->intersectionFilterN)(&local_a50);
                              auVar254._8_56_ = extraout_var;
                              auVar254._0_8_ = extraout_XMM1_Qa;
                              auVar126 = auVar254._0_16_;
                              auVar254 = ZEXT3264(local_9a0);
                              auVar363 = ZEXT3264(local_940);
                              auVar306 = ZEXT3264(local_9c0);
                              auVar81 = local_840._0_16_;
                            }
                            if (auVar81 == (undefined1  [16])0x0) {
                              auVar218 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar81 = vpcmpeqd_avx(auVar126,auVar126);
                              auVar218 = auVar218 ^ auVar81;
                            }
                            else {
                              p_Var7 = context->args->filter;
                              auVar118 = vpcmpeqd_avx(auVar218,auVar218);
                              if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var7)(&local_a50);
                                auVar254 = ZEXT3264(local_9a0);
                                auVar363 = ZEXT3264(local_940);
                                auVar306 = ZEXT3264(local_9c0);
                                auVar118 = vpcmpeqd_avx(auVar118,auVar118);
                                auVar81 = local_840._0_16_;
                              }
                              auVar91 = vpcmpeqd_avx(auVar81,_DAT_01f7aa10);
                              auVar218 = auVar91 ^ auVar118;
                              if (auVar81 != (undefined1  [16])0x0) {
                                auVar91 = auVar91 ^ auVar118;
                                auVar81 = vmaskmovps_avx(auVar91,*(undefined1 (*) [16])local_a50.hit
                                                        );
                                *(undefined1 (*) [16])(local_a50.ray + 0xc0) = auVar81;
                                auVar81 = vmaskmovps_avx(auVar91,*(undefined1 (*) [16])
                                                                  (local_a50.hit + 0x10));
                                *(undefined1 (*) [16])(local_a50.ray + 0xd0) = auVar81;
                                auVar81 = vmaskmovps_avx(auVar91,*(undefined1 (*) [16])
                                                                  (local_a50.hit + 0x20));
                                *(undefined1 (*) [16])(local_a50.ray + 0xe0) = auVar81;
                                auVar81 = vmaskmovps_avx(auVar91,*(undefined1 (*) [16])
                                                                  (local_a50.hit + 0x30));
                                *(undefined1 (*) [16])(local_a50.ray + 0xf0) = auVar81;
                                auVar81 = vmaskmovps_avx(auVar91,*(undefined1 (*) [16])
                                                                  (local_a50.hit + 0x40));
                                *(undefined1 (*) [16])(local_a50.ray + 0x100) = auVar81;
                                auVar81 = vmaskmovps_avx(auVar91,*(undefined1 (*) [16])
                                                                  (local_a50.hit + 0x50));
                                *(undefined1 (*) [16])(local_a50.ray + 0x110) = auVar81;
                                auVar81 = vmaskmovps_avx(auVar91,*(undefined1 (*) [16])
                                                                  (local_a50.hit + 0x60));
                                *(undefined1 (*) [16])(local_a50.ray + 0x120) = auVar81;
                                auVar81 = vmaskmovps_avx(auVar91,*(undefined1 (*) [16])
                                                                  (local_a50.hit + 0x70));
                                *(undefined1 (*) [16])(local_a50.ray + 0x130) = auVar81;
                                auVar81 = vmaskmovps_avx(auVar91,*(undefined1 (*) [16])
                                                                  (local_a50.hit + 0x80));
                                *(undefined1 (*) [16])(local_a50.ray + 0x140) = auVar81;
                              }
                            }
                            auVar89._8_8_ = 0x100000001;
                            auVar89._0_8_ = 0x100000001;
                            if ((auVar89 & auVar218) == (undefined1  [16])0x0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar181;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar79 = lVar79 + -1;
                auVar254 = ZEXT3264(local_9a0);
              } while (lVar79 != 0);
              auVar246 = local_4a0;
              uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar103._4_4_ = uVar2;
              auVar103._0_4_ = uVar2;
              auVar103._8_4_ = uVar2;
              auVar103._12_4_ = uVar2;
              auVar103._16_4_ = uVar2;
              auVar103._20_4_ = uVar2;
              auVar103._24_4_ = uVar2;
              auVar103._28_4_ = uVar2;
              auVar96 = vcmpps_avx(_local_8e0,auVar103,2);
              local_4a0 = vandps_avx(auVar96,local_4a0);
              auVar323 = ZEXT3264(local_4a0);
              auVar246 = auVar246 & auVar96;
              auVar201 = local_740._0_28_;
            } while ((((((((auVar246 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar246 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar246 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar246 >> 0x7f,0) != '\0') ||
                       (auVar246 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar246 >> 0xbf,0) != '\0') ||
                     (auVar246 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar246[0x1f] < '\0');
            auVar323 = ZEXT3264(local_380);
            fVar160 = (float)local_5a0._0_4_;
            fVar230 = (float)local_5a0._4_4_;
            fVar181 = fStack_598;
            fVar232 = fStack_594;
            fVar182 = fStack_590;
            fVar234 = fStack_58c;
            fVar184 = fStack_588;
            fVar239 = fStack_584;
          }
          auVar140._0_4_ =
               auVar201._0_4_ * (float)local_780._0_4_ +
               (float)local_760._0_4_ * (float)local_7a0._0_4_ +
               (float)local_720._0_4_ * (float)local_7c0._0_4_;
          auVar140._4_4_ =
               auVar201._4_4_ * (float)local_780._4_4_ +
               (float)local_760._4_4_ * (float)local_7a0._4_4_ +
               (float)local_720._4_4_ * (float)local_7c0._4_4_;
          auVar140._8_4_ =
               auVar201._8_4_ * fStack_778 + fStack_758 * fStack_798 + fStack_718 * fStack_7b8;
          auVar140._12_4_ =
               auVar201._12_4_ * fStack_774 + fStack_754 * fStack_794 + fStack_714 * fStack_7b4;
          auVar140._16_4_ =
               auVar201._16_4_ * fStack_770 + fStack_750 * fStack_790 + fStack_710 * fStack_7b0;
          auVar140._20_4_ =
               auVar201._20_4_ * fStack_76c + fStack_74c * fStack_78c + fStack_70c * fStack_7ac;
          auVar140._24_4_ =
               auVar201._24_4_ * fStack_768 + fStack_748 * fStack_788 + fStack_708 * fStack_7a8;
          auVar140._28_4_ = fStack_744 + fStack_744 + auVar323._28_4_;
          auVar155._8_4_ = 0x7fffffff;
          auVar155._0_8_ = 0x7fffffff7fffffff;
          auVar155._12_4_ = 0x7fffffff;
          auVar155._16_4_ = 0x7fffffff;
          auVar155._20_4_ = 0x7fffffff;
          auVar155._24_4_ = 0x7fffffff;
          auVar155._28_4_ = 0x7fffffff;
          auVar96 = vandps_avx(auVar140,auVar155);
          auVar156._8_4_ = 0x3e99999a;
          auVar156._0_8_ = 0x3e99999a3e99999a;
          auVar156._12_4_ = 0x3e99999a;
          auVar156._16_4_ = 0x3e99999a;
          auVar156._20_4_ = 0x3e99999a;
          auVar156._24_4_ = 0x3e99999a;
          auVar156._28_4_ = 0x3e99999a;
          auVar96 = vcmpps_avx(auVar96,auVar156,1);
          auVar246 = vorps_avx(auVar96,local_520);
          auVar157._0_4_ = fVar160 + (float)local_880;
          auVar157._4_4_ = fVar230 + local_880._4_4_;
          auVar157._8_4_ = fVar181 + (float)uStack_878;
          auVar157._12_4_ = fVar232 + uStack_878._4_4_;
          auVar157._16_4_ = fVar182 + (float)uStack_870;
          auVar157._20_4_ = fVar234 + uStack_870._4_4_;
          auVar157._24_4_ = fVar184 + (float)uStack_868;
          auVar157._28_4_ = fVar239 + uStack_868._4_4_;
          auVar96 = vcmpps_avx(auVar157,auVar103,2);
          _local_7c0 = vandps_avx(auVar96,local_500);
          auVar158._8_4_ = 3;
          auVar158._0_8_ = 0x300000003;
          auVar158._12_4_ = 3;
          auVar158._16_4_ = 3;
          auVar158._20_4_ = 3;
          auVar158._24_4_ = 3;
          auVar158._28_4_ = 3;
          auVar180._8_4_ = 2;
          auVar180._0_8_ = 0x200000002;
          auVar180._12_4_ = 2;
          auVar180._16_4_ = 2;
          auVar180._20_4_ = 2;
          auVar180._24_4_ = 2;
          auVar180._28_4_ = 2;
          auVar96 = vblendvps_avx(auVar180,auVar158,auVar246);
          auVar68._4_4_ = fStack_57c;
          auVar68._0_4_ = local_580;
          auVar68._8_4_ = fStack_578;
          auVar68._12_4_ = fStack_574;
          auVar218 = vpcmpgtd_avx(auVar96._16_16_,auVar68);
          auVar81 = vpshufd_avx(local_540._0_16_,0);
          auVar81 = vpcmpgtd_avx(auVar96._0_16_,auVar81);
          auVar159._16_16_ = auVar218;
          auVar159._0_16_ = auVar103._0_16_;
          _local_7a0 = vblendps_avx(ZEXT1632(auVar81),auVar159,0xf0);
          auVar96 = vandnps_avx(_local_7a0,_local_7c0);
          auVar246 = _local_7c0 & ~_local_7a0;
          local_840 = auVar96;
          if ((((((((auVar246 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar246 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar246 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar246 >> 0x7f,0) != '\0') ||
                (auVar246 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar246 >> 0xbf,0) != '\0') ||
              (auVar246 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar246[0x1f] < '\0') {
            local_780._4_4_ = local_880._4_4_ + local_380._4_4_;
            local_780._0_4_ = (float)local_880 + local_380._0_4_;
            fStack_778 = (float)uStack_878 + local_380._8_4_;
            fStack_774 = uStack_878._4_4_ + local_380._12_4_;
            fStack_770 = (float)uStack_870 + local_380._16_4_;
            fStack_76c = uStack_870._4_4_ + local_380._20_4_;
            fStack_768 = (float)uStack_868 + local_380._24_4_;
            fStack_764 = uStack_868._4_4_ + local_380._28_4_;
            _local_8e0 = local_380;
            do {
              auVar105._8_4_ = 0x7f800000;
              auVar105._0_8_ = 0x7f8000007f800000;
              auVar105._12_4_ = 0x7f800000;
              auVar105._16_4_ = 0x7f800000;
              auVar105._20_4_ = 0x7f800000;
              auVar105._24_4_ = 0x7f800000;
              auVar105._28_4_ = 0x7f800000;
              auVar246 = vblendvps_avx(auVar105,_local_8e0,auVar96);
              auVar97 = vshufps_avx(auVar246,auVar246,0xb1);
              auVar97 = vminps_avx(auVar246,auVar97);
              auVar133 = vshufpd_avx(auVar97,auVar97,5);
              auVar97 = vminps_avx(auVar97,auVar133);
              auVar133 = vperm2f128_avx(auVar97,auVar97,1);
              auVar97 = vminps_avx(auVar97,auVar133);
              auVar97 = vcmpps_avx(auVar246,auVar97,0);
              auVar133 = auVar96 & auVar97;
              auVar246 = auVar96;
              if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar133 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar133 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar133 >> 0x7f,0) != '\0') ||
                    (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar133 >> 0xbf,0) != '\0') ||
                  (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar133[0x1f] < '\0') {
                auVar246 = vandps_avx(auVar97,auVar96);
              }
              uVar71 = vmovmskps_avx(auVar246);
              uVar74 = 0;
              if (uVar71 != 0) {
                for (; (uVar71 >> uVar74 & 1) == 0; uVar74 = uVar74 + 1) {
                }
              }
              uVar73 = (ulong)uVar74;
              local_840 = auVar96;
              *(undefined4 *)(local_840 + uVar73 * 4) = 0;
              fVar160 = local_1c0[uVar73];
              uVar74 = *(uint *)(local_360 + uVar73 * 4);
              fVar230 = auVar21._0_4_;
              if ((float)local_900._0_4_ < 0.0) {
                fVar230 = sqrtf((float)local_900._0_4_);
              }
              auVar81 = vminps_avx(auVar82,auVar83);
              auVar218 = vmaxps_avx(auVar82,auVar83);
              auVar118 = vminps_avx(auVar22,auVar119);
              auVar91 = vminps_avx(auVar81,auVar118);
              auVar81 = vmaxps_avx(auVar22,auVar119);
              auVar118 = vmaxps_avx(auVar218,auVar81);
              auVar170._8_4_ = 0x7fffffff;
              auVar170._0_8_ = 0x7fffffff7fffffff;
              auVar170._12_4_ = 0x7fffffff;
              auVar218 = vandps_avx(auVar91,auVar170);
              auVar81 = vandps_avx(auVar118,auVar170);
              auVar218 = vmaxps_avx(auVar218,auVar81);
              auVar81 = vmovshdup_avx(auVar218);
              auVar81 = vmaxss_avx(auVar81,auVar218);
              auVar218 = vshufpd_avx(auVar218,auVar218,1);
              auVar218 = vmaxss_avx(auVar218,auVar81);
              local_9e0._0_4_ = auVar218._0_4_ * 1.9073486e-06;
              local_6a0._0_4_ = fVar230 * 1.9073486e-06;
              local_700._0_16_ = vshufps_avx(auVar118,auVar118,0xff);
              auVar218 = vinsertps_avx(ZEXT416(uVar74),ZEXT416((uint)fVar160),0x10);
              lVar79 = 5;
              do {
                auVar81 = vmovshdup_avx(auVar218);
                fVar186 = auVar81._0_4_;
                fVar182 = 1.0 - fVar186;
                auVar81 = vshufps_avx(auVar218,auVar218,0x55);
                fVar160 = auVar81._0_4_;
                fVar230 = auVar81._4_4_;
                fVar181 = auVar81._8_4_;
                fVar232 = auVar81._12_4_;
                auVar81 = vshufps_avx(ZEXT416((uint)fVar182),ZEXT416((uint)fVar182),0);
                fVar234 = auVar81._0_4_;
                fVar184 = auVar81._4_4_;
                fVar239 = auVar81._8_4_;
                fVar255 = auVar81._12_4_;
                fVar259 = local_a70 * fVar160 + local_a80 * fVar234;
                fVar263 = fStack_a6c * fVar230 + fStack_a7c * fVar184;
                fVar183 = fStack_a68 * fVar181 + fStack_a78 * fVar239;
                fVar185 = fStack_a64 * fVar232 + fStack_a74 * fVar255;
                auVar221._0_4_ =
                     fVar234 * (local_a80 * fVar160 + fVar234 * local_a60) + fVar160 * fVar259;
                auVar221._4_4_ =
                     fVar184 * (fStack_a7c * fVar230 + fVar184 * fStack_a5c) + fVar230 * fVar263;
                auVar221._8_4_ =
                     fVar239 * (fStack_a78 * fVar181 + fVar239 * fStack_a58) + fVar181 * fVar183;
                auVar221._12_4_ =
                     fVar255 * (fStack_a74 * fVar232 + fVar255 * fStack_a54) + fVar232 * fVar185;
                auVar171._0_4_ =
                     fVar234 * fVar259 + fVar160 * (fVar160 * local_a90 + local_a70 * fVar234);
                auVar171._4_4_ =
                     fVar184 * fVar263 + fVar230 * (fVar230 * fStack_a8c + fStack_a6c * fVar184);
                auVar171._8_4_ =
                     fVar239 * fVar183 + fVar181 * (fVar181 * fStack_a88 + fStack_a68 * fVar239);
                auVar171._12_4_ =
                     fVar255 * fVar185 + fVar232 * (fVar232 * fStack_a84 + fStack_a64 * fVar255);
                auVar81 = vshufps_avx(auVar218,auVar218,0);
                auVar127._0_4_ = auVar81._0_4_ * (float)local_8f0._0_4_ + 0.0;
                auVar127._4_4_ = auVar81._4_4_ * (float)local_8f0._4_4_ + 0.0;
                auVar127._8_4_ = auVar81._8_4_ * fStack_8e8 + 0.0;
                auVar127._12_4_ = auVar81._12_4_ * fStack_8e4 + 0.0;
                auVar90._0_4_ = fVar234 * auVar221._0_4_ + fVar160 * auVar171._0_4_;
                auVar90._4_4_ = fVar184 * auVar221._4_4_ + fVar230 * auVar171._4_4_;
                auVar90._8_4_ = fVar239 * auVar221._8_4_ + fVar181 * auVar171._8_4_;
                auVar90._12_4_ = fVar255 * auVar221._12_4_ + fVar232 * auVar171._12_4_;
                local_860._0_16_ = auVar90;
                auVar81 = vsubps_avx(auVar127,auVar90);
                _local_a00 = auVar81;
                auVar81 = vdpps_avx(auVar81,auVar81,0x7f);
                fVar160 = auVar81._0_4_;
                if (fVar160 < 0.0) {
                  fVar230 = sqrtf(fVar160);
                }
                else {
                  auVar118 = vsqrtss_avx(auVar81,auVar81);
                  fVar230 = auVar118._0_4_;
                }
                auVar118 = vsubps_avx(auVar171,auVar221);
                auVar245._0_4_ = auVar118._0_4_ * 3.0;
                auVar245._4_4_ = auVar118._4_4_ * 3.0;
                auVar245._8_4_ = auVar118._8_4_ * 3.0;
                auVar245._12_4_ = auVar118._12_4_ * 3.0;
                auVar118 = vshufps_avx(ZEXT416((uint)(fVar186 * 6.0)),ZEXT416((uint)(fVar186 * 6.0))
                                       ,0);
                auVar91 = ZEXT416((uint)((fVar182 - (fVar186 + fVar186)) * 6.0));
                auVar148 = vshufps_avx(auVar91,auVar91,0);
                auVar91 = ZEXT416((uint)((fVar186 - (fVar182 + fVar182)) * 6.0));
                auVar144 = vshufps_avx(auVar91,auVar91,0);
                auVar145 = vshufps_avx(ZEXT416((uint)(fVar182 * 6.0)),ZEXT416((uint)(fVar182 * 6.0))
                                       ,0);
                auVar91 = vdpps_avx(auVar245,auVar245,0x7f);
                auVar128._0_4_ =
                     auVar145._0_4_ * local_a60 +
                     auVar144._0_4_ * local_a80 +
                     auVar118._0_4_ * local_a90 + auVar148._0_4_ * local_a70;
                auVar128._4_4_ =
                     auVar145._4_4_ * fStack_a5c +
                     auVar144._4_4_ * fStack_a7c +
                     auVar118._4_4_ * fStack_a8c + auVar148._4_4_ * fStack_a6c;
                auVar128._8_4_ =
                     auVar145._8_4_ * fStack_a58 +
                     auVar144._8_4_ * fStack_a78 +
                     auVar118._8_4_ * fStack_a88 + auVar148._8_4_ * fStack_a68;
                auVar128._12_4_ =
                     auVar145._12_4_ * fStack_a54 +
                     auVar144._12_4_ * fStack_a74 +
                     auVar118._12_4_ * fStack_a84 + auVar148._12_4_ * fStack_a64;
                auVar118 = vblendps_avx(auVar91,_DAT_01f7aa10,0xe);
                auVar148 = vrsqrtss_avx(auVar118,auVar118);
                fVar232 = auVar148._0_4_;
                fVar181 = auVar91._0_4_;
                auVar148 = vdpps_avx(auVar245,auVar128,0x7f);
                auVar144 = vshufps_avx(auVar91,auVar91,0);
                auVar129._0_4_ = auVar128._0_4_ * auVar144._0_4_;
                auVar129._4_4_ = auVar128._4_4_ * auVar144._4_4_;
                auVar129._8_4_ = auVar128._8_4_ * auVar144._8_4_;
                auVar129._12_4_ = auVar128._12_4_ * auVar144._12_4_;
                auVar148 = vshufps_avx(auVar148,auVar148,0);
                auVar197._0_4_ = auVar245._0_4_ * auVar148._0_4_;
                auVar197._4_4_ = auVar245._4_4_ * auVar148._4_4_;
                auVar197._8_4_ = auVar245._8_4_ * auVar148._8_4_;
                auVar197._12_4_ = auVar245._12_4_ * auVar148._12_4_;
                auVar145 = vsubps_avx(auVar129,auVar197);
                auVar148 = vrcpss_avx(auVar118,auVar118);
                auVar118 = vmaxss_avx(ZEXT416((uint)local_9e0._0_4_),
                                      ZEXT416((uint)(auVar218._0_4_ * (float)local_6a0._0_4_)));
                auVar148 = ZEXT416((uint)(auVar148._0_4_ * (2.0 - fVar181 * auVar148._0_4_)));
                auVar148 = vshufps_avx(auVar148,auVar148,0);
                uVar73 = CONCAT44(auVar245._4_4_,auVar245._0_4_);
                auVar304._0_8_ = uVar73 ^ 0x8000000080000000;
                auVar304._8_4_ = -auVar245._8_4_;
                auVar304._12_4_ = -auVar245._12_4_;
                auVar144 = ZEXT416((uint)(fVar232 * 1.5 +
                                         fVar181 * -0.5 * fVar232 * fVar232 * fVar232));
                auVar144 = vshufps_avx(auVar144,auVar144,0);
                auVar172._0_4_ = auVar144._0_4_ * auVar145._0_4_ * auVar148._0_4_;
                auVar172._4_4_ = auVar144._4_4_ * auVar145._4_4_ * auVar148._4_4_;
                auVar172._8_4_ = auVar144._8_4_ * auVar145._8_4_ * auVar148._8_4_;
                auVar172._12_4_ = auVar144._12_4_ * auVar145._12_4_ * auVar148._12_4_;
                local_920._0_4_ = auVar245._0_4_ * auVar144._0_4_;
                local_920._4_4_ = auVar245._4_4_ * auVar144._4_4_;
                local_920._8_4_ = auVar245._8_4_ * auVar144._8_4_;
                local_920._12_4_ = auVar245._12_4_ * auVar144._12_4_;
                if (fVar181 < 0.0) {
                  fVar181 = sqrtf(fVar181);
                }
                else {
                  auVar91 = vsqrtss_avx(auVar91,auVar91);
                  fVar181 = auVar91._0_4_;
                }
                auVar91 = vdpps_avx(_local_a00,local_920._0_16_,0x7f);
                fVar230 = ((float)local_9e0._0_4_ / fVar181) * (fVar230 + 1.0) +
                          fVar230 * (float)local_9e0._0_4_ + auVar118._0_4_;
                auVar148 = vdpps_avx(auVar304,local_920._0_16_,0x7f);
                auVar144 = vdpps_avx(_local_a00,auVar172,0x7f);
                auVar145 = vdpps_avx(_local_8f0,local_920._0_16_,0x7f);
                auVar161 = vdpps_avx(_local_a00,auVar304,0x7f);
                fVar181 = auVar148._0_4_ + auVar144._0_4_;
                fVar232 = auVar91._0_4_;
                auVar92._0_4_ = fVar232 * fVar232;
                auVar92._4_4_ = auVar91._4_4_ * auVar91._4_4_;
                auVar92._8_4_ = auVar91._8_4_ * auVar91._8_4_;
                auVar92._12_4_ = auVar91._12_4_ * auVar91._12_4_;
                auVar144 = vsubps_avx(auVar81,auVar92);
                local_920._0_16_ = ZEXT416((uint)fVar181);
                auVar148 = vdpps_avx(_local_a00,_local_8f0,0x7f);
                fVar182 = auVar161._0_4_ - fVar232 * fVar181;
                fVar232 = auVar148._0_4_ - fVar232 * auVar145._0_4_;
                auVar148 = vrsqrtss_avx(auVar144,auVar144);
                fVar234 = auVar144._0_4_;
                fVar181 = auVar148._0_4_;
                fVar181 = fVar181 * 1.5 + fVar234 * -0.5 * fVar181 * fVar181 * fVar181;
                if (fVar234 < 0.0) {
                  local_8c0._0_4_ = fVar182;
                  local_6c0._0_4_ = fVar232;
                  local_6e0._0_4_ = fVar181;
                  fVar234 = sqrtf(fVar234);
                  fVar181 = (float)local_6e0._0_4_;
                  fVar182 = (float)local_8c0._0_4_;
                  fVar232 = (float)local_6c0._0_4_;
                }
                else {
                  auVar148 = vsqrtss_avx(auVar144,auVar144);
                  fVar234 = auVar148._0_4_;
                }
                auVar306 = ZEXT3264(local_9c0);
                auVar161 = vpermilps_avx(local_860._0_16_,0xff);
                auVar162 = vshufps_avx(auVar245,auVar245,0xff);
                fVar182 = fVar182 * fVar181 - auVar162._0_4_;
                auVar198._0_8_ = auVar145._0_8_ ^ 0x8000000080000000;
                auVar198._8_4_ = auVar145._8_4_ ^ 0x80000000;
                auVar198._12_4_ = auVar145._12_4_ ^ 0x80000000;
                auVar222._0_4_ = -fVar182;
                auVar222._4_4_ = 0x80000000;
                auVar222._8_4_ = 0x80000000;
                auVar222._12_4_ = 0x80000000;
                auVar148 = vinsertps_avx(auVar222,ZEXT416((uint)(fVar232 * fVar181)),0x1c);
                auVar145 = vmovsldup_avx(ZEXT416((uint)(local_920._0_4_ * fVar232 * fVar181 -
                                                       auVar145._0_4_ * fVar182)));
                auVar148 = vdivps_avx(auVar148,auVar145);
                auVar144 = vinsertps_avx(local_920._0_16_,auVar198,0x10);
                auVar144 = vdivps_avx(auVar144,auVar145);
                auVar145 = vmovsldup_avx(auVar91);
                auVar93 = ZEXT416((uint)(fVar234 - auVar161._0_4_));
                auVar161 = vmovsldup_avx(auVar93);
                auVar149._0_4_ = auVar145._0_4_ * auVar148._0_4_ + auVar161._0_4_ * auVar144._0_4_;
                auVar149._4_4_ = auVar145._4_4_ * auVar148._4_4_ + auVar161._4_4_ * auVar144._4_4_;
                auVar149._8_4_ = auVar145._8_4_ * auVar148._8_4_ + auVar161._8_4_ * auVar144._8_4_;
                auVar149._12_4_ =
                     auVar145._12_4_ * auVar148._12_4_ + auVar161._12_4_ * auVar144._12_4_;
                auVar218 = vsubps_avx(auVar218,auVar149);
                auVar150._8_4_ = 0x7fffffff;
                auVar150._0_8_ = 0x7fffffff7fffffff;
                auVar150._12_4_ = 0x7fffffff;
                auVar91 = vandps_avx(auVar91,auVar150);
                if (auVar91._0_4_ < fVar230) {
                  auVar173._8_4_ = 0x7fffffff;
                  auVar173._0_8_ = 0x7fffffff7fffffff;
                  auVar173._12_4_ = 0x7fffffff;
                  auVar91 = vandps_avx(auVar93,auVar173);
                  if (auVar91._0_4_ <
                      (float)local_700._0_4_ * 1.9073486e-06 + fVar230 + auVar118._0_4_) {
                    fVar230 = auVar218._0_4_ + (float)local_810._0_4_;
                    auVar254 = ZEXT3264(local_9a0);
                    if ((fVar214 <= fVar230) &&
                       (fVar181 = *(float *)(ray + k * 4 + 0x80), fVar230 <= fVar181)) {
                      auVar118 = vmovshdup_avx(auVar218);
                      fVar232 = auVar118._0_4_;
                      if ((0.0 <= fVar232) && (fVar232 <= 1.0)) {
                        auVar81 = vrsqrtss_avx(auVar81,auVar81);
                        fVar182 = auVar81._0_4_;
                        pGVar5 = (context->scene->geometries).items[uVar76].ptr;
                        if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                          auVar81 = ZEXT416((uint)(fVar182 * 1.5 +
                                                  fVar160 * -0.5 * fVar182 * fVar182 * fVar182));
                          auVar81 = vshufps_avx(auVar81,auVar81,0);
                          auVar174._0_4_ = auVar81._0_4_ * (float)local_a00._0_4_;
                          auVar174._4_4_ = auVar81._4_4_ * (float)local_a00._4_4_;
                          auVar174._8_4_ = auVar81._8_4_ * fStack_9f8;
                          auVar174._12_4_ = auVar81._12_4_ * fStack_9f4;
                          auVar130._0_4_ = auVar245._0_4_ + auVar162._0_4_ * auVar174._0_4_;
                          auVar130._4_4_ = auVar245._4_4_ + auVar162._4_4_ * auVar174._4_4_;
                          auVar130._8_4_ = auVar245._8_4_ + auVar162._8_4_ * auVar174._8_4_;
                          auVar130._12_4_ = auVar245._12_4_ + auVar162._12_4_ * auVar174._12_4_;
                          auVar81 = vshufps_avx(auVar174,auVar174,0xc9);
                          auVar118 = vshufps_avx(auVar245,auVar245,0xc9);
                          auVar175._0_4_ = auVar118._0_4_ * auVar174._0_4_;
                          auVar175._4_4_ = auVar118._4_4_ * auVar174._4_4_;
                          auVar175._8_4_ = auVar118._8_4_ * auVar174._8_4_;
                          auVar175._12_4_ = auVar118._12_4_ * auVar174._12_4_;
                          auVar199._0_4_ = auVar245._0_4_ * auVar81._0_4_;
                          auVar199._4_4_ = auVar245._4_4_ * auVar81._4_4_;
                          auVar199._8_4_ = auVar245._8_4_ * auVar81._8_4_;
                          auVar199._12_4_ = auVar245._12_4_ * auVar81._12_4_;
                          auVar91 = vsubps_avx(auVar199,auVar175);
                          auVar81 = vshufps_avx(auVar91,auVar91,0xc9);
                          auVar118 = vshufps_avx(auVar130,auVar130,0xc9);
                          auVar200._0_4_ = auVar118._0_4_ * auVar81._0_4_;
                          auVar200._4_4_ = auVar118._4_4_ * auVar81._4_4_;
                          auVar200._8_4_ = auVar118._8_4_ * auVar81._8_4_;
                          auVar200._12_4_ = auVar118._12_4_ * auVar81._12_4_;
                          auVar81 = vshufps_avx(auVar91,auVar91,0xd2);
                          auVar131._0_4_ = auVar130._0_4_ * auVar81._0_4_;
                          auVar131._4_4_ = auVar130._4_4_ * auVar81._4_4_;
                          auVar131._8_4_ = auVar130._8_4_ * auVar81._8_4_;
                          auVar131._12_4_ = auVar130._12_4_ * auVar81._12_4_;
                          auVar81 = vsubps_avx(auVar200,auVar131);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x80) = fVar230;
                            uVar2 = vextractps_avx(auVar81,1);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
                            uVar2 = vextractps_avx(auVar81,2);
                            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                            *(int *)(ray + k * 4 + 0xe0) = auVar81._0_4_;
                            *(float *)(ray + k * 4 + 0xf0) = fVar232;
                            *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                            *(int *)(ray + k * 4 + 0x110) = (int)local_8a0;
                            *(uint *)(ray + k * 4 + 0x120) = uVar76;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            local_630 = vshufps_avx(auVar218,auVar218,0x55);
                            auVar218 = vshufps_avx(auVar81,auVar81,0x55);
                            auStack_650 = vshufps_avx(auVar81,auVar81,0xaa);
                            local_640 = vshufps_avx(auVar81,auVar81,0);
                            local_660 = (RTCHitN  [16])auVar218;
                            local_620 = ZEXT816(0) << 0x20;
                            local_610 = local_680._0_8_;
                            uStack_608 = local_680._8_8_;
                            local_600 = local_670._0_8_;
                            uStack_5f8 = local_670._8_8_;
                            uVar74 = context->user->instID[0];
                            _local_5f0 = CONCAT44(uVar74,uVar74);
                            _uStack_5e8 = CONCAT44(uVar74,uVar74);
                            uVar74 = context->user->instPrimID[0];
                            auVar132._4_4_ = uVar74;
                            auVar132._0_4_ = uVar74;
                            auVar132._8_4_ = uVar74;
                            auVar132._12_4_ = uVar74;
                            auStack_5e0 = auVar132;
                            *(float *)(ray + k * 4 + 0x80) = fVar230;
                            local_800 = *local_948;
                            local_a50.valid = (int *)local_800;
                            local_a50.geometryUserPtr = pGVar5->userPtr;
                            local_a50.context = context->user;
                            local_a50.hit = local_660;
                            local_a50.N = 4;
                            local_a50.ray = (RTCRayN *)ray;
                            if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar5->intersectionFilterN)(&local_a50);
                              auVar306._8_56_ = extraout_var_00;
                              auVar306._0_8_ = extraout_XMM1_Qa_00;
                              auVar132 = auVar306._0_16_;
                              auVar254 = ZEXT3264(local_9a0);
                              auVar306 = ZEXT3264(local_9c0);
                            }
                            if (local_800 == (undefined1  [16])0x0) {
                              auVar218 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar81 = vpcmpeqd_avx(auVar132,auVar132);
                              auVar218 = auVar218 ^ auVar81;
                            }
                            else {
                              p_Var7 = context->args->filter;
                              auVar81 = vpcmpeqd_avx(auVar218,auVar218);
                              if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var7)(&local_a50);
                                auVar254 = ZEXT3264(local_9a0);
                                auVar306 = ZEXT3264(local_9c0);
                                auVar81 = vpcmpeqd_avx(auVar81,auVar81);
                              }
                              auVar118 = vpcmpeqd_avx(local_800,_DAT_01f7aa10);
                              auVar218 = auVar118 ^ auVar81;
                              if (local_800 != (undefined1  [16])0x0) {
                                auVar118 = auVar118 ^ auVar81;
                                auVar81 = vmaskmovps_avx(auVar118,*(undefined1 (*) [16])
                                                                   local_a50.hit);
                                *(undefined1 (*) [16])(local_a50.ray + 0xc0) = auVar81;
                                auVar81 = vmaskmovps_avx(auVar118,*(undefined1 (*) [16])
                                                                   (local_a50.hit + 0x10));
                                *(undefined1 (*) [16])(local_a50.ray + 0xd0) = auVar81;
                                auVar81 = vmaskmovps_avx(auVar118,*(undefined1 (*) [16])
                                                                   (local_a50.hit + 0x20));
                                *(undefined1 (*) [16])(local_a50.ray + 0xe0) = auVar81;
                                auVar81 = vmaskmovps_avx(auVar118,*(undefined1 (*) [16])
                                                                   (local_a50.hit + 0x30));
                                *(undefined1 (*) [16])(local_a50.ray + 0xf0) = auVar81;
                                auVar81 = vmaskmovps_avx(auVar118,*(undefined1 (*) [16])
                                                                   (local_a50.hit + 0x40));
                                *(undefined1 (*) [16])(local_a50.ray + 0x100) = auVar81;
                                auVar81 = vmaskmovps_avx(auVar118,*(undefined1 (*) [16])
                                                                   (local_a50.hit + 0x50));
                                *(undefined1 (*) [16])(local_a50.ray + 0x110) = auVar81;
                                auVar81 = vmaskmovps_avx(auVar118,*(undefined1 (*) [16])
                                                                   (local_a50.hit + 0x60));
                                *(undefined1 (*) [16])(local_a50.ray + 0x120) = auVar81;
                                auVar81 = vmaskmovps_avx(auVar118,*(undefined1 (*) [16])
                                                                   (local_a50.hit + 0x70));
                                *(undefined1 (*) [16])(local_a50.ray + 0x130) = auVar81;
                                auVar81 = vmaskmovps_avx(auVar118,*(undefined1 (*) [16])
                                                                   (local_a50.hit + 0x80));
                                *(undefined1 (*) [16])(local_a50.ray + 0x140) = auVar81;
                              }
                            }
                            auVar94._8_8_ = 0x100000001;
                            auVar94._0_8_ = 0x100000001;
                            if ((auVar94 & auVar218) == (undefined1  [16])0x0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar181;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar79 = lVar79 + -1;
                auVar254 = ZEXT3264(local_9a0);
              } while (lVar79 != 0);
              uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar103._4_4_ = uVar2;
              auVar103._0_4_ = uVar2;
              auVar103._8_4_ = uVar2;
              auVar103._12_4_ = uVar2;
              auVar103._16_4_ = uVar2;
              auVar103._20_4_ = uVar2;
              auVar103._24_4_ = uVar2;
              auVar103._28_4_ = uVar2;
              auVar246 = vcmpps_avx(_local_780,auVar103,2);
              auVar96 = vandps_avx(auVar246,local_840);
              auVar246 = local_840 & auVar246;
            } while ((((((((auVar246 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar246 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar246 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar246 >> 0x7f,0) != '\0') ||
                       (auVar246 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar246 >> 0xbf,0) != '\0') ||
                     (auVar246 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar246[0x1f] < '\0');
            auVar363 = ZEXT3264(local_940);
            local_840 = auVar96;
          }
          auVar366 = ZEXT3264(local_a20);
          auVar323 = ZEXT3264(local_980);
          auVar96 = vandps_avx(local_4e0,_local_4c0);
          auVar246 = vandps_avx(_local_7c0,_local_7a0);
          auVar206._0_4_ = (float)local_880 + local_3c0._0_4_;
          auVar206._4_4_ = local_880._4_4_ + local_3c0._4_4_;
          auVar206._8_4_ = (float)uStack_878 + local_3c0._8_4_;
          auVar206._12_4_ = uStack_878._4_4_ + local_3c0._12_4_;
          auVar206._16_4_ = (float)uStack_870 + local_3c0._16_4_;
          auVar206._20_4_ = uStack_870._4_4_ + local_3c0._20_4_;
          auVar206._24_4_ = (float)uStack_868 + local_3c0._24_4_;
          auVar206._28_4_ = uStack_868._4_4_ + local_3c0._28_4_;
          auVar97 = vcmpps_avx(auVar206,auVar103,2);
          auVar96 = vandps_avx(auVar97,auVar96);
          auVar207._0_4_ = (float)local_880 + local_380._0_4_;
          auVar207._4_4_ = local_880._4_4_ + local_380._4_4_;
          auVar207._8_4_ = (float)uStack_878 + local_380._8_4_;
          auVar207._12_4_ = uStack_878._4_4_ + local_380._12_4_;
          auVar207._16_4_ = (float)uStack_870 + local_380._16_4_;
          auVar207._20_4_ = uStack_870._4_4_ + local_380._20_4_;
          auVar207._24_4_ = (float)uStack_868 + local_380._24_4_;
          auVar207._28_4_ = uStack_868._4_4_ + local_380._28_4_;
          auVar97 = vcmpps_avx(auVar207,auVar103,2);
          auVar246 = vandps_avx(auVar97,auVar246);
          auVar246 = vorps_avx(auVar96,auVar246);
          if ((((((((auVar246 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar246 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar246 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar246 >> 0x7f,0) != '\0') ||
                (auVar246 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar246 >> 0xbf,0) != '\0') ||
              (auVar246 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar246[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar78 * 0x60) = auVar246;
            auVar96 = vblendvps_avx(local_380,_local_3c0,auVar96);
            *(undefined1 (*) [32])(auStack_160 + uVar78 * 0x60) = auVar96;
            uVar3 = vmovlps_avx(local_470);
            (&uStack_140)[uVar78 * 0xc] = uVar3;
            aiStack_138[uVar78 * 0x18] = local_c08 + 1;
            iVar77 = iVar77 + 1;
          }
          goto LAB_00e48041;
        }
      }
      auVar366 = ZEXT3264(local_a20);
      auVar363 = ZEXT3264(local_940);
      auVar323 = ZEXT3264(local_980);
      auVar306 = ZEXT3264(local_9c0);
      auVar254 = ZEXT3264(local_9a0);
    }
LAB_00e48041:
    auVar246 = local_400;
    if (iVar77 == 0) break;
    uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar100._4_4_ = uVar2;
    auVar100._0_4_ = uVar2;
    auVar100._8_4_ = uVar2;
    auVar100._12_4_ = uVar2;
    auVar100._16_4_ = uVar2;
    auVar100._20_4_ = uVar2;
    auVar100._24_4_ = uVar2;
    auVar100._28_4_ = uVar2;
    uVar74 = -iVar77;
    pauVar72 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar77 - 1) * 0x60);
    while( true ) {
      auVar96 = pauVar72[1];
      auVar135._0_4_ = (float)local_880 + auVar96._0_4_;
      auVar135._4_4_ = local_880._4_4_ + auVar96._4_4_;
      auVar135._8_4_ = (float)uStack_878 + auVar96._8_4_;
      auVar135._12_4_ = uStack_878._4_4_ + auVar96._12_4_;
      auVar135._16_4_ = (float)uStack_870 + auVar96._16_4_;
      auVar135._20_4_ = uStack_870._4_4_ + auVar96._20_4_;
      auVar135._24_4_ = (float)uStack_868 + auVar96._24_4_;
      auVar135._28_4_ = uStack_868._4_4_ + auVar96._28_4_;
      auVar133 = vcmpps_avx(auVar135,auVar100,2);
      auVar97 = vandps_avx(auVar133,*pauVar72);
      _local_660 = auVar97;
      auVar133 = *pauVar72 & auVar133;
      if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar133 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar133 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar133 >> 0x7f,0) != '\0') ||
            (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar133 >> 0xbf,0) != '\0') ||
          (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar133[0x1f] < '\0') break;
      pauVar72 = pauVar72 + -3;
      uVar74 = uVar74 + 1;
      if (uVar74 == 0) goto LAB_00e49c08;
    }
    auVar101._8_4_ = 0x7f800000;
    auVar101._0_8_ = 0x7f8000007f800000;
    auVar101._12_4_ = 0x7f800000;
    auVar101._16_4_ = 0x7f800000;
    auVar101._20_4_ = 0x7f800000;
    auVar101._24_4_ = 0x7f800000;
    auVar101._28_4_ = 0x7f800000;
    auVar96 = vblendvps_avx(auVar101,auVar96,auVar97);
    auVar133 = vshufps_avx(auVar96,auVar96,0xb1);
    auVar133 = vminps_avx(auVar96,auVar133);
    auVar152 = vshufpd_avx(auVar133,auVar133,5);
    auVar133 = vminps_avx(auVar133,auVar152);
    auVar152 = vperm2f128_avx(auVar133,auVar133,1);
    auVar133 = vminps_avx(auVar133,auVar152);
    auVar96 = vcmpps_avx(auVar96,auVar133,0);
    auVar133 = auVar97 & auVar96;
    if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar133 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar133 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar133 >> 0x7f,0) != '\0') ||
          (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar133 >> 0xbf,0) != '\0') ||
        (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar133[0x1f] < '\0') {
      auVar97 = vandps_avx(auVar96,auVar97);
    }
    auVar86._8_8_ = 0;
    auVar86._0_8_ = *(ulong *)pauVar72[2];
    local_c08 = *(uint *)(pauVar72[2] + 8);
    uVar75 = vmovmskps_avx(auVar97);
    uVar71 = 0;
    if (uVar75 != 0) {
      for (; (uVar75 >> uVar71 & 1) == 0; uVar71 = uVar71 + 1) {
      }
    }
    *(undefined4 *)(local_660 + (ulong)uVar71 * 4) = 0;
    *pauVar72 = _local_660;
    uVar75 = ~uVar74;
    if ((((((((_local_660 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_660 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_660 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_660 >> 0x7f,0) != '\0') ||
          (_local_660 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_660 >> 0xbf,0) != '\0') ||
        (_local_660 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_660[0x1f] < '\0') {
      uVar75 = -uVar74;
    }
    uVar78 = (ulong)uVar75;
    auVar218 = vshufps_avx(auVar86,auVar86,0);
    auVar81 = vshufps_avx(auVar86,auVar86,0x55);
    auVar81 = vsubps_avx(auVar81,auVar218);
    local_3c0._4_4_ = auVar218._4_4_ + auVar81._4_4_ * 0.14285715;
    local_3c0._0_4_ = auVar218._0_4_ + auVar81._0_4_ * 0.0;
    fStack_3b8 = auVar218._8_4_ + auVar81._8_4_ * 0.2857143;
    fStack_3b4 = auVar218._12_4_ + auVar81._12_4_ * 0.42857146;
    fStack_3b0 = auVar218._0_4_ + auVar81._0_4_ * 0.5714286;
    fStack_3ac = auVar218._4_4_ + auVar81._4_4_ * 0.71428573;
    fStack_3a8 = auVar218._8_4_ + auVar81._8_4_ * 0.8571429;
    fStack_3a4 = auVar218._12_4_ + auVar81._12_4_;
    local_470._8_8_ = 0;
    local_470._0_8_ = *(ulong *)(local_3c0 + (ulong)uVar71 * 4);
  } while( true );
LAB_00e49c08:
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar95._4_4_ = uVar2;
  auVar95._0_4_ = uVar2;
  auVar95._8_4_ = uVar2;
  auVar95._12_4_ = uVar2;
  auVar9 = vcmpps_avx(local_480,auVar95,2);
  uVar76 = vmovmskps_avx(auVar9);
  uVar70 = uVar70 - 1 & uVar70 & uVar76;
  if (uVar70 == 0) {
    return;
  }
  goto LAB_00e46ef7;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }